

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  undefined8 uVar24;
  ushort uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [40];
  undefined1 auVar266 [48];
  undefined1 auVar267 [56];
  undefined1 auVar268 [40];
  undefined1 auVar269 [48];
  undefined1 auVar270 [56];
  undefined1 auVar271 [24];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar278 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  __m128 _outp_5;
  __m128 _b_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m256 _p_4;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_3;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m256 _p_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_pow op;
  __m512 pow2n_3;
  __m512 y_7;
  __mmask16 mask_7;
  __m512 one_7;
  __m512i imm0_7;
  __m512 fx_3;
  __m512 tmp_7;
  __m512 pow2n_1;
  __m512 y_3;
  __mmask16 mask_3;
  __m512 one_3;
  __m512i imm0_3;
  __m512 fx_1;
  __m512 tmp_3;
  __m512 pow2n;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_1;
  __m512i imm0_1;
  __m512 fx;
  __m512 tmp_1;
  __m512 y_6;
  __m512 z_3;
  __m512 tmp_6;
  __mmask16 mask_6;
  __m512 e_3;
  __mmask16 invalid_mask_3;
  __m512 one_6;
  __m512i imm0_6;
  __m512 y_2;
  __m512 z_1;
  __m512 tmp_2;
  __mmask16 mask_2;
  __m512 e_1;
  __mmask16 invalid_mask_1;
  __m512 one_2;
  __m512i imm0_2;
  __m512 y;
  __m512 z;
  __m512 tmp;
  __mmask16 mask;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one;
  __m512i imm0;
  __m256 pow2n_4;
  __m256 y_9;
  __m256 mask_9;
  __m256 one_9;
  __m256i imm0_9;
  __m256 fx_4;
  __m256 tmp_9;
  __m256 pow2n_2;
  __m256 y_5;
  __m256 mask_5;
  __m256 one_5;
  __m256i imm0_5;
  __m256 fx_2;
  __m256 tmp_5;
  __m256 y_8;
  __m256 z_4;
  __m256 tmp_8;
  __m256 mask_8;
  __m256 e_4;
  __m256 invalid_mask_4;
  __m256 one_8;
  __m256i imm0_8;
  __m256 y_4;
  __m256 z_2;
  __m256 tmp_4;
  __m256 mask_4;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_4;
  __m256i imm0_4;
  v4sf pow2n_5;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_11;
  v4si emm0_1;
  v4sf fx_5;
  v4sf tmp_11;
  v4sf y_10;
  v4sf z_5;
  v4sf tmp_10;
  v4sf mask_10;
  v4sf e_5;
  v4sf invalid_mask_5;
  v4sf one_10;
  v4si emm0;
  int local_a7e4;
  int local_a644;
  int local_a580;
  undefined8 *local_a570;
  float *local_a568;
  undefined1 (*local_a560) [64];
  undefined8 uStack_a190;
  undefined8 uStack_a188;
  undefined8 uStack_a150;
  undefined8 uStack_a148;
  undefined1 local_9d00 [8];
  undefined8 uStack_9cf8;
  undefined8 uStack_9cf0;
  undefined8 uStack_9ce8;
  undefined8 uStack_9ce0;
  undefined8 uStack_9cd8;
  undefined8 uStack_9cd0;
  undefined8 uStack_9cc8;
  undefined1 local_9c00 [16];
  undefined8 uStack_9bf0;
  undefined8 uStack_9be8;
  undefined8 uStack_9be0;
  undefined8 uStack_9bd8;
  undefined8 uStack_9bd0;
  undefined8 uStack_9bc8;
  undefined1 local_9880 [8];
  undefined8 uStack_9878;
  undefined8 uStack_9870;
  undefined8 uStack_9868;
  undefined8 uStack_9860;
  undefined8 uStack_9858;
  undefined8 uStack_9850;
  undefined8 uStack_9848;
  undefined1 local_9780 [16];
  undefined8 uStack_9770;
  undefined8 uStack_9768;
  undefined8 uStack_9760;
  undefined8 uStack_9758;
  undefined8 uStack_9750;
  undefined8 uStack_9748;
  undefined1 local_9400 [8];
  undefined8 uStack_93f8;
  undefined8 uStack_93f0;
  undefined8 uStack_93e8;
  undefined8 uStack_93e0;
  undefined8 uStack_93d8;
  undefined8 uStack_93d0;
  undefined8 uStack_93c8;
  undefined1 local_9300 [16];
  undefined8 uStack_92f0;
  undefined8 uStack_92e8;
  undefined8 uStack_92e0;
  undefined8 uStack_92d8;
  undefined8 uStack_92d0;
  undefined8 uStack_92c8;
  undefined1 local_8fc0 [256];
  undefined1 local_8ec0 [16];
  undefined8 uStack_8eb0;
  undefined8 uStack_8ea8;
  undefined8 uStack_8ea0;
  undefined8 uStack_8e98;
  undefined8 uStack_8e90;
  undefined8 uStack_8e88;
  undefined1 local_8dc0 [16];
  undefined8 uStack_8db0;
  undefined8 uStack_8da8;
  undefined8 uStack_8da0;
  undefined8 uStack_8d98;
  undefined8 uStack_8d90;
  undefined8 uStack_8d88;
  undefined1 local_8a00 [256];
  undefined1 local_8900 [16];
  undefined8 uStack_88f0;
  undefined8 uStack_88e8;
  undefined8 uStack_88e0;
  undefined8 uStack_88d8;
  undefined8 uStack_88d0;
  undefined8 uStack_88c8;
  undefined1 local_8800 [16];
  undefined8 uStack_87f0;
  undefined8 uStack_87e8;
  undefined8 uStack_87e0;
  undefined8 uStack_87d8;
  undefined8 uStack_87d0;
  undefined8 uStack_87c8;
  undefined1 local_8440 [256];
  undefined1 local_8340 [16];
  undefined8 uStack_8330;
  undefined8 uStack_8328;
  undefined8 uStack_8320;
  undefined8 uStack_8318;
  undefined8 uStack_8310;
  undefined8 uStack_8308;
  undefined1 local_8240 [16];
  undefined8 uStack_8230;
  undefined8 uStack_8228;
  undefined8 uStack_8220;
  undefined8 uStack_8218;
  undefined8 uStack_8210;
  undefined8 uStack_8208;
  int local_5600;
  int iStack_55fc;
  int iStack_55f8;
  int iStack_55f4;
  int iStack_55f0;
  int iStack_55ec;
  int iStack_55e8;
  int iStack_55e4;
  int iStack_55e0;
  int iStack_55dc;
  int iStack_55d8;
  int iStack_55d4;
  int iStack_55d0;
  int iStack_55cc;
  int iStack_55c8;
  int iStack_55c4;
  int local_5480;
  int iStack_547c;
  int iStack_5478;
  int iStack_5474;
  int iStack_5470;
  int iStack_546c;
  int iStack_5468;
  int iStack_5464;
  int iStack_5460;
  int iStack_545c;
  int iStack_5458;
  int iStack_5454;
  int iStack_5450;
  int iStack_544c;
  int iStack_5448;
  int iStack_5444;
  int local_5300;
  int iStack_52fc;
  int iStack_52f8;
  int iStack_52f4;
  int iStack_52f0;
  int iStack_52ec;
  int iStack_52e8;
  int iStack_52e4;
  int iStack_52e0;
  int iStack_52dc;
  int iStack_52d8;
  int iStack_52d4;
  int iStack_52d0;
  int iStack_52cc;
  int iStack_52c8;
  int iStack_52c4;
  int local_5180;
  int iStack_517c;
  int iStack_5178;
  int iStack_5174;
  int iStack_5170;
  int iStack_516c;
  int iStack_5168;
  int iStack_5164;
  int iStack_5160;
  int iStack_515c;
  int iStack_5158;
  int iStack_5154;
  int iStack_5150;
  int iStack_514c;
  int iStack_5148;
  int iStack_5144;
  int local_5000;
  int iStack_4ffc;
  int iStack_4ff8;
  int iStack_4ff4;
  int iStack_4ff0;
  int iStack_4fec;
  int iStack_4fe8;
  int iStack_4fe4;
  int iStack_4fe0;
  int iStack_4fdc;
  int iStack_4fd8;
  int iStack_4fd4;
  int iStack_4fd0;
  int iStack_4fcc;
  int iStack_4fc8;
  int iStack_4fc4;
  int local_4e80;
  int iStack_4e7c;
  int iStack_4e78;
  int iStack_4e74;
  int iStack_4e70;
  int iStack_4e6c;
  int iStack_4e68;
  int iStack_4e64;
  int iStack_4e60;
  int iStack_4e5c;
  int iStack_4e58;
  int iStack_4e54;
  int iStack_4e50;
  int iStack_4e4c;
  int iStack_4e48;
  int iStack_4e44;
  int local_3740;
  int iStack_373c;
  int iStack_3738;
  int iStack_3734;
  int iStack_3730;
  int iStack_372c;
  int iStack_3728;
  int iStack_3724;
  int iStack_3720;
  int iStack_371c;
  int iStack_3718;
  int iStack_3714;
  int iStack_3710;
  int iStack_370c;
  int iStack_3708;
  int iStack_3704;
  int local_35c0;
  int iStack_35bc;
  int iStack_35b8;
  int iStack_35b4;
  int iStack_35b0;
  int iStack_35ac;
  int iStack_35a8;
  int iStack_35a4;
  int iStack_35a0;
  int iStack_359c;
  int iStack_3598;
  int iStack_3594;
  int iStack_3590;
  int iStack_358c;
  int iStack_3588;
  int iStack_3584;
  int local_3440;
  int iStack_343c;
  int iStack_3438;
  int iStack_3434;
  int iStack_3430;
  int iStack_342c;
  int iStack_3428;
  int iStack_3424;
  int iStack_3420;
  int iStack_341c;
  int iStack_3418;
  int iStack_3414;
  int iStack_3410;
  int iStack_340c;
  int iStack_3408;
  int iStack_3404;
  float local_3320;
  float fStack_331c;
  float fStack_3318;
  float fStack_3314;
  float fStack_3310;
  float fStack_330c;
  float fStack_3308;
  float local_3300;
  float fStack_32fc;
  float fStack_32f8;
  float fStack_32f4;
  float fStack_32f0;
  float fStack_32ec;
  float fStack_32e8;
  undefined4 uStack_32e4;
  float local_32a0;
  float fStack_329c;
  float fStack_3298;
  float fStack_3294;
  float fStack_3290;
  float fStack_328c;
  float fStack_3288;
  undefined1 local_3240 [8];
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined1 local_31e0 [16];
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined1 local_31a0 [8];
  float fStack_3198;
  float fStack_3194;
  undefined1 local_3180 [8];
  float fStack_3178;
  float fStack_3174;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  float local_3140;
  float fStack_313c;
  float fStack_3138;
  float fStack_3134;
  float local_30e0;
  float fStack_30dc;
  float fStack_30d8;
  float fStack_30d4;
  float fStack_30d0;
  float fStack_30cc;
  float fStack_30c8;
  float local_3080;
  float fStack_307c;
  float fStack_3078;
  float fStack_3074;
  undefined1 local_2fc0 [8];
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined1 local_2f60 [16];
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined1 local_2f20 [8];
  float fStack_2f18;
  float fStack_2f14;
  undefined1 local_2f00 [8];
  float fStack_2ef8;
  float fStack_2ef4;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  float local_2ec0;
  float fStack_2ebc;
  float fStack_2eb8;
  float fStack_2eb4;
  float local_2e60;
  float fStack_2e5c;
  float fStack_2e58;
  float fStack_2e54;
  float fStack_2e50;
  float fStack_2e4c;
  float fStack_2e48;
  float local_2e00;
  float fStack_2dfc;
  float fStack_2df8;
  float fStack_2df4;
  undefined1 local_2d60 [8];
  float fStack_2d58;
  float fStack_2d54;
  float fStack_2d50;
  float fStack_2d4c;
  float fStack_2d48;
  undefined4 uStack_2d44;
  undefined1 local_2ce0 [8];
  float fStack_2cd8;
  float fStack_2cd4;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined1 local_2c60 [8];
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float fStack_2c44;
  float local_2c40;
  float fStack_2c3c;
  float fStack_2c38;
  float fStack_2c34;
  float local_2c00;
  float fStack_2bfc;
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float fStack_2be4;
  float local_2be0;
  float fStack_2bdc;
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  float fStack_2bc4;
  float local_2ba0;
  float fStack_2b9c;
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  float fStack_2b84;
  float local_2aa0;
  float fStack_2a9c;
  float fStack_2a98;
  float fStack_2a94;
  undefined1 local_2a00 [8];
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  undefined4 uStack_29e4;
  undefined1 local_2980 [8];
  float fStack_2978;
  float fStack_2974;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined1 local_2900 [8];
  float fStack_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  float fStack_28e8;
  float fStack_28e4;
  float local_28e0;
  float fStack_28dc;
  float fStack_28d8;
  float fStack_28d4;
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  float local_2880;
  float fStack_287c;
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  float fStack_2864;
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  float fStack_2824;
  float local_2740;
  float fStack_273c;
  float fStack_2738;
  float fStack_2734;
  float local_2040;
  float fStack_203c;
  float fStack_2038;
  float fStack_2034;
  float fStack_2030;
  float fStack_202c;
  float fStack_2028;
  float fStack_2024;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  undefined1 local_af0 [8];
  undefined8 uStack_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined8 local_a90;
  undefined8 uStack_a88;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  
  local_a570 = in_RDX;
  local_a568 = in_RSI;
  local_a560 = in_RDI;
  if (in_R8D == 0x10) {
    for (local_a580 = 0; local_a580 < in_ECX; local_a580 = local_a580 + 1) {
      auVar272 = vbroadcastss_avx512f(ZEXT416((uint)*local_a568));
      uVar23 = vcmpps_avx512f(*local_a560,ZEXT1664(ZEXT816(0)),2);
      auVar52._8_4_ = 0x800000;
      auVar52._12_4_ = 0x800000;
      auVar52._0_4_ = 0x800000;
      auVar52._4_4_ = 0x800000;
      auVar52._16_4_ = 0x800000;
      auVar52._20_4_ = 0x800000;
      auVar52._24_4_ = 0x800000;
      auVar52._28_4_ = 0x800000;
      auVar52._32_4_ = 0x800000;
      auVar52._36_4_ = 0x800000;
      auVar52._40_4_ = 0x800000;
      auVar52._44_4_ = 0x800000;
      auVar52._48_4_ = 0x800000;
      auVar52._52_4_ = 0x800000;
      auVar52._56_4_ = 0x800000;
      auVar52._60_4_ = 0x800000;
      auVar273 = vmaxps_avx512f(*local_a560,auVar52);
      auVar274 = vmovdqa64_avx512f(auVar273);
      auVar274 = vpsrld_avx512f(auVar274,ZEXT416(0x17));
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar163._8_4_ = -0x7f800001;
      auVar163._12_4_ = -0x7f800001;
      auVar163._0_4_ = -0x7f800001;
      auVar163._4_4_ = -0x7f800001;
      auVar163._16_4_ = -0x7f800001;
      auVar163._20_4_ = -0x7f800001;
      auVar163._24_4_ = -0x7f800001;
      auVar163._28_4_ = -0x7f800001;
      auVar163._32_4_ = -0x7f800001;
      auVar163._36_4_ = -0x7f800001;
      auVar163._40_4_ = -0x7f800001;
      auVar163._44_4_ = -0x7f800001;
      auVar163._48_4_ = -0x7f800001;
      auVar163._52_4_ = -0x7f800001;
      auVar163._56_4_ = -0x7f800001;
      auVar163._60_4_ = -0x7f800001;
      auVar275 = vmovdqa64_avx512f(auVar163);
      auVar273 = vpandd_avx512f(auVar273,auVar275);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar166._8_4_ = 0.5;
      auVar166._12_4_ = 0.5;
      auVar166._0_4_ = 0.5;
      auVar166._4_4_ = 0.5;
      auVar166._16_4_ = 0.5;
      auVar166._20_4_ = 0.5;
      auVar166._24_4_ = 0.5;
      auVar166._28_4_ = 0.5;
      auVar166._32_4_ = 0.5;
      auVar166._36_4_ = 0.5;
      auVar166._40_4_ = 0.5;
      auVar166._44_4_ = 0.5;
      auVar166._48_4_ = 0.5;
      auVar166._52_4_ = 0.5;
      auVar166._56_4_ = 0.5;
      auVar166._60_4_ = 0.5;
      auVar275 = vmovdqa64_avx512f(auVar166);
      auVar273 = vpord_avx512f(auVar273,auVar275);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar275 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar275 = vmovdqa64_avx512f(auVar275);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar275 = vmovdqa64_avx512f(auVar275);
      auVar274 = vpsubd_avx512f(auVar274,auVar275);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vcvtdq2ps_avx512f(auVar274);
      auVar47._8_4_ = 1.0;
      auVar47._12_4_ = 1.0;
      auVar47._0_4_ = 1.0;
      auVar47._4_4_ = 1.0;
      auVar47._16_4_ = 1.0;
      auVar47._20_4_ = 1.0;
      auVar47._24_4_ = 1.0;
      auVar47._28_4_ = 1.0;
      auVar47._32_4_ = 1.0;
      auVar47._36_4_ = 1.0;
      auVar47._40_4_ = 1.0;
      auVar47._44_4_ = 1.0;
      auVar47._48_4_ = 1.0;
      auVar47._52_4_ = 1.0;
      auVar47._56_4_ = 1.0;
      auVar47._60_4_ = 1.0;
      auVar274 = vaddps_avx512f(auVar274,auVar47);
      uVar24 = vcmpps_avx512f(auVar273,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar25 = (ushort)uVar24;
      auVar48._8_4_ = 1.0;
      auVar48._12_4_ = 1.0;
      auVar48._0_4_ = 1.0;
      auVar48._4_4_ = 1.0;
      auVar48._16_4_ = 1.0;
      auVar48._20_4_ = 1.0;
      auVar48._24_4_ = 1.0;
      auVar48._28_4_ = 1.0;
      auVar48._32_4_ = 1.0;
      auVar48._36_4_ = 1.0;
      auVar48._40_4_ = 1.0;
      auVar48._44_4_ = 1.0;
      auVar48._48_4_ = 1.0;
      auVar48._52_4_ = 1.0;
      auVar48._56_4_ = 1.0;
      auVar48._60_4_ = 1.0;
      auVar275 = vsubps_avx512f(auVar273,auVar48);
      auVar139._8_4_ = 1.0;
      auVar139._12_4_ = 1.0;
      auVar139._0_4_ = 1.0;
      auVar139._4_4_ = 1.0;
      auVar139._16_4_ = 1.0;
      auVar139._20_4_ = 1.0;
      auVar139._24_4_ = 1.0;
      auVar139._28_4_ = 1.0;
      auVar139._32_4_ = 1.0;
      auVar139._36_4_ = 1.0;
      auVar139._40_4_ = 1.0;
      auVar139._44_4_ = 1.0;
      auVar139._48_4_ = 1.0;
      auVar139._52_4_ = 1.0;
      auVar139._56_4_ = 1.0;
      auVar139._60_4_ = 1.0;
      local_5600 = auVar274._0_4_;
      iStack_55fc = auVar274._4_4_;
      iStack_55f8 = auVar274._8_4_;
      iStack_55f4 = auVar274._12_4_;
      iStack_55f0 = auVar274._16_4_;
      iStack_55ec = auVar274._20_4_;
      iStack_55e8 = auVar274._24_4_;
      iStack_55e4 = auVar274._28_4_;
      iStack_55e0 = auVar274._32_4_;
      iStack_55dc = auVar274._36_4_;
      iStack_55d8 = auVar274._40_4_;
      iStack_55d4 = auVar274._44_4_;
      iStack_55d0 = auVar274._48_4_;
      iStack_55cc = auVar274._52_4_;
      iStack_55c8 = auVar274._56_4_;
      iStack_55c4 = auVar274._60_4_;
      auVar274 = vsubps_avx512f(auVar274,auVar139);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar24 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8340._4_4_ = (uint)bVar2 * auVar274._4_4_ | (uint)!bVar2 * iStack_55fc;
      local_8340._0_4_ = (uint)bVar1 * auVar274._0_4_ | (uint)!bVar1 * local_5600;
      local_8340._8_4_ = (uint)bVar3 * auVar274._8_4_ | (uint)!bVar3 * iStack_55f8;
      local_8340._12_4_ = (uint)bVar4 * auVar274._12_4_ | (uint)!bVar4 * iStack_55f4;
      uStack_8330._0_4_ = (uint)bVar5 * auVar274._16_4_ | (uint)!bVar5 * iStack_55f0;
      uStack_8330._4_4_ = (uint)bVar6 * auVar274._20_4_ | (uint)!bVar6 * iStack_55ec;
      uStack_8328._0_4_ = (uint)bVar7 * auVar274._24_4_ | (uint)!bVar7 * iStack_55e8;
      uStack_8328._4_4_ = (uint)bVar8 * auVar274._28_4_ | (uint)!bVar8 * iStack_55e4;
      auVar16 = _local_8340;
      uStack_8320._0_4_ =
           (uint)(bVar9 & 1) * auVar274._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_55e0;
      uStack_8320._4_4_ = (uint)bVar10 * auVar274._36_4_ | (uint)!bVar10 * iStack_55dc;
      auVar265 = _local_8340;
      uStack_8318._0_4_ = (uint)bVar11 * auVar274._40_4_ | (uint)!bVar11 * iStack_55d8;
      uStack_8318._4_4_ = (uint)bVar12 * auVar274._44_4_ | (uint)!bVar12 * iStack_55d4;
      auVar266 = _local_8340;
      uStack_8310._0_4_ = (uint)bVar13 * auVar274._48_4_ | (uint)!bVar13 * iStack_55d0;
      uStack_8310._4_4_ = (uint)bVar14 * auVar274._52_4_ | (uint)!bVar14 * iStack_55cc;
      auVar267 = _local_8340;
      uStack_8308._0_4_ = (uint)bVar15 * auVar274._56_4_ | (uint)!bVar15 * iStack_55c8;
      uStack_8308._4_4_ =
           (uint)(bVar9 >> 7) * auVar274._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_55c4;
      auVar274 = _local_8340;
      local_3740 = auVar275._0_4_;
      iStack_373c = auVar275._4_4_;
      iStack_3738 = auVar275._8_4_;
      iStack_3734 = auVar275._12_4_;
      iStack_3730 = auVar275._16_4_;
      iStack_372c = auVar275._20_4_;
      iStack_3728 = auVar275._24_4_;
      iStack_3724 = auVar275._28_4_;
      iStack_3720 = auVar275._32_4_;
      iStack_371c = auVar275._36_4_;
      iStack_3718 = auVar275._40_4_;
      iStack_3714 = auVar275._44_4_;
      iStack_3710 = auVar275._48_4_;
      iStack_370c = auVar275._52_4_;
      iStack_3708 = auVar275._56_4_;
      iStack_3704 = auVar275._60_4_;
      auVar273 = vaddps_avx512f(auVar275,auVar273);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8240._4_4_ = (uint)bVar2 * auVar273._4_4_ | (uint)!bVar2 * iStack_373c;
      local_8240._0_4_ = (uint)bVar1 * auVar273._0_4_ | (uint)!bVar1 * local_3740;
      local_8240._8_4_ = (uint)bVar3 * auVar273._8_4_ | (uint)!bVar3 * iStack_3738;
      local_8240._12_4_ = (uint)bVar4 * auVar273._12_4_ | (uint)!bVar4 * iStack_3734;
      uStack_8230._0_4_ = (uint)bVar5 * auVar273._16_4_ | (uint)!bVar5 * iStack_3730;
      uStack_8230._4_4_ = (uint)bVar6 * auVar273._20_4_ | (uint)!bVar6 * iStack_372c;
      uStack_8228._0_4_ = (uint)bVar7 * auVar273._24_4_ | (uint)!bVar7 * iStack_3728;
      uStack_8228._4_4_ = (uint)bVar8 * auVar273._28_4_ | (uint)!bVar8 * iStack_3724;
      auVar278 = _local_8240;
      uStack_8220._0_4_ =
           (uint)(bVar9 & 1) * auVar273._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_3720;
      uStack_8220._4_4_ = (uint)bVar10 * auVar273._36_4_ | (uint)!bVar10 * iStack_371c;
      auVar268 = _local_8240;
      uStack_8218._0_4_ = (uint)bVar11 * auVar273._40_4_ | (uint)!bVar11 * iStack_3718;
      uStack_8218._4_4_ = (uint)bVar12 * auVar273._44_4_ | (uint)!bVar12 * iStack_3714;
      auVar269 = _local_8240;
      uStack_8210._0_4_ = (uint)bVar13 * auVar273._48_4_ | (uint)!bVar13 * iStack_3710;
      uStack_8210._4_4_ = (uint)bVar14 * auVar273._52_4_ | (uint)!bVar14 * iStack_370c;
      auVar270 = _local_8240;
      uStack_8208._0_4_ = (uint)bVar15 * auVar273._56_4_ | (uint)!bVar15 * iStack_3708;
      uStack_8208._4_4_ =
           (uint)(bVar9 >> 7) * auVar273._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_3704;
      auVar273 = _local_8240;
      uStack_8228 = auVar278._24_8_;
      uStack_8220 = auVar268._32_8_;
      uStack_8218 = auVar269._40_8_;
      uStack_8210 = auVar270._48_8_;
      uStack_8208 = auVar273._56_8_;
      auVar51._16_8_ = uStack_8230;
      auVar51._0_16_ = local_8240;
      auVar51._24_8_ = uStack_8228;
      auVar51._32_8_ = uStack_8220;
      auVar51._40_8_ = uStack_8218;
      auVar51._48_8_ = uStack_8210;
      auVar51._56_8_ = uStack_8208;
      auVar50._16_8_ = uStack_8230;
      auVar50._0_16_ = local_8240;
      auVar50._24_8_ = uStack_8228;
      auVar50._32_8_ = uStack_8220;
      auVar50._40_8_ = uStack_8218;
      auVar50._48_8_ = uStack_8210;
      auVar50._56_8_ = uStack_8208;
      auVar273 = vmulps_avx512f(auVar51,auVar50);
      local_8440._8_4_ = 0.070376836;
      local_8440._12_4_ = 0.070376836;
      local_8440._0_4_ = 0.070376836;
      local_8440._4_4_ = 0.070376836;
      auVar73._16_4_ = 0.070376836;
      auVar73._20_4_ = 0.070376836;
      auVar73._0_16_ = local_8440._0_16_;
      auVar73._24_4_ = 0.070376836;
      auVar73._28_4_ = 0.070376836;
      auVar73._32_4_ = 0.070376836;
      auVar73._36_4_ = 0.070376836;
      auVar73._40_4_ = 0.070376836;
      auVar73._44_4_ = 0.070376836;
      auVar73._48_4_ = 0.070376836;
      auVar73._52_4_ = 0.070376836;
      auVar73._56_4_ = 0.070376836;
      auVar73._60_4_ = 0.070376836;
      auVar72._16_8_ = uStack_8230;
      auVar72._0_16_ = local_8240;
      auVar72._24_8_ = uStack_8228;
      auVar72._32_8_ = uStack_8220;
      auVar72._40_8_ = uStack_8218;
      auVar72._48_8_ = uStack_8210;
      auVar72._56_8_ = uStack_8208;
      auVar71._8_4_ = -0.1151461;
      auVar71._12_4_ = -0.1151461;
      auVar71._0_4_ = -0.1151461;
      auVar71._4_4_ = -0.1151461;
      auVar71._16_4_ = -0.1151461;
      auVar71._20_4_ = -0.1151461;
      auVar71._24_4_ = -0.1151461;
      auVar71._28_4_ = -0.1151461;
      auVar71._32_4_ = -0.1151461;
      auVar71._36_4_ = -0.1151461;
      auVar71._40_4_ = -0.1151461;
      auVar71._44_4_ = -0.1151461;
      auVar71._48_4_ = -0.1151461;
      auVar71._52_4_ = -0.1151461;
      auVar71._56_4_ = -0.1151461;
      auVar71._60_4_ = -0.1151461;
      auVar275 = vfmadd213ps_avx512f(auVar72,auVar73,auVar71);
      auVar70._16_8_ = uStack_8230;
      auVar70._0_16_ = local_8240;
      auVar70._24_8_ = uStack_8228;
      auVar70._32_8_ = uStack_8220;
      auVar70._40_8_ = uStack_8218;
      auVar70._48_8_ = uStack_8210;
      auVar70._56_8_ = uStack_8208;
      auVar69._8_4_ = 0.116769984;
      auVar69._12_4_ = 0.116769984;
      auVar69._0_4_ = 0.116769984;
      auVar69._4_4_ = 0.116769984;
      auVar69._16_4_ = 0.116769984;
      auVar69._20_4_ = 0.116769984;
      auVar69._24_4_ = 0.116769984;
      auVar69._28_4_ = 0.116769984;
      auVar69._32_4_ = 0.116769984;
      auVar69._36_4_ = 0.116769984;
      auVar69._40_4_ = 0.116769984;
      auVar69._44_4_ = 0.116769984;
      auVar69._48_4_ = 0.116769984;
      auVar69._52_4_ = 0.116769984;
      auVar69._56_4_ = 0.116769984;
      auVar69._60_4_ = 0.116769984;
      auVar275 = vfmadd213ps_avx512f(auVar70,auVar275,auVar69);
      auVar68._16_8_ = uStack_8230;
      auVar68._0_16_ = local_8240;
      auVar68._24_8_ = uStack_8228;
      auVar68._32_8_ = uStack_8220;
      auVar68._40_8_ = uStack_8218;
      auVar68._48_8_ = uStack_8210;
      auVar68._56_8_ = uStack_8208;
      auVar67._8_4_ = -0.12420141;
      auVar67._12_4_ = -0.12420141;
      auVar67._0_4_ = -0.12420141;
      auVar67._4_4_ = -0.12420141;
      auVar67._16_4_ = -0.12420141;
      auVar67._20_4_ = -0.12420141;
      auVar67._24_4_ = -0.12420141;
      auVar67._28_4_ = -0.12420141;
      auVar67._32_4_ = -0.12420141;
      auVar67._36_4_ = -0.12420141;
      auVar67._40_4_ = -0.12420141;
      auVar67._44_4_ = -0.12420141;
      auVar67._48_4_ = -0.12420141;
      auVar67._52_4_ = -0.12420141;
      auVar67._56_4_ = -0.12420141;
      auVar67._60_4_ = -0.12420141;
      auVar275 = vfmadd213ps_avx512f(auVar68,auVar275,auVar67);
      auVar66._16_8_ = uStack_8230;
      auVar66._0_16_ = local_8240;
      auVar66._24_8_ = uStack_8228;
      auVar66._32_8_ = uStack_8220;
      auVar66._40_8_ = uStack_8218;
      auVar66._48_8_ = uStack_8210;
      auVar66._56_8_ = uStack_8208;
      auVar65._8_4_ = 0.14249323;
      auVar65._12_4_ = 0.14249323;
      auVar65._0_4_ = 0.14249323;
      auVar65._4_4_ = 0.14249323;
      auVar65._16_4_ = 0.14249323;
      auVar65._20_4_ = 0.14249323;
      auVar65._24_4_ = 0.14249323;
      auVar65._28_4_ = 0.14249323;
      auVar65._32_4_ = 0.14249323;
      auVar65._36_4_ = 0.14249323;
      auVar65._40_4_ = 0.14249323;
      auVar65._44_4_ = 0.14249323;
      auVar65._48_4_ = 0.14249323;
      auVar65._52_4_ = 0.14249323;
      auVar65._56_4_ = 0.14249323;
      auVar65._60_4_ = 0.14249323;
      auVar275 = vfmadd213ps_avx512f(auVar66,auVar275,auVar65);
      auVar64._16_8_ = uStack_8230;
      auVar64._0_16_ = local_8240;
      auVar64._24_8_ = uStack_8228;
      auVar64._32_8_ = uStack_8220;
      auVar64._40_8_ = uStack_8218;
      auVar64._48_8_ = uStack_8210;
      auVar64._56_8_ = uStack_8208;
      auVar63._8_4_ = -0.16668057;
      auVar63._12_4_ = -0.16668057;
      auVar63._0_4_ = -0.16668057;
      auVar63._4_4_ = -0.16668057;
      auVar63._16_4_ = -0.16668057;
      auVar63._20_4_ = -0.16668057;
      auVar63._24_4_ = -0.16668057;
      auVar63._28_4_ = -0.16668057;
      auVar63._32_4_ = -0.16668057;
      auVar63._36_4_ = -0.16668057;
      auVar63._40_4_ = -0.16668057;
      auVar63._44_4_ = -0.16668057;
      auVar63._48_4_ = -0.16668057;
      auVar63._52_4_ = -0.16668057;
      auVar63._56_4_ = -0.16668057;
      auVar63._60_4_ = -0.16668057;
      auVar275 = vfmadd213ps_avx512f(auVar64,auVar275,auVar63);
      auVar62._16_8_ = uStack_8230;
      auVar62._0_16_ = local_8240;
      auVar62._24_8_ = uStack_8228;
      auVar62._32_8_ = uStack_8220;
      auVar62._40_8_ = uStack_8218;
      auVar62._48_8_ = uStack_8210;
      auVar62._56_8_ = uStack_8208;
      auVar61._8_4_ = 0.20000714;
      auVar61._12_4_ = 0.20000714;
      auVar61._0_4_ = 0.20000714;
      auVar61._4_4_ = 0.20000714;
      auVar61._16_4_ = 0.20000714;
      auVar61._20_4_ = 0.20000714;
      auVar61._24_4_ = 0.20000714;
      auVar61._28_4_ = 0.20000714;
      auVar61._32_4_ = 0.20000714;
      auVar61._36_4_ = 0.20000714;
      auVar61._40_4_ = 0.20000714;
      auVar61._44_4_ = 0.20000714;
      auVar61._48_4_ = 0.20000714;
      auVar61._52_4_ = 0.20000714;
      auVar61._56_4_ = 0.20000714;
      auVar61._60_4_ = 0.20000714;
      auVar275 = vfmadd213ps_avx512f(auVar62,auVar275,auVar61);
      auVar60._16_8_ = uStack_8230;
      auVar60._0_16_ = local_8240;
      auVar60._24_8_ = uStack_8228;
      auVar60._32_8_ = uStack_8220;
      auVar60._40_8_ = uStack_8218;
      auVar60._48_8_ = uStack_8210;
      auVar60._56_8_ = uStack_8208;
      auVar59._8_4_ = -0.24999994;
      auVar59._12_4_ = -0.24999994;
      auVar59._0_4_ = -0.24999994;
      auVar59._4_4_ = -0.24999994;
      auVar59._16_4_ = -0.24999994;
      auVar59._20_4_ = -0.24999994;
      auVar59._24_4_ = -0.24999994;
      auVar59._28_4_ = -0.24999994;
      auVar59._32_4_ = -0.24999994;
      auVar59._36_4_ = -0.24999994;
      auVar59._40_4_ = -0.24999994;
      auVar59._44_4_ = -0.24999994;
      auVar59._48_4_ = -0.24999994;
      auVar59._52_4_ = -0.24999994;
      auVar59._56_4_ = -0.24999994;
      auVar59._60_4_ = -0.24999994;
      auVar275 = vfmadd213ps_avx512f(auVar60,auVar275,auVar59);
      auVar58._16_8_ = uStack_8230;
      auVar58._0_16_ = local_8240;
      auVar58._24_8_ = uStack_8228;
      auVar58._32_8_ = uStack_8220;
      auVar58._40_8_ = uStack_8218;
      auVar58._48_8_ = uStack_8210;
      auVar58._56_8_ = uStack_8208;
      auVar57._8_4_ = 0.3333333;
      auVar57._12_4_ = 0.3333333;
      auVar57._0_4_ = 0.3333333;
      auVar57._4_4_ = 0.3333333;
      auVar57._16_4_ = 0.3333333;
      auVar57._20_4_ = 0.3333333;
      auVar57._24_4_ = 0.3333333;
      auVar57._28_4_ = 0.3333333;
      auVar57._32_4_ = 0.3333333;
      auVar57._36_4_ = 0.3333333;
      auVar57._40_4_ = 0.3333333;
      auVar57._44_4_ = 0.3333333;
      auVar57._48_4_ = 0.3333333;
      auVar57._52_4_ = 0.3333333;
      auVar57._56_4_ = 0.3333333;
      auVar57._60_4_ = 0.3333333;
      auVar275 = vfmadd213ps_avx512f(auVar58,auVar275,auVar57);
      auVar49._16_8_ = uStack_8230;
      auVar49._0_16_ = local_8240;
      auVar49._24_8_ = uStack_8228;
      auVar49._32_8_ = uStack_8220;
      auVar49._40_8_ = uStack_8218;
      auVar49._48_8_ = uStack_8210;
      auVar49._56_8_ = uStack_8208;
      auVar275 = vmulps_avx512f(auVar275,auVar49);
      auVar275 = vmulps_avx512f(auVar275,auVar273);
      uStack_8328 = auVar16._24_8_;
      uStack_8320 = auVar265._32_8_;
      uStack_8318 = auVar266._40_8_;
      uStack_8310 = auVar267._48_8_;
      uStack_8308 = auVar274._56_8_;
      auVar56._16_8_ = uStack_8330;
      auVar56._0_16_ = local_8340;
      auVar56._24_8_ = uStack_8328;
      auVar56._32_8_ = uStack_8320;
      auVar56._40_8_ = uStack_8318;
      auVar56._48_8_ = uStack_8310;
      auVar56._56_8_ = uStack_8308;
      auVar55._8_4_ = -0.00021219444;
      auVar55._12_4_ = -0.00021219444;
      auVar55._0_4_ = -0.00021219444;
      auVar55._4_4_ = -0.00021219444;
      auVar55._16_4_ = -0.00021219444;
      auVar55._20_4_ = -0.00021219444;
      auVar55._24_4_ = -0.00021219444;
      auVar55._28_4_ = -0.00021219444;
      auVar55._32_4_ = -0.00021219444;
      auVar55._36_4_ = -0.00021219444;
      auVar55._40_4_ = -0.00021219444;
      auVar55._44_4_ = -0.00021219444;
      auVar55._48_4_ = -0.00021219444;
      auVar55._52_4_ = -0.00021219444;
      auVar55._56_4_ = -0.00021219444;
      auVar55._60_4_ = -0.00021219444;
      auVar274 = vfmadd213ps_avx512f(auVar55,auVar56,auVar275);
      auVar145._8_4_ = 0.5;
      auVar145._12_4_ = 0.5;
      auVar145._0_4_ = 0.5;
      auVar145._4_4_ = 0.5;
      auVar145._16_4_ = 0.5;
      auVar145._20_4_ = 0.5;
      auVar145._24_4_ = 0.5;
      auVar145._28_4_ = 0.5;
      auVar145._32_4_ = 0.5;
      auVar145._36_4_ = 0.5;
      auVar145._40_4_ = 0.5;
      auVar145._44_4_ = 0.5;
      auVar145._48_4_ = 0.5;
      auVar145._52_4_ = 0.5;
      auVar145._56_4_ = 0.5;
      auVar145._60_4_ = 0.5;
      auVar274 = vfnmadd213ps_avx512f(auVar145,auVar273,auVar274);
      auVar276._16_8_ = uStack_8230;
      auVar276._0_16_ = local_8240;
      auVar276._24_8_ = uStack_8228;
      auVar276._32_8_ = uStack_8220;
      auVar276._40_8_ = uStack_8218;
      auVar276._48_8_ = uStack_8210;
      auVar276._56_8_ = uStack_8208;
      auVar274 = vaddps_avx512f(auVar276,auVar274);
      auVar54._16_8_ = uStack_8330;
      auVar54._0_16_ = local_8340;
      auVar54._24_8_ = uStack_8328;
      auVar54._32_8_ = uStack_8320;
      auVar54._40_8_ = uStack_8318;
      auVar54._48_8_ = uStack_8310;
      auVar54._56_8_ = uStack_8308;
      auVar53._8_4_ = 0.6933594;
      auVar53._12_4_ = 0.6933594;
      auVar53._0_4_ = 0.6933594;
      auVar53._4_4_ = 0.6933594;
      auVar53._16_4_ = 0.6933594;
      auVar53._20_4_ = 0.6933594;
      auVar53._24_4_ = 0.6933594;
      auVar53._28_4_ = 0.6933594;
      auVar53._32_4_ = 0.6933594;
      auVar53._36_4_ = 0.6933594;
      auVar53._40_4_ = 0.6933594;
      auVar53._44_4_ = 0.6933594;
      auVar53._48_4_ = 0.6933594;
      auVar53._52_4_ = 0.6933594;
      auVar53._56_4_ = 0.6933594;
      auVar53._60_4_ = 0.6933594;
      auVar273 = vfmadd213ps_avx512f(auVar53,auVar54,auVar274);
      auVar274 = vpmovm2d_avx512dq(uVar23 & 0xffff);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vpord_avx512f(auVar273,auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmulps_avx512f(auVar272,auVar274);
      auVar275._8_4_ = 88.37626;
      auVar275._12_4_ = 88.37626;
      auVar275._0_4_ = 88.37626;
      auVar275._4_4_ = 88.37626;
      auVar275._16_4_ = 88.37626;
      auVar275._20_4_ = 88.37626;
      auVar275._24_4_ = 88.37626;
      auVar275._28_4_ = 88.37626;
      auVar275._32_4_ = 88.37626;
      auVar275._36_4_ = 88.37626;
      auVar275._40_4_ = 88.37626;
      auVar275._44_4_ = 88.37626;
      auVar275._48_4_ = 88.37626;
      auVar275._52_4_ = 88.37626;
      auVar275._56_4_ = 88.37626;
      auVar275._60_4_ = 88.37626;
      auVar274 = vminps_avx512f(auVar274,auVar275);
      auVar273._8_4_ = -88.37626;
      auVar273._12_4_ = -88.37626;
      auVar273._0_4_ = -88.37626;
      auVar273._4_4_ = -88.37626;
      auVar273._16_4_ = -88.37626;
      auVar273._20_4_ = -88.37626;
      auVar273._24_4_ = -88.37626;
      auVar273._28_4_ = -88.37626;
      auVar273._32_4_ = -88.37626;
      auVar273._36_4_ = -88.37626;
      auVar273._40_4_ = -88.37626;
      auVar273._44_4_ = -88.37626;
      auVar273._48_4_ = -88.37626;
      auVar273._52_4_ = -88.37626;
      auVar273._56_4_ = -88.37626;
      auVar273._60_4_ = -88.37626;
      auVar273 = vmaxps_avx512f(auVar274,auVar273);
      auVar122._8_4_ = 1.442695;
      auVar122._12_4_ = 1.442695;
      auVar122._0_4_ = 1.442695;
      auVar122._4_4_ = 1.442695;
      auVar122._16_4_ = 1.442695;
      auVar122._20_4_ = 1.442695;
      auVar122._24_4_ = 1.442695;
      auVar122._28_4_ = 1.442695;
      auVar122._32_4_ = 1.442695;
      auVar122._36_4_ = 1.442695;
      auVar122._40_4_ = 1.442695;
      auVar122._44_4_ = 1.442695;
      auVar122._48_4_ = 1.442695;
      auVar122._52_4_ = 1.442695;
      auVar122._56_4_ = 1.442695;
      auVar122._60_4_ = 1.442695;
      auVar121._8_4_ = 0.5;
      auVar121._12_4_ = 0.5;
      auVar121._0_4_ = 0.5;
      auVar121._4_4_ = 0.5;
      auVar121._16_4_ = 0.5;
      auVar121._20_4_ = 0.5;
      auVar121._24_4_ = 0.5;
      auVar121._28_4_ = 0.5;
      auVar121._32_4_ = 0.5;
      auVar121._36_4_ = 0.5;
      auVar121._40_4_ = 0.5;
      auVar121._44_4_ = 0.5;
      auVar121._48_4_ = 0.5;
      auVar121._52_4_ = 0.5;
      auVar121._56_4_ = 0.5;
      auVar121._60_4_ = 0.5;
      auVar274 = vfmadd213ps_avx512f(auVar122,auVar273,auVar121);
      auVar275 = vrndscaleps_avx512f(auVar274,1);
      uVar24 = vcmpps_avx512f(auVar274,auVar275,1);
      uVar25 = (ushort)uVar24;
      auVar142._8_4_ = 1.0;
      auVar142._12_4_ = 1.0;
      auVar142._0_4_ = 1.0;
      auVar142._4_4_ = 1.0;
      auVar142._16_4_ = 1.0;
      auVar142._20_4_ = 1.0;
      auVar142._24_4_ = 1.0;
      auVar142._28_4_ = 1.0;
      auVar142._32_4_ = 1.0;
      auVar142._36_4_ = 1.0;
      auVar142._40_4_ = 1.0;
      auVar142._44_4_ = 1.0;
      auVar142._48_4_ = 1.0;
      auVar142._52_4_ = 1.0;
      auVar142._56_4_ = 1.0;
      auVar142._60_4_ = 1.0;
      local_5180 = auVar275._0_4_;
      iStack_517c = auVar275._4_4_;
      iStack_5178 = auVar275._8_4_;
      iStack_5174 = auVar275._12_4_;
      iStack_5170 = auVar275._16_4_;
      iStack_516c = auVar275._20_4_;
      iStack_5168 = auVar275._24_4_;
      iStack_5164 = auVar275._28_4_;
      iStack_5160 = auVar275._32_4_;
      iStack_515c = auVar275._36_4_;
      iStack_5158 = auVar275._40_4_;
      iStack_5154 = auVar275._44_4_;
      iStack_5150 = auVar275._48_4_;
      iStack_514c = auVar275._52_4_;
      iStack_5148 = auVar275._56_4_;
      iStack_5144 = auVar275._60_4_;
      auVar274 = vsubps_avx512f(auVar275,auVar142);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar24 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_9300._4_4_ = (uint)bVar2 * auVar274._4_4_ | (uint)!bVar2 * iStack_517c;
      local_9300._0_4_ = (uint)bVar1 * auVar274._0_4_ | (uint)!bVar1 * local_5180;
      local_9300._8_4_ = (uint)bVar3 * auVar274._8_4_ | (uint)!bVar3 * iStack_5178;
      local_9300._12_4_ = (uint)bVar4 * auVar274._12_4_ | (uint)!bVar4 * iStack_5174;
      uStack_92f0._0_4_ = (uint)bVar5 * auVar274._16_4_ | (uint)!bVar5 * iStack_5170;
      uStack_92f0._4_4_ = (uint)bVar6 * auVar274._20_4_ | (uint)!bVar6 * iStack_516c;
      uStack_92e8._0_4_ = (uint)bVar7 * auVar274._24_4_ | (uint)!bVar7 * iStack_5168;
      uStack_92e8._4_4_ = (uint)bVar8 * auVar274._28_4_ | (uint)!bVar8 * iStack_5164;
      auVar16 = _local_9300;
      uStack_92e0._0_4_ =
           (uint)(bVar9 & 1) * auVar274._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_5160;
      uStack_92e0._4_4_ = (uint)bVar10 * auVar274._36_4_ | (uint)!bVar10 * iStack_515c;
      auVar265 = _local_9300;
      uStack_92d8._0_4_ = (uint)bVar11 * auVar274._40_4_ | (uint)!bVar11 * iStack_5158;
      uStack_92d8._4_4_ = (uint)bVar12 * auVar274._44_4_ | (uint)!bVar12 * iStack_5154;
      auVar266 = _local_9300;
      uStack_92d0._0_4_ = (uint)bVar13 * auVar274._48_4_ | (uint)!bVar13 * iStack_5150;
      uStack_92d0._4_4_ = (uint)bVar14 * auVar274._52_4_ | (uint)!bVar14 * iStack_514c;
      auVar267 = _local_9300;
      uStack_92c8._0_4_ = (uint)bVar15 * auVar274._56_4_ | (uint)!bVar15 * iStack_5148;
      uStack_92c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar274._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5144;
      auVar274 = _local_9300;
      uStack_92e8 = auVar16._24_8_;
      uStack_92e0 = auVar265._32_8_;
      uStack_92d8 = auVar266._40_8_;
      uStack_92d0 = auVar267._48_8_;
      uStack_92c8 = auVar274._56_8_;
      auVar151._16_8_ = uStack_92f0;
      auVar151._0_16_ = local_9300;
      auVar151._24_8_ = uStack_92e8;
      auVar151._32_8_ = uStack_92e0;
      auVar151._40_8_ = uStack_92d8;
      auVar151._48_8_ = uStack_92d0;
      auVar151._56_8_ = uStack_92c8;
      auVar150._8_4_ = 0.6933594;
      auVar150._12_4_ = 0.6933594;
      auVar150._0_4_ = 0.6933594;
      auVar150._4_4_ = 0.6933594;
      auVar150._16_4_ = 0.6933594;
      auVar150._20_4_ = 0.6933594;
      auVar150._24_4_ = 0.6933594;
      auVar150._28_4_ = 0.6933594;
      auVar150._32_4_ = 0.6933594;
      auVar150._36_4_ = 0.6933594;
      auVar150._40_4_ = 0.6933594;
      auVar150._44_4_ = 0.6933594;
      auVar150._48_4_ = 0.6933594;
      auVar150._52_4_ = 0.6933594;
      auVar150._56_4_ = 0.6933594;
      auVar150._60_4_ = 0.6933594;
      auVar274 = vfnmadd213ps_avx512f(auVar150,auVar151,auVar273);
      auVar149._16_8_ = uStack_92f0;
      auVar149._0_16_ = local_9300;
      auVar149._24_8_ = uStack_92e8;
      auVar149._32_8_ = uStack_92e0;
      auVar149._40_8_ = uStack_92d8;
      auVar149._48_8_ = uStack_92d0;
      auVar149._56_8_ = uStack_92c8;
      auVar148._8_4_ = -0.00021219444;
      auVar148._12_4_ = -0.00021219444;
      auVar148._0_4_ = -0.00021219444;
      auVar148._4_4_ = -0.00021219444;
      auVar148._16_4_ = -0.00021219444;
      auVar148._20_4_ = -0.00021219444;
      auVar148._24_4_ = -0.00021219444;
      auVar148._28_4_ = -0.00021219444;
      auVar148._32_4_ = -0.00021219444;
      auVar148._36_4_ = -0.00021219444;
      auVar148._40_4_ = -0.00021219444;
      auVar148._44_4_ = -0.00021219444;
      auVar148._48_4_ = -0.00021219444;
      auVar148._52_4_ = -0.00021219444;
      auVar148._56_4_ = -0.00021219444;
      auVar148._60_4_ = -0.00021219444;
      auVar274 = vfnmadd213ps_avx512f(auVar148,auVar149,auVar274);
      auVar273 = vmulps_avx512f(auVar274,auVar274);
      uStack_93f8._0_4_ = 0.00019875691;
      uStack_93f8._4_4_ = 0.00019875691;
      local_9400._0_4_ = 0.00019875691;
      local_9400._4_4_ = 0.00019875691;
      auVar120._16_4_ = 0.00019875691;
      auVar120._20_4_ = 0.00019875691;
      auVar120._0_16_ = _local_9400;
      auVar120._24_4_ = 0.00019875691;
      auVar120._28_4_ = 0.00019875691;
      auVar120._32_4_ = 0.00019875691;
      auVar120._36_4_ = 0.00019875691;
      auVar120._40_4_ = 0.00019875691;
      auVar120._44_4_ = 0.00019875691;
      auVar120._48_4_ = 0.00019875691;
      auVar120._52_4_ = 0.00019875691;
      auVar120._56_4_ = 0.00019875691;
      auVar120._60_4_ = 0.00019875691;
      auVar119._8_4_ = 0.0013981999;
      auVar119._12_4_ = 0.0013981999;
      auVar119._0_4_ = 0.0013981999;
      auVar119._4_4_ = 0.0013981999;
      auVar119._16_4_ = 0.0013981999;
      auVar119._20_4_ = 0.0013981999;
      auVar119._24_4_ = 0.0013981999;
      auVar119._28_4_ = 0.0013981999;
      auVar119._32_4_ = 0.0013981999;
      auVar119._36_4_ = 0.0013981999;
      auVar119._40_4_ = 0.0013981999;
      auVar119._44_4_ = 0.0013981999;
      auVar119._48_4_ = 0.0013981999;
      auVar119._52_4_ = 0.0013981999;
      auVar119._56_4_ = 0.0013981999;
      auVar119._60_4_ = 0.0013981999;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar120,auVar119);
      auVar118._8_4_ = 0.008333452;
      auVar118._12_4_ = 0.008333452;
      auVar118._0_4_ = 0.008333452;
      auVar118._4_4_ = 0.008333452;
      auVar118._16_4_ = 0.008333452;
      auVar118._20_4_ = 0.008333452;
      auVar118._24_4_ = 0.008333452;
      auVar118._28_4_ = 0.008333452;
      auVar118._32_4_ = 0.008333452;
      auVar118._36_4_ = 0.008333452;
      auVar118._40_4_ = 0.008333452;
      auVar118._44_4_ = 0.008333452;
      auVar118._48_4_ = 0.008333452;
      auVar118._52_4_ = 0.008333452;
      auVar118._56_4_ = 0.008333452;
      auVar118._60_4_ = 0.008333452;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar118);
      auVar117._8_4_ = 0.041665796;
      auVar117._12_4_ = 0.041665796;
      auVar117._0_4_ = 0.041665796;
      auVar117._4_4_ = 0.041665796;
      auVar117._16_4_ = 0.041665796;
      auVar117._20_4_ = 0.041665796;
      auVar117._24_4_ = 0.041665796;
      auVar117._28_4_ = 0.041665796;
      auVar117._32_4_ = 0.041665796;
      auVar117._36_4_ = 0.041665796;
      auVar117._40_4_ = 0.041665796;
      auVar117._44_4_ = 0.041665796;
      auVar117._48_4_ = 0.041665796;
      auVar117._52_4_ = 0.041665796;
      auVar117._56_4_ = 0.041665796;
      auVar117._60_4_ = 0.041665796;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar117);
      auVar116._8_4_ = 0.16666666;
      auVar116._12_4_ = 0.16666666;
      auVar116._0_4_ = 0.16666666;
      auVar116._4_4_ = 0.16666666;
      auVar116._16_4_ = 0.16666666;
      auVar116._20_4_ = 0.16666666;
      auVar116._24_4_ = 0.16666666;
      auVar116._28_4_ = 0.16666666;
      auVar116._32_4_ = 0.16666666;
      auVar116._36_4_ = 0.16666666;
      auVar116._40_4_ = 0.16666666;
      auVar116._44_4_ = 0.16666666;
      auVar116._48_4_ = 0.16666666;
      auVar116._52_4_ = 0.16666666;
      auVar116._56_4_ = 0.16666666;
      auVar116._60_4_ = 0.16666666;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar116);
      auVar272._8_4_ = 0.5;
      auVar272._12_4_ = 0.5;
      auVar272._0_4_ = 0.5;
      auVar272._4_4_ = 0.5;
      auVar272._16_4_ = 0.5;
      auVar272._20_4_ = 0.5;
      auVar272._24_4_ = 0.5;
      auVar272._28_4_ = 0.5;
      auVar272._32_4_ = 0.5;
      auVar272._36_4_ = 0.5;
      auVar272._40_4_ = 0.5;
      auVar272._44_4_ = 0.5;
      auVar272._48_4_ = 0.5;
      auVar272._52_4_ = 0.5;
      auVar272._56_4_ = 0.5;
      auVar272._60_4_ = 0.5;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar272);
      auVar273 = vfmadd213ps_avx512f(auVar273,auVar275,auVar274);
      auVar274._8_4_ = 1.0;
      auVar274._12_4_ = 1.0;
      auVar274._0_4_ = 1.0;
      auVar274._4_4_ = 1.0;
      auVar274._16_4_ = 1.0;
      auVar274._20_4_ = 1.0;
      auVar274._24_4_ = 1.0;
      auVar274._28_4_ = 1.0;
      auVar274._32_4_ = 1.0;
      auVar274._36_4_ = 1.0;
      auVar274._40_4_ = 1.0;
      auVar274._44_4_ = 1.0;
      auVar274._48_4_ = 1.0;
      auVar274._52_4_ = 1.0;
      auVar274._56_4_ = 1.0;
      auVar274._60_4_ = 1.0;
      auVar275 = vaddps_avx512f(auVar273,auVar274);
      auVar160._16_8_ = uStack_92f0;
      auVar160._0_16_ = local_9300;
      auVar160._24_8_ = uStack_92e8;
      auVar160._32_8_ = uStack_92e0;
      auVar160._40_8_ = uStack_92d8;
      auVar160._48_8_ = uStack_92d0;
      auVar160._56_8_ = uStack_92c8;
      auVar274 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar274);
      auVar274 = vcvttps2dq_avx512f(auVar160);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vpaddd_avx512f(auVar274,auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vpslld_avx512f(auVar274,ZEXT416(0x17));
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmulps_avx512f(auVar275,auVar274);
      local_9400 = auVar274._0_8_;
      uStack_93f8 = auVar274._8_8_;
      uStack_93f0 = auVar274._16_8_;
      uStack_93e8 = auVar274._24_8_;
      uStack_93e0 = auVar274._32_8_;
      uStack_93d8 = auVar274._40_8_;
      uStack_93d0 = auVar274._48_8_;
      uStack_93c8 = auVar274._56_8_;
      *local_a570 = local_9400;
      local_a570[1] = uStack_93f8;
      local_a570[2] = uStack_93f0;
      local_a570[3] = uStack_93e8;
      local_a570[4] = uStack_93e0;
      local_a570[5] = uStack_93d8;
      local_a570[6] = uStack_93d0;
      local_a570[7] = uStack_93c8;
      local_a560 = local_a560 + 1;
      local_a568 = local_a568 + 1;
      local_a570 = local_a570 + 8;
    }
  }
  if (in_R8D == 8) {
    for (local_a644 = 0; local_a644 + 1 < in_ECX; local_a644 = local_a644 + 2) {
      fVar277 = *local_a568;
      auVar17 = vinsertps_avx(ZEXT416((uint)fVar277),ZEXT416((uint)fVar277),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)fVar277),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)fVar277),0x30);
      auVar18 = vinsertps_avx(ZEXT416((uint)fVar277),ZEXT416((uint)fVar277),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar277),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar277),0x30);
      uStack_a190 = auVar18._0_8_;
      uStack_a188 = auVar18._8_8_;
      fVar277 = local_a568[1];
      auVar18 = vinsertps_avx(ZEXT416((uint)fVar277),ZEXT416((uint)fVar277),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar277),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar277),0x30);
      auVar19 = vinsertps_avx(ZEXT416((uint)fVar277),ZEXT416((uint)fVar277),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar277),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar277),0x30);
      uStack_a150 = auVar19._0_8_;
      uStack_a148 = auVar19._8_8_;
      auVar16._16_8_ = uStack_a150;
      auVar16._0_16_ = auVar18;
      auVar16._24_8_ = uStack_a148;
      auVar276 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_a188,CONCAT816(uStack_a190,auVar17))),auVar16,
                            1);
      uVar23 = vcmpps_avx512f(*local_a560,ZEXT1664(ZEXT816(0)),2);
      auVar46._8_4_ = 0x800000;
      auVar46._12_4_ = 0x800000;
      auVar46._0_4_ = 0x800000;
      auVar46._4_4_ = 0x800000;
      auVar46._16_4_ = 0x800000;
      auVar46._20_4_ = 0x800000;
      auVar46._24_4_ = 0x800000;
      auVar46._28_4_ = 0x800000;
      auVar46._32_4_ = 0x800000;
      auVar46._36_4_ = 0x800000;
      auVar46._40_4_ = 0x800000;
      auVar46._44_4_ = 0x800000;
      auVar46._48_4_ = 0x800000;
      auVar46._52_4_ = 0x800000;
      auVar46._56_4_ = 0x800000;
      auVar46._60_4_ = 0x800000;
      auVar273 = vmaxps_avx512f(*local_a560,auVar46);
      auVar274 = vmovdqa64_avx512f(auVar273);
      auVar274 = vpsrld_avx512f(auVar274,ZEXT416(0x17));
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar164._8_4_ = -0x7f800001;
      auVar164._12_4_ = -0x7f800001;
      auVar164._0_4_ = -0x7f800001;
      auVar164._4_4_ = -0x7f800001;
      auVar164._16_4_ = -0x7f800001;
      auVar164._20_4_ = -0x7f800001;
      auVar164._24_4_ = -0x7f800001;
      auVar164._28_4_ = -0x7f800001;
      auVar164._32_4_ = -0x7f800001;
      auVar164._36_4_ = -0x7f800001;
      auVar164._40_4_ = -0x7f800001;
      auVar164._44_4_ = -0x7f800001;
      auVar164._48_4_ = -0x7f800001;
      auVar164._52_4_ = -0x7f800001;
      auVar164._56_4_ = -0x7f800001;
      auVar164._60_4_ = -0x7f800001;
      auVar275 = vmovdqa64_avx512f(auVar164);
      auVar273 = vpandd_avx512f(auVar273,auVar275);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar167._8_4_ = 0.5;
      auVar167._12_4_ = 0.5;
      auVar167._0_4_ = 0.5;
      auVar167._4_4_ = 0.5;
      auVar167._16_4_ = 0.5;
      auVar167._20_4_ = 0.5;
      auVar167._24_4_ = 0.5;
      auVar167._28_4_ = 0.5;
      auVar167._32_4_ = 0.5;
      auVar167._36_4_ = 0.5;
      auVar167._40_4_ = 0.5;
      auVar167._44_4_ = 0.5;
      auVar167._48_4_ = 0.5;
      auVar167._52_4_ = 0.5;
      auVar167._56_4_ = 0.5;
      auVar167._60_4_ = 0.5;
      auVar275 = vmovdqa64_avx512f(auVar167);
      auVar273 = vpord_avx512f(auVar273,auVar275);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar275 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar275 = vmovdqa64_avx512f(auVar275);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar275 = vmovdqa64_avx512f(auVar275);
      auVar274 = vpsubd_avx512f(auVar274,auVar275);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vcvtdq2ps_avx512f(auVar274);
      auVar41._8_4_ = 1.0;
      auVar41._12_4_ = 1.0;
      auVar41._0_4_ = 1.0;
      auVar41._4_4_ = 1.0;
      auVar41._16_4_ = 1.0;
      auVar41._20_4_ = 1.0;
      auVar41._24_4_ = 1.0;
      auVar41._28_4_ = 1.0;
      auVar41._32_4_ = 1.0;
      auVar41._36_4_ = 1.0;
      auVar41._40_4_ = 1.0;
      auVar41._44_4_ = 1.0;
      auVar41._48_4_ = 1.0;
      auVar41._52_4_ = 1.0;
      auVar41._56_4_ = 1.0;
      auVar41._60_4_ = 1.0;
      auVar274 = vaddps_avx512f(auVar274,auVar41);
      uVar24 = vcmpps_avx512f(auVar273,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar25 = (ushort)uVar24;
      auVar42._8_4_ = 1.0;
      auVar42._12_4_ = 1.0;
      auVar42._0_4_ = 1.0;
      auVar42._4_4_ = 1.0;
      auVar42._16_4_ = 1.0;
      auVar42._20_4_ = 1.0;
      auVar42._24_4_ = 1.0;
      auVar42._28_4_ = 1.0;
      auVar42._32_4_ = 1.0;
      auVar42._36_4_ = 1.0;
      auVar42._40_4_ = 1.0;
      auVar42._44_4_ = 1.0;
      auVar42._48_4_ = 1.0;
      auVar42._52_4_ = 1.0;
      auVar42._56_4_ = 1.0;
      auVar42._60_4_ = 1.0;
      auVar275 = vsubps_avx512f(auVar273,auVar42);
      auVar140._8_4_ = 1.0;
      auVar140._12_4_ = 1.0;
      auVar140._0_4_ = 1.0;
      auVar140._4_4_ = 1.0;
      auVar140._16_4_ = 1.0;
      auVar140._20_4_ = 1.0;
      auVar140._24_4_ = 1.0;
      auVar140._28_4_ = 1.0;
      auVar140._32_4_ = 1.0;
      auVar140._36_4_ = 1.0;
      auVar140._40_4_ = 1.0;
      auVar140._44_4_ = 1.0;
      auVar140._48_4_ = 1.0;
      auVar140._52_4_ = 1.0;
      auVar140._56_4_ = 1.0;
      auVar140._60_4_ = 1.0;
      local_5480 = auVar274._0_4_;
      iStack_547c = auVar274._4_4_;
      iStack_5478 = auVar274._8_4_;
      iStack_5474 = auVar274._12_4_;
      iStack_5470 = auVar274._16_4_;
      iStack_546c = auVar274._20_4_;
      iStack_5468 = auVar274._24_4_;
      iStack_5464 = auVar274._28_4_;
      iStack_5460 = auVar274._32_4_;
      iStack_545c = auVar274._36_4_;
      iStack_5458 = auVar274._40_4_;
      iStack_5454 = auVar274._44_4_;
      iStack_5450 = auVar274._48_4_;
      iStack_544c = auVar274._52_4_;
      iStack_5448 = auVar274._56_4_;
      iStack_5444 = auVar274._60_4_;
      auVar274 = vsubps_avx512f(auVar274,auVar140);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar24 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8900._4_4_ = (uint)bVar2 * auVar274._4_4_ | (uint)!bVar2 * iStack_547c;
      local_8900._0_4_ = (uint)bVar1 * auVar274._0_4_ | (uint)!bVar1 * local_5480;
      local_8900._8_4_ = (uint)bVar3 * auVar274._8_4_ | (uint)!bVar3 * iStack_5478;
      local_8900._12_4_ = (uint)bVar4 * auVar274._12_4_ | (uint)!bVar4 * iStack_5474;
      uStack_88f0._0_4_ = (uint)bVar5 * auVar274._16_4_ | (uint)!bVar5 * iStack_5470;
      uStack_88f0._4_4_ = (uint)bVar6 * auVar274._20_4_ | (uint)!bVar6 * iStack_546c;
      uStack_88e8._0_4_ = (uint)bVar7 * auVar274._24_4_ | (uint)!bVar7 * iStack_5468;
      uStack_88e8._4_4_ = (uint)bVar8 * auVar274._28_4_ | (uint)!bVar8 * iStack_5464;
      auVar16 = _local_8900;
      uStack_88e0._0_4_ =
           (uint)(bVar9 & 1) * auVar274._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_5460;
      uStack_88e0._4_4_ = (uint)bVar10 * auVar274._36_4_ | (uint)!bVar10 * iStack_545c;
      auVar265 = _local_8900;
      uStack_88d8._0_4_ = (uint)bVar11 * auVar274._40_4_ | (uint)!bVar11 * iStack_5458;
      uStack_88d8._4_4_ = (uint)bVar12 * auVar274._44_4_ | (uint)!bVar12 * iStack_5454;
      auVar266 = _local_8900;
      uStack_88d0._0_4_ = (uint)bVar13 * auVar274._48_4_ | (uint)!bVar13 * iStack_5450;
      uStack_88d0._4_4_ = (uint)bVar14 * auVar274._52_4_ | (uint)!bVar14 * iStack_544c;
      auVar267 = _local_8900;
      uStack_88c8._0_4_ = (uint)bVar15 * auVar274._56_4_ | (uint)!bVar15 * iStack_5448;
      uStack_88c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar274._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5444;
      auVar274 = _local_8900;
      local_35c0 = auVar275._0_4_;
      iStack_35bc = auVar275._4_4_;
      iStack_35b8 = auVar275._8_4_;
      iStack_35b4 = auVar275._12_4_;
      iStack_35b0 = auVar275._16_4_;
      iStack_35ac = auVar275._20_4_;
      iStack_35a8 = auVar275._24_4_;
      iStack_35a4 = auVar275._28_4_;
      iStack_35a0 = auVar275._32_4_;
      iStack_359c = auVar275._36_4_;
      iStack_3598 = auVar275._40_4_;
      iStack_3594 = auVar275._44_4_;
      iStack_3590 = auVar275._48_4_;
      iStack_358c = auVar275._52_4_;
      iStack_3588 = auVar275._56_4_;
      iStack_3584 = auVar275._60_4_;
      auVar273 = vaddps_avx512f(auVar275,auVar273);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8800._4_4_ = (uint)bVar2 * auVar273._4_4_ | (uint)!bVar2 * iStack_35bc;
      local_8800._0_4_ = (uint)bVar1 * auVar273._0_4_ | (uint)!bVar1 * local_35c0;
      local_8800._8_4_ = (uint)bVar3 * auVar273._8_4_ | (uint)!bVar3 * iStack_35b8;
      local_8800._12_4_ = (uint)bVar4 * auVar273._12_4_ | (uint)!bVar4 * iStack_35b4;
      uStack_87f0._0_4_ = (uint)bVar5 * auVar273._16_4_ | (uint)!bVar5 * iStack_35b0;
      uStack_87f0._4_4_ = (uint)bVar6 * auVar273._20_4_ | (uint)!bVar6 * iStack_35ac;
      uStack_87e8._0_4_ = (uint)bVar7 * auVar273._24_4_ | (uint)!bVar7 * iStack_35a8;
      uStack_87e8._4_4_ = (uint)bVar8 * auVar273._28_4_ | (uint)!bVar8 * iStack_35a4;
      auVar278 = _local_8800;
      uStack_87e0._0_4_ =
           (uint)(bVar9 & 1) * auVar273._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_35a0;
      uStack_87e0._4_4_ = (uint)bVar10 * auVar273._36_4_ | (uint)!bVar10 * iStack_359c;
      auVar268 = _local_8800;
      uStack_87d8._0_4_ = (uint)bVar11 * auVar273._40_4_ | (uint)!bVar11 * iStack_3598;
      uStack_87d8._4_4_ = (uint)bVar12 * auVar273._44_4_ | (uint)!bVar12 * iStack_3594;
      auVar269 = _local_8800;
      uStack_87d0._0_4_ = (uint)bVar13 * auVar273._48_4_ | (uint)!bVar13 * iStack_3590;
      uStack_87d0._4_4_ = (uint)bVar14 * auVar273._52_4_ | (uint)!bVar14 * iStack_358c;
      auVar270 = _local_8800;
      uStack_87c8._0_4_ = (uint)bVar15 * auVar273._56_4_ | (uint)!bVar15 * iStack_3588;
      uStack_87c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar273._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_3584;
      auVar273 = _local_8800;
      uStack_87e8 = auVar278._24_8_;
      uStack_87e0 = auVar268._32_8_;
      uStack_87d8 = auVar269._40_8_;
      uStack_87d0 = auVar270._48_8_;
      uStack_87c8 = auVar273._56_8_;
      auVar45._16_8_ = uStack_87f0;
      auVar45._0_16_ = local_8800;
      auVar45._24_8_ = uStack_87e8;
      auVar45._32_8_ = uStack_87e0;
      auVar45._40_8_ = uStack_87d8;
      auVar45._48_8_ = uStack_87d0;
      auVar45._56_8_ = uStack_87c8;
      auVar44._16_8_ = uStack_87f0;
      auVar44._0_16_ = local_8800;
      auVar44._24_8_ = uStack_87e8;
      auVar44._32_8_ = uStack_87e0;
      auVar44._40_8_ = uStack_87d8;
      auVar44._48_8_ = uStack_87d0;
      auVar44._56_8_ = uStack_87c8;
      auVar273 = vmulps_avx512f(auVar45,auVar44);
      local_8a00._8_4_ = 0.070376836;
      local_8a00._12_4_ = 0.070376836;
      local_8a00._0_4_ = 0.070376836;
      local_8a00._4_4_ = 0.070376836;
      auVar94._16_4_ = 0.070376836;
      auVar94._20_4_ = 0.070376836;
      auVar94._0_16_ = local_8a00._0_16_;
      auVar94._24_4_ = 0.070376836;
      auVar94._28_4_ = 0.070376836;
      auVar94._32_4_ = 0.070376836;
      auVar94._36_4_ = 0.070376836;
      auVar94._40_4_ = 0.070376836;
      auVar94._44_4_ = 0.070376836;
      auVar94._48_4_ = 0.070376836;
      auVar94._52_4_ = 0.070376836;
      auVar94._56_4_ = 0.070376836;
      auVar94._60_4_ = 0.070376836;
      auVar93._16_8_ = uStack_87f0;
      auVar93._0_16_ = local_8800;
      auVar93._24_8_ = uStack_87e8;
      auVar93._32_8_ = uStack_87e0;
      auVar93._40_8_ = uStack_87d8;
      auVar93._48_8_ = uStack_87d0;
      auVar93._56_8_ = uStack_87c8;
      auVar92._8_4_ = -0.1151461;
      auVar92._12_4_ = -0.1151461;
      auVar92._0_4_ = -0.1151461;
      auVar92._4_4_ = -0.1151461;
      auVar92._16_4_ = -0.1151461;
      auVar92._20_4_ = -0.1151461;
      auVar92._24_4_ = -0.1151461;
      auVar92._28_4_ = -0.1151461;
      auVar92._32_4_ = -0.1151461;
      auVar92._36_4_ = -0.1151461;
      auVar92._40_4_ = -0.1151461;
      auVar92._44_4_ = -0.1151461;
      auVar92._48_4_ = -0.1151461;
      auVar92._52_4_ = -0.1151461;
      auVar92._56_4_ = -0.1151461;
      auVar92._60_4_ = -0.1151461;
      auVar275 = vfmadd213ps_avx512f(auVar93,auVar94,auVar92);
      auVar91._16_8_ = uStack_87f0;
      auVar91._0_16_ = local_8800;
      auVar91._24_8_ = uStack_87e8;
      auVar91._32_8_ = uStack_87e0;
      auVar91._40_8_ = uStack_87d8;
      auVar91._48_8_ = uStack_87d0;
      auVar91._56_8_ = uStack_87c8;
      auVar90._8_4_ = 0.116769984;
      auVar90._12_4_ = 0.116769984;
      auVar90._0_4_ = 0.116769984;
      auVar90._4_4_ = 0.116769984;
      auVar90._16_4_ = 0.116769984;
      auVar90._20_4_ = 0.116769984;
      auVar90._24_4_ = 0.116769984;
      auVar90._28_4_ = 0.116769984;
      auVar90._32_4_ = 0.116769984;
      auVar90._36_4_ = 0.116769984;
      auVar90._40_4_ = 0.116769984;
      auVar90._44_4_ = 0.116769984;
      auVar90._48_4_ = 0.116769984;
      auVar90._52_4_ = 0.116769984;
      auVar90._56_4_ = 0.116769984;
      auVar90._60_4_ = 0.116769984;
      auVar275 = vfmadd213ps_avx512f(auVar91,auVar275,auVar90);
      auVar89._16_8_ = uStack_87f0;
      auVar89._0_16_ = local_8800;
      auVar89._24_8_ = uStack_87e8;
      auVar89._32_8_ = uStack_87e0;
      auVar89._40_8_ = uStack_87d8;
      auVar89._48_8_ = uStack_87d0;
      auVar89._56_8_ = uStack_87c8;
      auVar88._8_4_ = -0.12420141;
      auVar88._12_4_ = -0.12420141;
      auVar88._0_4_ = -0.12420141;
      auVar88._4_4_ = -0.12420141;
      auVar88._16_4_ = -0.12420141;
      auVar88._20_4_ = -0.12420141;
      auVar88._24_4_ = -0.12420141;
      auVar88._28_4_ = -0.12420141;
      auVar88._32_4_ = -0.12420141;
      auVar88._36_4_ = -0.12420141;
      auVar88._40_4_ = -0.12420141;
      auVar88._44_4_ = -0.12420141;
      auVar88._48_4_ = -0.12420141;
      auVar88._52_4_ = -0.12420141;
      auVar88._56_4_ = -0.12420141;
      auVar88._60_4_ = -0.12420141;
      auVar275 = vfmadd213ps_avx512f(auVar89,auVar275,auVar88);
      auVar87._16_8_ = uStack_87f0;
      auVar87._0_16_ = local_8800;
      auVar87._24_8_ = uStack_87e8;
      auVar87._32_8_ = uStack_87e0;
      auVar87._40_8_ = uStack_87d8;
      auVar87._48_8_ = uStack_87d0;
      auVar87._56_8_ = uStack_87c8;
      auVar86._8_4_ = 0.14249323;
      auVar86._12_4_ = 0.14249323;
      auVar86._0_4_ = 0.14249323;
      auVar86._4_4_ = 0.14249323;
      auVar86._16_4_ = 0.14249323;
      auVar86._20_4_ = 0.14249323;
      auVar86._24_4_ = 0.14249323;
      auVar86._28_4_ = 0.14249323;
      auVar86._32_4_ = 0.14249323;
      auVar86._36_4_ = 0.14249323;
      auVar86._40_4_ = 0.14249323;
      auVar86._44_4_ = 0.14249323;
      auVar86._48_4_ = 0.14249323;
      auVar86._52_4_ = 0.14249323;
      auVar86._56_4_ = 0.14249323;
      auVar86._60_4_ = 0.14249323;
      auVar275 = vfmadd213ps_avx512f(auVar87,auVar275,auVar86);
      auVar85._16_8_ = uStack_87f0;
      auVar85._0_16_ = local_8800;
      auVar85._24_8_ = uStack_87e8;
      auVar85._32_8_ = uStack_87e0;
      auVar85._40_8_ = uStack_87d8;
      auVar85._48_8_ = uStack_87d0;
      auVar85._56_8_ = uStack_87c8;
      auVar84._8_4_ = -0.16668057;
      auVar84._12_4_ = -0.16668057;
      auVar84._0_4_ = -0.16668057;
      auVar84._4_4_ = -0.16668057;
      auVar84._16_4_ = -0.16668057;
      auVar84._20_4_ = -0.16668057;
      auVar84._24_4_ = -0.16668057;
      auVar84._28_4_ = -0.16668057;
      auVar84._32_4_ = -0.16668057;
      auVar84._36_4_ = -0.16668057;
      auVar84._40_4_ = -0.16668057;
      auVar84._44_4_ = -0.16668057;
      auVar84._48_4_ = -0.16668057;
      auVar84._52_4_ = -0.16668057;
      auVar84._56_4_ = -0.16668057;
      auVar84._60_4_ = -0.16668057;
      auVar275 = vfmadd213ps_avx512f(auVar85,auVar275,auVar84);
      auVar83._16_8_ = uStack_87f0;
      auVar83._0_16_ = local_8800;
      auVar83._24_8_ = uStack_87e8;
      auVar83._32_8_ = uStack_87e0;
      auVar83._40_8_ = uStack_87d8;
      auVar83._48_8_ = uStack_87d0;
      auVar83._56_8_ = uStack_87c8;
      auVar82._8_4_ = 0.20000714;
      auVar82._12_4_ = 0.20000714;
      auVar82._0_4_ = 0.20000714;
      auVar82._4_4_ = 0.20000714;
      auVar82._16_4_ = 0.20000714;
      auVar82._20_4_ = 0.20000714;
      auVar82._24_4_ = 0.20000714;
      auVar82._28_4_ = 0.20000714;
      auVar82._32_4_ = 0.20000714;
      auVar82._36_4_ = 0.20000714;
      auVar82._40_4_ = 0.20000714;
      auVar82._44_4_ = 0.20000714;
      auVar82._48_4_ = 0.20000714;
      auVar82._52_4_ = 0.20000714;
      auVar82._56_4_ = 0.20000714;
      auVar82._60_4_ = 0.20000714;
      auVar275 = vfmadd213ps_avx512f(auVar83,auVar275,auVar82);
      auVar81._16_8_ = uStack_87f0;
      auVar81._0_16_ = local_8800;
      auVar81._24_8_ = uStack_87e8;
      auVar81._32_8_ = uStack_87e0;
      auVar81._40_8_ = uStack_87d8;
      auVar81._48_8_ = uStack_87d0;
      auVar81._56_8_ = uStack_87c8;
      auVar80._8_4_ = -0.24999994;
      auVar80._12_4_ = -0.24999994;
      auVar80._0_4_ = -0.24999994;
      auVar80._4_4_ = -0.24999994;
      auVar80._16_4_ = -0.24999994;
      auVar80._20_4_ = -0.24999994;
      auVar80._24_4_ = -0.24999994;
      auVar80._28_4_ = -0.24999994;
      auVar80._32_4_ = -0.24999994;
      auVar80._36_4_ = -0.24999994;
      auVar80._40_4_ = -0.24999994;
      auVar80._44_4_ = -0.24999994;
      auVar80._48_4_ = -0.24999994;
      auVar80._52_4_ = -0.24999994;
      auVar80._56_4_ = -0.24999994;
      auVar80._60_4_ = -0.24999994;
      auVar275 = vfmadd213ps_avx512f(auVar81,auVar275,auVar80);
      auVar79._16_8_ = uStack_87f0;
      auVar79._0_16_ = local_8800;
      auVar79._24_8_ = uStack_87e8;
      auVar79._32_8_ = uStack_87e0;
      auVar79._40_8_ = uStack_87d8;
      auVar79._48_8_ = uStack_87d0;
      auVar79._56_8_ = uStack_87c8;
      auVar78._8_4_ = 0.3333333;
      auVar78._12_4_ = 0.3333333;
      auVar78._0_4_ = 0.3333333;
      auVar78._4_4_ = 0.3333333;
      auVar78._16_4_ = 0.3333333;
      auVar78._20_4_ = 0.3333333;
      auVar78._24_4_ = 0.3333333;
      auVar78._28_4_ = 0.3333333;
      auVar78._32_4_ = 0.3333333;
      auVar78._36_4_ = 0.3333333;
      auVar78._40_4_ = 0.3333333;
      auVar78._44_4_ = 0.3333333;
      auVar78._48_4_ = 0.3333333;
      auVar78._52_4_ = 0.3333333;
      auVar78._56_4_ = 0.3333333;
      auVar78._60_4_ = 0.3333333;
      auVar275 = vfmadd213ps_avx512f(auVar79,auVar275,auVar78);
      auVar43._16_8_ = uStack_87f0;
      auVar43._0_16_ = local_8800;
      auVar43._24_8_ = uStack_87e8;
      auVar43._32_8_ = uStack_87e0;
      auVar43._40_8_ = uStack_87d8;
      auVar43._48_8_ = uStack_87d0;
      auVar43._56_8_ = uStack_87c8;
      auVar275 = vmulps_avx512f(auVar275,auVar43);
      auVar275 = vmulps_avx512f(auVar275,auVar273);
      uStack_88e8 = auVar16._24_8_;
      uStack_88e0 = auVar265._32_8_;
      uStack_88d8 = auVar266._40_8_;
      uStack_88d0 = auVar267._48_8_;
      uStack_88c8 = auVar274._56_8_;
      auVar77._16_8_ = uStack_88f0;
      auVar77._0_16_ = local_8900;
      auVar77._24_8_ = uStack_88e8;
      auVar77._32_8_ = uStack_88e0;
      auVar77._40_8_ = uStack_88d8;
      auVar77._48_8_ = uStack_88d0;
      auVar77._56_8_ = uStack_88c8;
      auVar76._8_4_ = -0.00021219444;
      auVar76._12_4_ = -0.00021219444;
      auVar76._0_4_ = -0.00021219444;
      auVar76._4_4_ = -0.00021219444;
      auVar76._16_4_ = -0.00021219444;
      auVar76._20_4_ = -0.00021219444;
      auVar76._24_4_ = -0.00021219444;
      auVar76._28_4_ = -0.00021219444;
      auVar76._32_4_ = -0.00021219444;
      auVar76._36_4_ = -0.00021219444;
      auVar76._40_4_ = -0.00021219444;
      auVar76._44_4_ = -0.00021219444;
      auVar76._48_4_ = -0.00021219444;
      auVar76._52_4_ = -0.00021219444;
      auVar76._56_4_ = -0.00021219444;
      auVar76._60_4_ = -0.00021219444;
      auVar274 = vfmadd213ps_avx512f(auVar76,auVar77,auVar275);
      auVar146._8_4_ = 0.5;
      auVar146._12_4_ = 0.5;
      auVar146._0_4_ = 0.5;
      auVar146._4_4_ = 0.5;
      auVar146._16_4_ = 0.5;
      auVar146._20_4_ = 0.5;
      auVar146._24_4_ = 0.5;
      auVar146._28_4_ = 0.5;
      auVar146._32_4_ = 0.5;
      auVar146._36_4_ = 0.5;
      auVar146._40_4_ = 0.5;
      auVar146._44_4_ = 0.5;
      auVar146._48_4_ = 0.5;
      auVar146._52_4_ = 0.5;
      auVar146._56_4_ = 0.5;
      auVar146._60_4_ = 0.5;
      auVar274 = vfnmadd213ps_avx512f(auVar146,auVar273,auVar274);
      auVar40._16_8_ = uStack_87f0;
      auVar40._0_16_ = local_8800;
      auVar40._24_8_ = uStack_87e8;
      auVar40._32_8_ = uStack_87e0;
      auVar40._40_8_ = uStack_87d8;
      auVar40._48_8_ = uStack_87d0;
      auVar40._56_8_ = uStack_87c8;
      auVar274 = vaddps_avx512f(auVar40,auVar274);
      auVar75._16_8_ = uStack_88f0;
      auVar75._0_16_ = local_8900;
      auVar75._24_8_ = uStack_88e8;
      auVar75._32_8_ = uStack_88e0;
      auVar75._40_8_ = uStack_88d8;
      auVar75._48_8_ = uStack_88d0;
      auVar75._56_8_ = uStack_88c8;
      auVar74._8_4_ = 0.6933594;
      auVar74._12_4_ = 0.6933594;
      auVar74._0_4_ = 0.6933594;
      auVar74._4_4_ = 0.6933594;
      auVar74._16_4_ = 0.6933594;
      auVar74._20_4_ = 0.6933594;
      auVar74._24_4_ = 0.6933594;
      auVar74._28_4_ = 0.6933594;
      auVar74._32_4_ = 0.6933594;
      auVar74._36_4_ = 0.6933594;
      auVar74._40_4_ = 0.6933594;
      auVar74._44_4_ = 0.6933594;
      auVar74._48_4_ = 0.6933594;
      auVar74._52_4_ = 0.6933594;
      auVar74._56_4_ = 0.6933594;
      auVar74._60_4_ = 0.6933594;
      auVar273 = vfmadd213ps_avx512f(auVar74,auVar75,auVar274);
      auVar274 = vpmovm2d_avx512dq(uVar23 & 0xffff);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vpord_avx512f(auVar273,auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmulps_avx512f(auVar276,auVar274);
      auVar32._8_4_ = 88.37626;
      auVar32._12_4_ = 88.37626;
      auVar32._0_4_ = 88.37626;
      auVar32._4_4_ = 88.37626;
      auVar32._16_4_ = 88.37626;
      auVar32._20_4_ = 88.37626;
      auVar32._24_4_ = 88.37626;
      auVar32._28_4_ = 88.37626;
      auVar32._32_4_ = 88.37626;
      auVar32._36_4_ = 88.37626;
      auVar32._40_4_ = 88.37626;
      auVar32._44_4_ = 88.37626;
      auVar32._48_4_ = 88.37626;
      auVar32._52_4_ = 88.37626;
      auVar32._56_4_ = 88.37626;
      auVar32._60_4_ = 88.37626;
      auVar274 = vminps_avx512f(auVar274,auVar32);
      auVar31._8_4_ = -88.37626;
      auVar31._12_4_ = -88.37626;
      auVar31._0_4_ = -88.37626;
      auVar31._4_4_ = -88.37626;
      auVar31._16_4_ = -88.37626;
      auVar31._20_4_ = -88.37626;
      auVar31._24_4_ = -88.37626;
      auVar31._28_4_ = -88.37626;
      auVar31._32_4_ = -88.37626;
      auVar31._36_4_ = -88.37626;
      auVar31._40_4_ = -88.37626;
      auVar31._44_4_ = -88.37626;
      auVar31._48_4_ = -88.37626;
      auVar31._52_4_ = -88.37626;
      auVar31._56_4_ = -88.37626;
      auVar31._60_4_ = -88.37626;
      auVar273 = vmaxps_avx512f(auVar274,auVar31);
      auVar130._8_4_ = 1.442695;
      auVar130._12_4_ = 1.442695;
      auVar130._0_4_ = 1.442695;
      auVar130._4_4_ = 1.442695;
      auVar130._16_4_ = 1.442695;
      auVar130._20_4_ = 1.442695;
      auVar130._24_4_ = 1.442695;
      auVar130._28_4_ = 1.442695;
      auVar130._32_4_ = 1.442695;
      auVar130._36_4_ = 1.442695;
      auVar130._40_4_ = 1.442695;
      auVar130._44_4_ = 1.442695;
      auVar130._48_4_ = 1.442695;
      auVar130._52_4_ = 1.442695;
      auVar130._56_4_ = 1.442695;
      auVar130._60_4_ = 1.442695;
      auVar129._8_4_ = 0.5;
      auVar129._12_4_ = 0.5;
      auVar129._0_4_ = 0.5;
      auVar129._4_4_ = 0.5;
      auVar129._16_4_ = 0.5;
      auVar129._20_4_ = 0.5;
      auVar129._24_4_ = 0.5;
      auVar129._28_4_ = 0.5;
      auVar129._32_4_ = 0.5;
      auVar129._36_4_ = 0.5;
      auVar129._40_4_ = 0.5;
      auVar129._44_4_ = 0.5;
      auVar129._48_4_ = 0.5;
      auVar129._52_4_ = 0.5;
      auVar129._56_4_ = 0.5;
      auVar129._60_4_ = 0.5;
      auVar274 = vfmadd213ps_avx512f(auVar130,auVar273,auVar129);
      auVar275 = vrndscaleps_avx512f(auVar274,1);
      uVar24 = vcmpps_avx512f(auVar274,auVar275,1);
      uVar25 = (ushort)uVar24;
      auVar143._8_4_ = 1.0;
      auVar143._12_4_ = 1.0;
      auVar143._0_4_ = 1.0;
      auVar143._4_4_ = 1.0;
      auVar143._16_4_ = 1.0;
      auVar143._20_4_ = 1.0;
      auVar143._24_4_ = 1.0;
      auVar143._28_4_ = 1.0;
      auVar143._32_4_ = 1.0;
      auVar143._36_4_ = 1.0;
      auVar143._40_4_ = 1.0;
      auVar143._44_4_ = 1.0;
      auVar143._48_4_ = 1.0;
      auVar143._52_4_ = 1.0;
      auVar143._56_4_ = 1.0;
      auVar143._60_4_ = 1.0;
      local_5000 = auVar275._0_4_;
      iStack_4ffc = auVar275._4_4_;
      iStack_4ff8 = auVar275._8_4_;
      iStack_4ff4 = auVar275._12_4_;
      iStack_4ff0 = auVar275._16_4_;
      iStack_4fec = auVar275._20_4_;
      iStack_4fe8 = auVar275._24_4_;
      iStack_4fe4 = auVar275._28_4_;
      iStack_4fe0 = auVar275._32_4_;
      iStack_4fdc = auVar275._36_4_;
      iStack_4fd8 = auVar275._40_4_;
      iStack_4fd4 = auVar275._44_4_;
      iStack_4fd0 = auVar275._48_4_;
      iStack_4fcc = auVar275._52_4_;
      iStack_4fc8 = auVar275._56_4_;
      iStack_4fc4 = auVar275._60_4_;
      auVar274 = vsubps_avx512f(auVar275,auVar143);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar24 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_9780._4_4_ = (uint)bVar2 * auVar274._4_4_ | (uint)!bVar2 * iStack_4ffc;
      local_9780._0_4_ = (uint)bVar1 * auVar274._0_4_ | (uint)!bVar1 * local_5000;
      local_9780._8_4_ = (uint)bVar3 * auVar274._8_4_ | (uint)!bVar3 * iStack_4ff8;
      local_9780._12_4_ = (uint)bVar4 * auVar274._12_4_ | (uint)!bVar4 * iStack_4ff4;
      uStack_9770._0_4_ = (uint)bVar5 * auVar274._16_4_ | (uint)!bVar5 * iStack_4ff0;
      uStack_9770._4_4_ = (uint)bVar6 * auVar274._20_4_ | (uint)!bVar6 * iStack_4fec;
      uStack_9768._0_4_ = (uint)bVar7 * auVar274._24_4_ | (uint)!bVar7 * iStack_4fe8;
      uStack_9768._4_4_ = (uint)bVar8 * auVar274._28_4_ | (uint)!bVar8 * iStack_4fe4;
      auVar16 = _local_9780;
      uStack_9760._0_4_ =
           (uint)(bVar9 & 1) * auVar274._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_4fe0;
      uStack_9760._4_4_ = (uint)bVar10 * auVar274._36_4_ | (uint)!bVar10 * iStack_4fdc;
      auVar265 = _local_9780;
      uStack_9758._0_4_ = (uint)bVar11 * auVar274._40_4_ | (uint)!bVar11 * iStack_4fd8;
      uStack_9758._4_4_ = (uint)bVar12 * auVar274._44_4_ | (uint)!bVar12 * iStack_4fd4;
      auVar266 = _local_9780;
      uStack_9750._0_4_ = (uint)bVar13 * auVar274._48_4_ | (uint)!bVar13 * iStack_4fd0;
      uStack_9750._4_4_ = (uint)bVar14 * auVar274._52_4_ | (uint)!bVar14 * iStack_4fcc;
      auVar267 = _local_9780;
      uStack_9748._0_4_ = (uint)bVar15 * auVar274._56_4_ | (uint)!bVar15 * iStack_4fc8;
      uStack_9748._4_4_ =
           (uint)(bVar9 >> 7) * auVar274._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_4fc4;
      auVar274 = _local_9780;
      uStack_9768 = auVar16._24_8_;
      uStack_9760 = auVar265._32_8_;
      uStack_9758 = auVar266._40_8_;
      uStack_9750 = auVar267._48_8_;
      uStack_9748 = auVar274._56_8_;
      auVar155._16_8_ = uStack_9770;
      auVar155._0_16_ = local_9780;
      auVar155._24_8_ = uStack_9768;
      auVar155._32_8_ = uStack_9760;
      auVar155._40_8_ = uStack_9758;
      auVar155._48_8_ = uStack_9750;
      auVar155._56_8_ = uStack_9748;
      auVar154._8_4_ = 0.6933594;
      auVar154._12_4_ = 0.6933594;
      auVar154._0_4_ = 0.6933594;
      auVar154._4_4_ = 0.6933594;
      auVar154._16_4_ = 0.6933594;
      auVar154._20_4_ = 0.6933594;
      auVar154._24_4_ = 0.6933594;
      auVar154._28_4_ = 0.6933594;
      auVar154._32_4_ = 0.6933594;
      auVar154._36_4_ = 0.6933594;
      auVar154._40_4_ = 0.6933594;
      auVar154._44_4_ = 0.6933594;
      auVar154._48_4_ = 0.6933594;
      auVar154._52_4_ = 0.6933594;
      auVar154._56_4_ = 0.6933594;
      auVar154._60_4_ = 0.6933594;
      auVar274 = vfnmadd213ps_avx512f(auVar154,auVar155,auVar273);
      auVar153._16_8_ = uStack_9770;
      auVar153._0_16_ = local_9780;
      auVar153._24_8_ = uStack_9768;
      auVar153._32_8_ = uStack_9760;
      auVar153._40_8_ = uStack_9758;
      auVar153._48_8_ = uStack_9750;
      auVar153._56_8_ = uStack_9748;
      auVar152._8_4_ = -0.00021219444;
      auVar152._12_4_ = -0.00021219444;
      auVar152._0_4_ = -0.00021219444;
      auVar152._4_4_ = -0.00021219444;
      auVar152._16_4_ = -0.00021219444;
      auVar152._20_4_ = -0.00021219444;
      auVar152._24_4_ = -0.00021219444;
      auVar152._28_4_ = -0.00021219444;
      auVar152._32_4_ = -0.00021219444;
      auVar152._36_4_ = -0.00021219444;
      auVar152._40_4_ = -0.00021219444;
      auVar152._44_4_ = -0.00021219444;
      auVar152._48_4_ = -0.00021219444;
      auVar152._52_4_ = -0.00021219444;
      auVar152._56_4_ = -0.00021219444;
      auVar152._60_4_ = -0.00021219444;
      auVar274 = vfnmadd213ps_avx512f(auVar152,auVar153,auVar274);
      auVar273 = vmulps_avx512f(auVar274,auVar274);
      uStack_9878._0_4_ = 0.00019875691;
      uStack_9878._4_4_ = 0.00019875691;
      local_9880._0_4_ = 0.00019875691;
      local_9880._4_4_ = 0.00019875691;
      auVar128._16_4_ = 0.00019875691;
      auVar128._20_4_ = 0.00019875691;
      auVar128._0_16_ = _local_9880;
      auVar128._24_4_ = 0.00019875691;
      auVar128._28_4_ = 0.00019875691;
      auVar128._32_4_ = 0.00019875691;
      auVar128._36_4_ = 0.00019875691;
      auVar128._40_4_ = 0.00019875691;
      auVar128._44_4_ = 0.00019875691;
      auVar128._48_4_ = 0.00019875691;
      auVar128._52_4_ = 0.00019875691;
      auVar128._56_4_ = 0.00019875691;
      auVar128._60_4_ = 0.00019875691;
      auVar127._8_4_ = 0.0013981999;
      auVar127._12_4_ = 0.0013981999;
      auVar127._0_4_ = 0.0013981999;
      auVar127._4_4_ = 0.0013981999;
      auVar127._16_4_ = 0.0013981999;
      auVar127._20_4_ = 0.0013981999;
      auVar127._24_4_ = 0.0013981999;
      auVar127._28_4_ = 0.0013981999;
      auVar127._32_4_ = 0.0013981999;
      auVar127._36_4_ = 0.0013981999;
      auVar127._40_4_ = 0.0013981999;
      auVar127._44_4_ = 0.0013981999;
      auVar127._48_4_ = 0.0013981999;
      auVar127._52_4_ = 0.0013981999;
      auVar127._56_4_ = 0.0013981999;
      auVar127._60_4_ = 0.0013981999;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar128,auVar127);
      auVar126._8_4_ = 0.008333452;
      auVar126._12_4_ = 0.008333452;
      auVar126._0_4_ = 0.008333452;
      auVar126._4_4_ = 0.008333452;
      auVar126._16_4_ = 0.008333452;
      auVar126._20_4_ = 0.008333452;
      auVar126._24_4_ = 0.008333452;
      auVar126._28_4_ = 0.008333452;
      auVar126._32_4_ = 0.008333452;
      auVar126._36_4_ = 0.008333452;
      auVar126._40_4_ = 0.008333452;
      auVar126._44_4_ = 0.008333452;
      auVar126._48_4_ = 0.008333452;
      auVar126._52_4_ = 0.008333452;
      auVar126._56_4_ = 0.008333452;
      auVar126._60_4_ = 0.008333452;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar126);
      auVar125._8_4_ = 0.041665796;
      auVar125._12_4_ = 0.041665796;
      auVar125._0_4_ = 0.041665796;
      auVar125._4_4_ = 0.041665796;
      auVar125._16_4_ = 0.041665796;
      auVar125._20_4_ = 0.041665796;
      auVar125._24_4_ = 0.041665796;
      auVar125._28_4_ = 0.041665796;
      auVar125._32_4_ = 0.041665796;
      auVar125._36_4_ = 0.041665796;
      auVar125._40_4_ = 0.041665796;
      auVar125._44_4_ = 0.041665796;
      auVar125._48_4_ = 0.041665796;
      auVar125._52_4_ = 0.041665796;
      auVar125._56_4_ = 0.041665796;
      auVar125._60_4_ = 0.041665796;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar125);
      auVar124._8_4_ = 0.16666666;
      auVar124._12_4_ = 0.16666666;
      auVar124._0_4_ = 0.16666666;
      auVar124._4_4_ = 0.16666666;
      auVar124._16_4_ = 0.16666666;
      auVar124._20_4_ = 0.16666666;
      auVar124._24_4_ = 0.16666666;
      auVar124._28_4_ = 0.16666666;
      auVar124._32_4_ = 0.16666666;
      auVar124._36_4_ = 0.16666666;
      auVar124._40_4_ = 0.16666666;
      auVar124._44_4_ = 0.16666666;
      auVar124._48_4_ = 0.16666666;
      auVar124._52_4_ = 0.16666666;
      auVar124._56_4_ = 0.16666666;
      auVar124._60_4_ = 0.16666666;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar124);
      auVar123._8_4_ = 0.5;
      auVar123._12_4_ = 0.5;
      auVar123._0_4_ = 0.5;
      auVar123._4_4_ = 0.5;
      auVar123._16_4_ = 0.5;
      auVar123._20_4_ = 0.5;
      auVar123._24_4_ = 0.5;
      auVar123._28_4_ = 0.5;
      auVar123._32_4_ = 0.5;
      auVar123._36_4_ = 0.5;
      auVar123._40_4_ = 0.5;
      auVar123._44_4_ = 0.5;
      auVar123._48_4_ = 0.5;
      auVar123._52_4_ = 0.5;
      auVar123._56_4_ = 0.5;
      auVar123._60_4_ = 0.5;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar123);
      auVar274 = vfmadd213ps_avx512f(auVar273,auVar275,auVar274);
      auVar30._8_4_ = 1.0;
      auVar30._12_4_ = 1.0;
      auVar30._0_4_ = 1.0;
      auVar30._4_4_ = 1.0;
      auVar30._16_4_ = 1.0;
      auVar30._20_4_ = 1.0;
      auVar30._24_4_ = 1.0;
      auVar30._28_4_ = 1.0;
      auVar30._32_4_ = 1.0;
      auVar30._36_4_ = 1.0;
      auVar30._40_4_ = 1.0;
      auVar30._44_4_ = 1.0;
      auVar30._48_4_ = 1.0;
      auVar30._52_4_ = 1.0;
      auVar30._56_4_ = 1.0;
      auVar30._60_4_ = 1.0;
      auVar275 = vaddps_avx512f(auVar274,auVar30);
      auVar161._16_8_ = uStack_9770;
      auVar161._0_16_ = local_9780;
      auVar161._24_8_ = uStack_9768;
      auVar161._32_8_ = uStack_9760;
      auVar161._40_8_ = uStack_9758;
      auVar161._48_8_ = uStack_9750;
      auVar161._56_8_ = uStack_9748;
      auVar274 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar274);
      auVar274 = vcvttps2dq_avx512f(auVar161);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vpaddd_avx512f(auVar274,auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vpslld_avx512f(auVar274,ZEXT416(0x17));
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmulps_avx512f(auVar275,auVar274);
      local_9880 = auVar274._0_8_;
      uStack_9878 = auVar274._8_8_;
      uStack_9870 = auVar274._16_8_;
      uStack_9868 = auVar274._24_8_;
      uStack_9860 = auVar274._32_8_;
      uStack_9858 = auVar274._40_8_;
      uStack_9850 = auVar274._48_8_;
      uStack_9848 = auVar274._56_8_;
      *local_a570 = local_9880;
      local_a570[1] = uStack_9878;
      local_a570[2] = uStack_9870;
      local_a570[3] = uStack_9868;
      local_a570[4] = uStack_9860;
      local_a570[5] = uStack_9858;
      local_a570[6] = uStack_9850;
      local_a570[7] = uStack_9848;
      local_a560 = local_a560 + 1;
      local_a568 = local_a568 + 2;
      local_a570 = local_a570 + 8;
    }
    for (; local_a644 < in_ECX; local_a644 = local_a644 + 1) {
      fVar277 = *local_a568;
      auVar17 = vinsertps_avx(ZEXT416((uint)fVar277),ZEXT416((uint)fVar277),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)fVar277),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)fVar277),0x30);
      auVar18 = vinsertps_avx(ZEXT416((uint)fVar277),ZEXT416((uint)fVar277),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar277),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar277),0x30);
      auVar16 = vcmpps_avx(*(undefined1 (*) [32])*local_a560,ZEXT1632(ZEXT816(0)),2);
      auVar177._8_4_ = 0x800000;
      auVar177._0_8_ = 0x80000000800000;
      auVar177._12_4_ = 0x800000;
      auVar177._16_4_ = 0x800000;
      auVar177._20_4_ = 0x800000;
      auVar177._24_4_ = 0x800000;
      auVar177._28_4_ = 0x800000;
      auVar278 = vmaxps_avx(*(undefined1 (*) [32])*local_a560,auVar177);
      auVar22 = vpsrld_avx2(auVar278,ZEXT416(0x17));
      auVar179._8_4_ = 0x807fffff;
      auVar179._0_8_ = 0x807fffff807fffff;
      auVar179._12_4_ = 0x807fffff;
      auVar179._16_4_ = 0x807fffff;
      auVar179._20_4_ = 0x807fffff;
      auVar179._24_4_ = 0x807fffff;
      auVar179._28_4_ = 0x807fffff;
      auVar278 = vpand_avx2(auVar278,auVar179);
      auVar228._8_4_ = 0x3f000000;
      auVar228._0_8_ = 0x3f0000003f000000;
      auVar228._12_4_ = 0x3f000000;
      auVar228._16_4_ = 0x3f000000;
      auVar228._20_4_ = 0x3f000000;
      auVar228._24_4_ = 0x3f000000;
      auVar228._28_4_ = 0x3f000000;
      auVar21 = vpor_avx2(auVar278,auVar228);
      auVar231._8_8_ = 0x7f0000007f;
      auVar231._0_8_ = 0x7f0000007f;
      auVar231._16_8_ = 0x7f0000007f;
      auVar231._24_8_ = 0x7f0000007f;
      auVar278 = vpsubd_avx2(auVar22,auVar231);
      auVar278 = vcvtdq2ps_avx(auVar278);
      local_2840 = auVar278._0_4_;
      fStack_283c = auVar278._4_4_;
      fStack_2838 = auVar278._8_4_;
      fStack_2834 = auVar278._12_4_;
      fStack_2830 = auVar278._16_4_;
      fStack_282c = auVar278._20_4_;
      fStack_2828 = auVar278._24_4_;
      fStack_2824 = auVar278._28_4_;
      local_2980._4_4_ = fStack_283c + 1.0;
      local_2980._0_4_ = local_2840 + 1.0;
      fStack_2978 = fStack_2838 + 1.0;
      fStack_2974 = fStack_2834 + 1.0;
      uStack_2970._0_4_ = fStack_2830 + 1.0;
      uStack_2970._4_4_ = fStack_282c + 1.0;
      uStack_2968._0_4_ = fStack_2828 + 1.0;
      uStack_2968._4_4_ = fStack_2824 + 1.0;
      auVar175 = _local_2980;
      auVar282._8_4_ = 0x3f3504f3;
      auVar282._0_8_ = 0x3f3504f33f3504f3;
      auVar282._12_4_ = 0x3f3504f3;
      auVar282._16_4_ = 0x3f3504f3;
      auVar282._20_4_ = 0x3f3504f3;
      auVar282._24_4_ = 0x3f3504f3;
      auVar282._28_4_ = 0x3f3504f3;
      auVar278 = vcmpps_avx(auVar21,auVar282,1);
      auVar22 = vpand_avx2(auVar21,auVar278);
      auVar176._8_8_ = 0x3f8000003f800000;
      auVar176._0_8_ = 0x3f8000003f800000;
      auVar176._16_8_ = 0x3f8000003f800000;
      auVar176._24_8_ = 0x3f8000003f800000;
      auVar21 = vsubps_avx(auVar21,auVar176);
      uStack_2968 = auVar175._24_8_;
      auVar178._8_8_ = 0x3f8000003f800000;
      auVar178._0_8_ = 0x3f8000003f800000;
      auVar178._16_8_ = 0x3f8000003f800000;
      auVar178._24_8_ = 0x3f8000003f800000;
      auVar278 = vpand_avx2(auVar178,auVar278);
      auVar175._16_8_ = uStack_2970;
      auVar175._0_16_ = _local_2980;
      auVar175._24_8_ = uStack_2968;
      auVar278 = vsubps_avx(auVar175,auVar278);
      local_2880 = auVar21._0_4_;
      fStack_287c = auVar21._4_4_;
      fStack_2878 = auVar21._8_4_;
      fStack_2874 = auVar21._12_4_;
      fStack_2870 = auVar21._16_4_;
      fStack_286c = auVar21._20_4_;
      fStack_2868 = auVar21._24_4_;
      fStack_2864 = auVar21._28_4_;
      local_28a0 = auVar22._0_4_;
      fStack_289c = auVar22._4_4_;
      fStack_2898 = auVar22._8_4_;
      fStack_2894 = auVar22._12_4_;
      fStack_2890 = auVar22._16_4_;
      fStack_288c = auVar22._20_4_;
      fStack_2888 = auVar22._24_4_;
      fStack_2884 = auVar22._28_4_;
      local_2900._0_4_ = local_2880 + local_28a0;
      local_2900._4_4_ = fStack_287c + fStack_289c;
      fStack_28f8 = fStack_2878 + fStack_2898;
      fStack_28f4 = fStack_2874 + fStack_2894;
      fStack_28f0 = fStack_2870 + fStack_2890;
      fStack_28ec = fStack_286c + fStack_288c;
      fStack_28e8 = fStack_2868 + fStack_2888;
      fStack_28e4 = fStack_2864 + fStack_2884;
      fStack_29f8 = 0.070376836;
      local_2a00 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_29f4 = 0.070376836;
      fStack_29f0 = 0.070376836;
      fStack_29ec = 0.070376836;
      fStack_29e8 = 0.070376836;
      uStack_29e4 = 0x3d9021bb;
      auVar208._8_4_ = -0.1151461;
      auVar208._12_4_ = -0.1151461;
      auVar208._0_4_ = -0.1151461;
      auVar208._4_4_ = -0.1151461;
      auVar208._16_4_ = -0.1151461;
      auVar208._20_4_ = -0.1151461;
      auVar208._24_4_ = -0.1151461;
      auVar208._28_4_ = -0.1151461;
      auVar19 = vfmadd213ps_fma(_local_2900,_local_2a00,auVar208);
      auVar209._8_4_ = 0.116769984;
      auVar209._12_4_ = 0.116769984;
      auVar209._0_4_ = 0.116769984;
      auVar209._4_4_ = 0.116769984;
      auVar209._16_4_ = 0.116769984;
      auVar209._20_4_ = 0.116769984;
      auVar209._24_4_ = 0.116769984;
      auVar209._28_4_ = 0.116769984;
      auVar19 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar19),auVar209);
      auVar210._8_4_ = -0.12420141;
      auVar210._12_4_ = -0.12420141;
      auVar210._0_4_ = -0.12420141;
      auVar210._4_4_ = -0.12420141;
      auVar210._16_4_ = -0.12420141;
      auVar210._20_4_ = -0.12420141;
      auVar210._24_4_ = -0.12420141;
      auVar210._28_4_ = -0.12420141;
      auVar19 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar19),auVar210);
      auVar211._8_4_ = 0.14249323;
      auVar211._12_4_ = 0.14249323;
      auVar211._0_4_ = 0.14249323;
      auVar211._4_4_ = 0.14249323;
      auVar211._16_4_ = 0.14249323;
      auVar211._20_4_ = 0.14249323;
      auVar211._24_4_ = 0.14249323;
      auVar211._28_4_ = 0.14249323;
      auVar19 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar19),auVar211);
      auVar212._8_4_ = -0.16668057;
      auVar212._12_4_ = -0.16668057;
      auVar212._0_4_ = -0.16668057;
      auVar212._4_4_ = -0.16668057;
      auVar212._16_4_ = -0.16668057;
      auVar212._20_4_ = -0.16668057;
      auVar212._24_4_ = -0.16668057;
      auVar212._28_4_ = -0.16668057;
      auVar19 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar19),auVar212);
      auVar213._8_4_ = 0.20000714;
      auVar213._12_4_ = 0.20000714;
      auVar213._0_4_ = 0.20000714;
      auVar213._4_4_ = 0.20000714;
      auVar213._16_4_ = 0.20000714;
      auVar213._20_4_ = 0.20000714;
      auVar213._24_4_ = 0.20000714;
      auVar213._28_4_ = 0.20000714;
      auVar19 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar19),auVar213);
      auVar214._8_4_ = -0.24999994;
      auVar214._12_4_ = -0.24999994;
      auVar214._0_4_ = -0.24999994;
      auVar214._4_4_ = -0.24999994;
      auVar214._16_4_ = -0.24999994;
      auVar214._20_4_ = -0.24999994;
      auVar214._24_4_ = -0.24999994;
      auVar214._28_4_ = -0.24999994;
      auVar19 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar19),auVar214);
      auVar215._8_4_ = 0.3333333;
      auVar215._12_4_ = 0.3333333;
      auVar215._0_4_ = 0.3333333;
      auVar215._4_4_ = 0.3333333;
      auVar215._16_4_ = 0.3333333;
      auVar215._20_4_ = 0.3333333;
      auVar215._24_4_ = 0.3333333;
      auVar215._28_4_ = 0.3333333;
      auVar19 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar19),auVar215);
      local_2740 = auVar19._0_4_;
      fStack_273c = auVar19._4_4_;
      fStack_2738 = auVar19._8_4_;
      fStack_2734 = auVar19._12_4_;
      local_2a00._4_4_ =
           fStack_273c * (float)local_2900._4_4_ * (float)local_2900._4_4_ * (float)local_2900._4_4_
      ;
      local_2a00._0_4_ =
           local_2740 * (float)local_2900._0_4_ * (float)local_2900._0_4_ * (float)local_2900._0_4_;
      fStack_29f8 = fStack_2738 * fStack_28f8 * fStack_28f8 * fStack_28f8;
      fStack_29f4 = fStack_2734 * fStack_28f4 * fStack_28f4 * fStack_28f4;
      fStack_29f0 = fStack_28f0 * 0.0 * fStack_28f0 * fStack_28f0;
      fStack_29ec = fStack_28ec * 0.0 * fStack_28ec * fStack_28ec;
      fStack_29e8 = fStack_28e8 * 0.0 * fStack_28e8 * fStack_28e8;
      uStack_29e4 = 0;
      auVar216._8_4_ = -0.00021219444;
      auVar216._12_4_ = -0.00021219444;
      auVar216._0_4_ = -0.00021219444;
      auVar216._4_4_ = -0.00021219444;
      auVar216._16_4_ = -0.00021219444;
      auVar216._20_4_ = -0.00021219444;
      auVar216._24_4_ = -0.00021219444;
      auVar216._28_4_ = -0.00021219444;
      auVar19 = vfmadd213ps_fma(auVar216,auVar278,_local_2a00);
      auVar263._4_4_ = (float)local_2900._4_4_ * (float)local_2900._4_4_;
      auVar263._0_4_ = (float)local_2900._0_4_ * (float)local_2900._0_4_;
      auVar263._8_4_ = fStack_28f8 * fStack_28f8;
      auVar263._12_4_ = fStack_28f4 * fStack_28f4;
      auVar263._16_4_ = fStack_28f0 * fStack_28f0;
      auVar263._20_4_ = fStack_28ec * fStack_28ec;
      auVar263._24_4_ = fStack_28e8 * fStack_28e8;
      auVar263._28_4_ = fStack_28e4;
      auVar223._8_4_ = 0.5;
      auVar223._12_4_ = 0.5;
      auVar223._0_4_ = 0.5;
      auVar223._4_4_ = 0.5;
      auVar223._16_4_ = 0.5;
      auVar223._20_4_ = 0.5;
      auVar223._24_4_ = 0.5;
      auVar223._28_4_ = 0.5;
      auVar19 = vfnmadd213ps_fma(auVar223,auVar263,ZEXT1632(auVar19));
      local_28e0 = auVar19._0_4_;
      fStack_28dc = auVar19._4_4_;
      fStack_28d8 = auVar19._8_4_;
      fStack_28d4 = auVar19._12_4_;
      local_2900._4_4_ = (float)local_2900._4_4_ + fStack_28dc;
      local_2900._0_4_ = (float)local_2900._0_4_ + local_28e0;
      fStack_28f8 = fStack_28f8 + fStack_28d8;
      fStack_28f4 = fStack_28f4 + fStack_28d4;
      fStack_28f0 = fStack_28f0 + 0.0;
      fStack_28ec = fStack_28ec + 0.0;
      fStack_28e8 = fStack_28e8 + 0.0;
      fStack_28e4 = fStack_28e4 + 0.0;
      auVar217._8_4_ = 0.6933594;
      auVar217._12_4_ = 0.6933594;
      auVar217._0_4_ = 0.6933594;
      auVar217._4_4_ = 0.6933594;
      auVar217._16_4_ = 0.6933594;
      auVar217._20_4_ = 0.6933594;
      auVar217._24_4_ = 0.6933594;
      auVar217._28_4_ = 0.6933594;
      auVar19 = vfmadd213ps_fma(auVar217,auVar278,_local_2900);
      auVar16 = vpor_avx2(ZEXT1632(auVar19),auVar16);
      local_3300 = auVar17._0_4_;
      fStack_32fc = auVar17._4_4_;
      fStack_32f8 = auVar17._8_4_;
      fStack_32f4 = auVar17._12_4_;
      fStack_32f0 = auVar18._0_4_;
      fStack_32ec = auVar18._4_4_;
      fStack_32e8 = auVar18._8_4_;
      uStack_32e4 = auVar18._12_4_;
      local_3320 = auVar16._0_4_;
      fStack_331c = auVar16._4_4_;
      fStack_3318 = auVar16._8_4_;
      fStack_3314 = auVar16._12_4_;
      fStack_3310 = auVar16._16_4_;
      fStack_330c = auVar16._20_4_;
      fStack_3308 = auVar16._24_4_;
      local_2f00._4_4_ = fStack_32fc * fStack_331c;
      local_2f00._0_4_ = local_3300 * local_3320;
      fStack_2ef8 = fStack_32f8 * fStack_3318;
      fStack_2ef4 = fStack_32f4 * fStack_3314;
      uStack_2ef0._0_4_ = fStack_32f0 * fStack_3310;
      uStack_2ef0._4_4_ = fStack_32ec * fStack_330c;
      uStack_2ee8._0_4_ = fStack_32e8 * fStack_3308;
      uStack_2ee8._4_4_ = uStack_32e4;
      auVar16 = _local_2f00;
      uStack_2ee8 = auVar16._24_8_;
      auVar22._16_8_ = uStack_2ef0;
      auVar22._0_16_ = _local_2f00;
      auVar22._24_8_ = uStack_2ee8;
      auVar21._8_4_ = 0x42b0c0a5;
      auVar21._0_8_ = 0x42b0c0a542b0c0a5;
      auVar21._12_4_ = 0x42b0c0a5;
      auVar21._16_4_ = 0x42b0c0a5;
      auVar21._20_4_ = 0x42b0c0a5;
      auVar21._24_4_ = 0x42b0c0a5;
      auVar21._28_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar22,auVar21);
      auVar278._8_4_ = 0xc2b0c0a5;
      auVar278._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar278._12_4_ = 0xc2b0c0a5;
      auVar278._16_4_ = 0xc2b0c0a5;
      auVar278._20_4_ = 0xc2b0c0a5;
      auVar278._24_4_ = 0xc2b0c0a5;
      auVar278._28_4_ = 0xc2b0c0a5;
      auVar278 = vmaxps_avx(auVar16,auVar278);
      auVar192._8_4_ = 1.442695;
      auVar192._12_4_ = 1.442695;
      auVar192._0_4_ = 1.442695;
      auVar192._4_4_ = 1.442695;
      auVar192._16_4_ = 1.442695;
      auVar192._20_4_ = 1.442695;
      auVar192._24_4_ = 1.442695;
      auVar192._28_4_ = 1.442695;
      auVar191._8_4_ = 0.5;
      auVar191._12_4_ = 0.5;
      auVar191._0_4_ = 0.5;
      auVar191._4_4_ = 0.5;
      auVar191._16_4_ = 0.5;
      auVar191._20_4_ = 0.5;
      auVar191._24_4_ = 0.5;
      auVar191._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar192,auVar278,auVar191);
      auVar21 = vroundps_avx(ZEXT1632(auVar17),1);
      auVar16 = vcmpps_avx(ZEXT1632(auVar17),auVar21,1);
      auVar182._8_8_ = 0x3f8000003f800000;
      auVar182._0_8_ = 0x3f8000003f800000;
      auVar182._16_8_ = 0x3f8000003f800000;
      auVar182._24_8_ = 0x3f8000003f800000;
      auVar16 = vpand_avx2(auVar16,auVar182);
      auVar16 = vsubps_avx(auVar21,auVar16);
      auVar220._8_4_ = 0.6933594;
      auVar220._12_4_ = 0.6933594;
      auVar220._0_4_ = 0.6933594;
      auVar220._4_4_ = 0.6933594;
      auVar220._16_4_ = 0.6933594;
      auVar220._20_4_ = 0.6933594;
      auVar220._24_4_ = 0.6933594;
      auVar220._28_4_ = 0.6933594;
      auVar17 = vfnmadd213ps_fma(auVar220,auVar16,auVar278);
      auVar221._8_4_ = -0.00021219444;
      auVar221._12_4_ = -0.00021219444;
      auVar221._0_4_ = -0.00021219444;
      auVar221._4_4_ = -0.00021219444;
      auVar221._16_4_ = -0.00021219444;
      auVar221._20_4_ = -0.00021219444;
      auVar221._24_4_ = -0.00021219444;
      auVar221._28_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar221,auVar16,ZEXT1632(auVar17));
      auVar278 = ZEXT1632(auVar17);
      local_2e00 = auVar17._0_4_;
      fStack_2dfc = auVar17._4_4_;
      fStack_2df8 = auVar17._8_4_;
      fStack_2df4 = auVar17._12_4_;
      _local_2f20 = ZEXT1632(CONCAT412(fStack_2df4 * fStack_2df4,
                                       CONCAT48(fStack_2df8 * fStack_2df8,
                                                CONCAT44(fStack_2dfc * fStack_2dfc,
                                                         local_2e00 * local_2e00))));
      uStack_2fb8._0_4_ = 0x39506967;
      local_2fc0 = (undefined1  [8])0x3950696739506967;
      uStack_2fb8._4_4_ = 0x39506967;
      uStack_2fb0._0_4_ = 0x39506967;
      uStack_2fb0._4_4_ = 0x39506967;
      uStack_2fa8._0_4_ = 0x39506967;
      uStack_2fa8._4_4_ = 0x39506967;
      auVar193._8_4_ = 0.0013981999;
      auVar193._12_4_ = 0.0013981999;
      auVar193._0_4_ = 0.0013981999;
      auVar193._4_4_ = 0.0013981999;
      auVar193._16_4_ = 0.0013981999;
      auVar193._20_4_ = 0.0013981999;
      auVar193._24_4_ = 0.0013981999;
      auVar193._28_4_ = 0.0013981999;
      auVar17 = vfmadd213ps_fma(auVar278,_local_2fc0,auVar193);
      auVar194._8_4_ = 0.008333452;
      auVar194._12_4_ = 0.008333452;
      auVar194._0_4_ = 0.008333452;
      auVar194._4_4_ = 0.008333452;
      auVar194._16_4_ = 0.008333452;
      auVar194._20_4_ = 0.008333452;
      auVar194._24_4_ = 0.008333452;
      auVar194._28_4_ = 0.008333452;
      auVar17 = vfmadd213ps_fma(auVar278,ZEXT1632(auVar17),auVar194);
      auVar195._8_4_ = 0.041665796;
      auVar195._12_4_ = 0.041665796;
      auVar195._0_4_ = 0.041665796;
      auVar195._4_4_ = 0.041665796;
      auVar195._16_4_ = 0.041665796;
      auVar195._20_4_ = 0.041665796;
      auVar195._24_4_ = 0.041665796;
      auVar195._28_4_ = 0.041665796;
      auVar17 = vfmadd213ps_fma(auVar278,ZEXT1632(auVar17),auVar195);
      auVar196._8_4_ = 0.16666666;
      auVar196._12_4_ = 0.16666666;
      auVar196._0_4_ = 0.16666666;
      auVar196._4_4_ = 0.16666666;
      auVar196._16_4_ = 0.16666666;
      auVar196._20_4_ = 0.16666666;
      auVar196._24_4_ = 0.16666666;
      auVar196._28_4_ = 0.16666666;
      auVar17 = vfmadd213ps_fma(auVar278,ZEXT1632(auVar17),auVar196);
      auVar197._8_4_ = 0.5;
      auVar197._12_4_ = 0.5;
      auVar197._0_4_ = 0.5;
      auVar197._4_4_ = 0.5;
      auVar197._16_4_ = 0.5;
      auVar197._20_4_ = 0.5;
      auVar197._24_4_ = 0.5;
      auVar197._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar278,ZEXT1632(auVar17),auVar197);
      auVar17 = vfmadd213ps_fma(_local_2f20,ZEXT1632(auVar17),auVar278);
      local_2ec0 = auVar17._0_4_;
      fStack_2ebc = auVar17._4_4_;
      fStack_2eb8 = auVar17._8_4_;
      fStack_2eb4 = auVar17._12_4_;
      local_2040 = auVar16._0_4_;
      fStack_203c = auVar16._4_4_;
      fStack_2038 = auVar16._8_4_;
      fStack_2034 = auVar16._12_4_;
      fStack_2030 = auVar16._16_4_;
      fStack_202c = auVar16._20_4_;
      fStack_2028 = auVar16._24_4_;
      fStack_2024 = auVar16._28_4_;
      local_2f60._4_4_ = (int)fStack_203c;
      local_2f60._0_4_ = (int)local_2040;
      local_2f60._8_4_ = (int)fStack_2038;
      local_2f60._12_4_ = (int)fStack_2034;
      uStack_2f50._0_4_ = (int)fStack_2030;
      uStack_2f50._4_4_ = (int)fStack_202c;
      uStack_2f48._0_4_ = (int)fStack_2028;
      uStack_2f48._4_4_ = (int)fStack_2024;
      auVar16 = _local_2f60;
      uStack_2f48 = auVar16._24_8_;
      auVar227._16_8_ = uStack_2f50;
      auVar227._0_16_ = local_2f60;
      auVar227._24_8_ = uStack_2f48;
      auVar226._8_8_ = 0x7f0000007f;
      auVar226._0_8_ = 0x7f0000007f;
      auVar226._16_8_ = 0x7f0000007f;
      auVar226._24_8_ = 0x7f0000007f;
      auVar16 = vpaddd_avx2(auVar227,auVar226);
      auVar16 = vpslld_avx2(auVar16,ZEXT416(0x17));
      local_2e60 = auVar16._0_4_;
      fStack_2e5c = auVar16._4_4_;
      fStack_2e58 = auVar16._8_4_;
      fStack_2e54 = auVar16._12_4_;
      fStack_2e50 = auVar16._16_4_;
      fStack_2e4c = auVar16._20_4_;
      fStack_2e48 = auVar16._24_4_;
      local_2fc0._4_4_ = (fStack_2ebc + 1.0) * fStack_2e5c;
      local_2fc0._0_4_ = (local_2ec0 + 1.0) * local_2e60;
      uStack_2fb8._0_4_ = (fStack_2eb8 + 1.0) * fStack_2e58;
      uStack_2fb8._4_4_ = (fStack_2eb4 + 1.0) * fStack_2e54;
      uStack_2fb0._0_4_ = fStack_2e50 * 1.0;
      uStack_2fb0._4_4_ = fStack_2e4c * 1.0;
      auVar271 = _local_2fc0;
      uStack_2fa8._0_4_ = fStack_2e48 * 1.0;
      uStack_2fa8._4_4_ = 0x3f800000;
      auVar16 = _local_2fc0;
      uStack_2fb0 = auVar271._16_8_;
      uStack_2fa8 = auVar16._24_8_;
      *local_a570 = local_2fc0;
      local_a570[1] = uStack_2fb8;
      local_a570[2] = uStack_2fb0;
      local_a570[3] = uStack_2fa8;
      local_a560 = (undefined1 (*) [64])(*local_a560 + 0x20);
      local_a568 = local_a568 + 1;
      local_a570 = local_a570 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_a7e4 = 0; local_a7e4 + 3 < in_ECX; local_a7e4 = local_a7e4 + 4) {
      fVar277 = *local_a568;
      fVar279 = local_a568[1];
      fVar280 = local_a568[2];
      auVar26._4_4_ = fVar280;
      auVar26._0_4_ = fVar280;
      auVar26._12_4_ = fVar280;
      auVar26._8_4_ = fVar280;
      fVar280 = local_a568[3];
      auVar26._20_4_ = fVar280;
      auVar26._16_4_ = fVar280;
      auVar26._28_4_ = fVar280;
      auVar26._24_4_ = fVar280;
      auVar276 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(CONCAT44(fVar279,fVar279),
                                               CONCAT816(CONCAT44(fVar279,fVar279),
                                                         CONCAT88(CONCAT44(fVar277,fVar277),
                                                                  CONCAT44(fVar277,fVar277))))),
                            auVar26,1);
      uVar23 = vcmpps_avx512f(*local_a560,ZEXT1664(ZEXT816(0)),2);
      auVar39._8_4_ = 0x800000;
      auVar39._12_4_ = 0x800000;
      auVar39._0_4_ = 0x800000;
      auVar39._4_4_ = 0x800000;
      auVar39._16_4_ = 0x800000;
      auVar39._20_4_ = 0x800000;
      auVar39._24_4_ = 0x800000;
      auVar39._28_4_ = 0x800000;
      auVar39._32_4_ = 0x800000;
      auVar39._36_4_ = 0x800000;
      auVar39._40_4_ = 0x800000;
      auVar39._44_4_ = 0x800000;
      auVar39._48_4_ = 0x800000;
      auVar39._52_4_ = 0x800000;
      auVar39._56_4_ = 0x800000;
      auVar39._60_4_ = 0x800000;
      auVar273 = vmaxps_avx512f(*local_a560,auVar39);
      auVar274 = vmovdqa64_avx512f(auVar273);
      auVar274 = vpsrld_avx512f(auVar274,ZEXT416(0x17));
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar165._8_4_ = -0x7f800001;
      auVar165._12_4_ = -0x7f800001;
      auVar165._0_4_ = -0x7f800001;
      auVar165._4_4_ = -0x7f800001;
      auVar165._16_4_ = -0x7f800001;
      auVar165._20_4_ = -0x7f800001;
      auVar165._24_4_ = -0x7f800001;
      auVar165._28_4_ = -0x7f800001;
      auVar165._32_4_ = -0x7f800001;
      auVar165._36_4_ = -0x7f800001;
      auVar165._40_4_ = -0x7f800001;
      auVar165._44_4_ = -0x7f800001;
      auVar165._48_4_ = -0x7f800001;
      auVar165._52_4_ = -0x7f800001;
      auVar165._56_4_ = -0x7f800001;
      auVar165._60_4_ = -0x7f800001;
      auVar275 = vmovdqa64_avx512f(auVar165);
      auVar273 = vpandd_avx512f(auVar273,auVar275);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar168._8_4_ = 0.5;
      auVar168._12_4_ = 0.5;
      auVar168._0_4_ = 0.5;
      auVar168._4_4_ = 0.5;
      auVar168._16_4_ = 0.5;
      auVar168._20_4_ = 0.5;
      auVar168._24_4_ = 0.5;
      auVar168._28_4_ = 0.5;
      auVar168._32_4_ = 0.5;
      auVar168._36_4_ = 0.5;
      auVar168._40_4_ = 0.5;
      auVar168._44_4_ = 0.5;
      auVar168._48_4_ = 0.5;
      auVar168._52_4_ = 0.5;
      auVar168._56_4_ = 0.5;
      auVar168._60_4_ = 0.5;
      auVar275 = vmovdqa64_avx512f(auVar168);
      auVar273 = vpord_avx512f(auVar273,auVar275);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar275 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar275 = vmovdqa64_avx512f(auVar275);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar275 = vmovdqa64_avx512f(auVar275);
      auVar274 = vpsubd_avx512f(auVar274,auVar275);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vcvtdq2ps_avx512f(auVar274);
      auVar34._8_4_ = 1.0;
      auVar34._12_4_ = 1.0;
      auVar34._0_4_ = 1.0;
      auVar34._4_4_ = 1.0;
      auVar34._16_4_ = 1.0;
      auVar34._20_4_ = 1.0;
      auVar34._24_4_ = 1.0;
      auVar34._28_4_ = 1.0;
      auVar34._32_4_ = 1.0;
      auVar34._36_4_ = 1.0;
      auVar34._40_4_ = 1.0;
      auVar34._44_4_ = 1.0;
      auVar34._48_4_ = 1.0;
      auVar34._52_4_ = 1.0;
      auVar34._56_4_ = 1.0;
      auVar34._60_4_ = 1.0;
      auVar274 = vaddps_avx512f(auVar274,auVar34);
      uVar24 = vcmpps_avx512f(auVar273,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar25 = (ushort)uVar24;
      auVar35._8_4_ = 1.0;
      auVar35._12_4_ = 1.0;
      auVar35._0_4_ = 1.0;
      auVar35._4_4_ = 1.0;
      auVar35._16_4_ = 1.0;
      auVar35._20_4_ = 1.0;
      auVar35._24_4_ = 1.0;
      auVar35._28_4_ = 1.0;
      auVar35._32_4_ = 1.0;
      auVar35._36_4_ = 1.0;
      auVar35._40_4_ = 1.0;
      auVar35._44_4_ = 1.0;
      auVar35._48_4_ = 1.0;
      auVar35._52_4_ = 1.0;
      auVar35._56_4_ = 1.0;
      auVar35._60_4_ = 1.0;
      auVar275 = vsubps_avx512f(auVar273,auVar35);
      auVar141._8_4_ = 1.0;
      auVar141._12_4_ = 1.0;
      auVar141._0_4_ = 1.0;
      auVar141._4_4_ = 1.0;
      auVar141._16_4_ = 1.0;
      auVar141._20_4_ = 1.0;
      auVar141._24_4_ = 1.0;
      auVar141._28_4_ = 1.0;
      auVar141._32_4_ = 1.0;
      auVar141._36_4_ = 1.0;
      auVar141._40_4_ = 1.0;
      auVar141._44_4_ = 1.0;
      auVar141._48_4_ = 1.0;
      auVar141._52_4_ = 1.0;
      auVar141._56_4_ = 1.0;
      auVar141._60_4_ = 1.0;
      local_5300 = auVar274._0_4_;
      iStack_52fc = auVar274._4_4_;
      iStack_52f8 = auVar274._8_4_;
      iStack_52f4 = auVar274._12_4_;
      iStack_52f0 = auVar274._16_4_;
      iStack_52ec = auVar274._20_4_;
      iStack_52e8 = auVar274._24_4_;
      iStack_52e4 = auVar274._28_4_;
      iStack_52e0 = auVar274._32_4_;
      iStack_52dc = auVar274._36_4_;
      iStack_52d8 = auVar274._40_4_;
      iStack_52d4 = auVar274._44_4_;
      iStack_52d0 = auVar274._48_4_;
      iStack_52cc = auVar274._52_4_;
      iStack_52c8 = auVar274._56_4_;
      iStack_52c4 = auVar274._60_4_;
      auVar274 = vsubps_avx512f(auVar274,auVar141);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar24 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8ec0._4_4_ = (uint)bVar2 * auVar274._4_4_ | (uint)!bVar2 * iStack_52fc;
      local_8ec0._0_4_ = (uint)bVar1 * auVar274._0_4_ | (uint)!bVar1 * local_5300;
      local_8ec0._8_4_ = (uint)bVar3 * auVar274._8_4_ | (uint)!bVar3 * iStack_52f8;
      local_8ec0._12_4_ = (uint)bVar4 * auVar274._12_4_ | (uint)!bVar4 * iStack_52f4;
      uStack_8eb0._0_4_ = (uint)bVar5 * auVar274._16_4_ | (uint)!bVar5 * iStack_52f0;
      uStack_8eb0._4_4_ = (uint)bVar6 * auVar274._20_4_ | (uint)!bVar6 * iStack_52ec;
      uStack_8ea8._0_4_ = (uint)bVar7 * auVar274._24_4_ | (uint)!bVar7 * iStack_52e8;
      uStack_8ea8._4_4_ = (uint)bVar8 * auVar274._28_4_ | (uint)!bVar8 * iStack_52e4;
      auVar16 = _local_8ec0;
      uStack_8ea0._0_4_ =
           (uint)(bVar9 & 1) * auVar274._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_52e0;
      uStack_8ea0._4_4_ = (uint)bVar10 * auVar274._36_4_ | (uint)!bVar10 * iStack_52dc;
      auVar265 = _local_8ec0;
      uStack_8e98._0_4_ = (uint)bVar11 * auVar274._40_4_ | (uint)!bVar11 * iStack_52d8;
      uStack_8e98._4_4_ = (uint)bVar12 * auVar274._44_4_ | (uint)!bVar12 * iStack_52d4;
      auVar266 = _local_8ec0;
      uStack_8e90._0_4_ = (uint)bVar13 * auVar274._48_4_ | (uint)!bVar13 * iStack_52d0;
      uStack_8e90._4_4_ = (uint)bVar14 * auVar274._52_4_ | (uint)!bVar14 * iStack_52cc;
      auVar267 = _local_8ec0;
      uStack_8e88._0_4_ = (uint)bVar15 * auVar274._56_4_ | (uint)!bVar15 * iStack_52c8;
      uStack_8e88._4_4_ =
           (uint)(bVar9 >> 7) * auVar274._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_52c4;
      auVar274 = _local_8ec0;
      local_3440 = auVar275._0_4_;
      iStack_343c = auVar275._4_4_;
      iStack_3438 = auVar275._8_4_;
      iStack_3434 = auVar275._12_4_;
      iStack_3430 = auVar275._16_4_;
      iStack_342c = auVar275._20_4_;
      iStack_3428 = auVar275._24_4_;
      iStack_3424 = auVar275._28_4_;
      iStack_3420 = auVar275._32_4_;
      iStack_341c = auVar275._36_4_;
      iStack_3418 = auVar275._40_4_;
      iStack_3414 = auVar275._44_4_;
      iStack_3410 = auVar275._48_4_;
      iStack_340c = auVar275._52_4_;
      iStack_3408 = auVar275._56_4_;
      iStack_3404 = auVar275._60_4_;
      auVar273 = vaddps_avx512f(auVar275,auVar273);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8dc0._4_4_ = (uint)bVar2 * auVar273._4_4_ | (uint)!bVar2 * iStack_343c;
      local_8dc0._0_4_ = (uint)bVar1 * auVar273._0_4_ | (uint)!bVar1 * local_3440;
      local_8dc0._8_4_ = (uint)bVar3 * auVar273._8_4_ | (uint)!bVar3 * iStack_3438;
      local_8dc0._12_4_ = (uint)bVar4 * auVar273._12_4_ | (uint)!bVar4 * iStack_3434;
      uStack_8db0._0_4_ = (uint)bVar5 * auVar273._16_4_ | (uint)!bVar5 * iStack_3430;
      uStack_8db0._4_4_ = (uint)bVar6 * auVar273._20_4_ | (uint)!bVar6 * iStack_342c;
      uStack_8da8._0_4_ = (uint)bVar7 * auVar273._24_4_ | (uint)!bVar7 * iStack_3428;
      uStack_8da8._4_4_ = (uint)bVar8 * auVar273._28_4_ | (uint)!bVar8 * iStack_3424;
      auVar278 = _local_8dc0;
      uStack_8da0._0_4_ =
           (uint)(bVar9 & 1) * auVar273._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_3420;
      uStack_8da0._4_4_ = (uint)bVar10 * auVar273._36_4_ | (uint)!bVar10 * iStack_341c;
      auVar268 = _local_8dc0;
      uStack_8d98._0_4_ = (uint)bVar11 * auVar273._40_4_ | (uint)!bVar11 * iStack_3418;
      uStack_8d98._4_4_ = (uint)bVar12 * auVar273._44_4_ | (uint)!bVar12 * iStack_3414;
      auVar269 = _local_8dc0;
      uStack_8d90._0_4_ = (uint)bVar13 * auVar273._48_4_ | (uint)!bVar13 * iStack_3410;
      uStack_8d90._4_4_ = (uint)bVar14 * auVar273._52_4_ | (uint)!bVar14 * iStack_340c;
      auVar270 = _local_8dc0;
      uStack_8d88._0_4_ = (uint)bVar15 * auVar273._56_4_ | (uint)!bVar15 * iStack_3408;
      uStack_8d88._4_4_ =
           (uint)(bVar9 >> 7) * auVar273._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_3404;
      auVar273 = _local_8dc0;
      uStack_8da8 = auVar278._24_8_;
      uStack_8da0 = auVar268._32_8_;
      uStack_8d98 = auVar269._40_8_;
      uStack_8d90 = auVar270._48_8_;
      uStack_8d88 = auVar273._56_8_;
      auVar38._16_8_ = uStack_8db0;
      auVar38._0_16_ = local_8dc0;
      auVar38._24_8_ = uStack_8da8;
      auVar38._32_8_ = uStack_8da0;
      auVar38._40_8_ = uStack_8d98;
      auVar38._48_8_ = uStack_8d90;
      auVar38._56_8_ = uStack_8d88;
      auVar37._16_8_ = uStack_8db0;
      auVar37._0_16_ = local_8dc0;
      auVar37._24_8_ = uStack_8da8;
      auVar37._32_8_ = uStack_8da0;
      auVar37._40_8_ = uStack_8d98;
      auVar37._48_8_ = uStack_8d90;
      auVar37._56_8_ = uStack_8d88;
      auVar273 = vmulps_avx512f(auVar38,auVar37);
      local_8fc0._8_4_ = 0.070376836;
      local_8fc0._12_4_ = 0.070376836;
      local_8fc0._0_4_ = 0.070376836;
      local_8fc0._4_4_ = 0.070376836;
      auVar115._16_4_ = 0.070376836;
      auVar115._20_4_ = 0.070376836;
      auVar115._0_16_ = local_8fc0._0_16_;
      auVar115._24_4_ = 0.070376836;
      auVar115._28_4_ = 0.070376836;
      auVar115._32_4_ = 0.070376836;
      auVar115._36_4_ = 0.070376836;
      auVar115._40_4_ = 0.070376836;
      auVar115._44_4_ = 0.070376836;
      auVar115._48_4_ = 0.070376836;
      auVar115._52_4_ = 0.070376836;
      auVar115._56_4_ = 0.070376836;
      auVar115._60_4_ = 0.070376836;
      auVar114._16_8_ = uStack_8db0;
      auVar114._0_16_ = local_8dc0;
      auVar114._24_8_ = uStack_8da8;
      auVar114._32_8_ = uStack_8da0;
      auVar114._40_8_ = uStack_8d98;
      auVar114._48_8_ = uStack_8d90;
      auVar114._56_8_ = uStack_8d88;
      auVar113._8_4_ = -0.1151461;
      auVar113._12_4_ = -0.1151461;
      auVar113._0_4_ = -0.1151461;
      auVar113._4_4_ = -0.1151461;
      auVar113._16_4_ = -0.1151461;
      auVar113._20_4_ = -0.1151461;
      auVar113._24_4_ = -0.1151461;
      auVar113._28_4_ = -0.1151461;
      auVar113._32_4_ = -0.1151461;
      auVar113._36_4_ = -0.1151461;
      auVar113._40_4_ = -0.1151461;
      auVar113._44_4_ = -0.1151461;
      auVar113._48_4_ = -0.1151461;
      auVar113._52_4_ = -0.1151461;
      auVar113._56_4_ = -0.1151461;
      auVar113._60_4_ = -0.1151461;
      auVar275 = vfmadd213ps_avx512f(auVar114,auVar115,auVar113);
      auVar112._16_8_ = uStack_8db0;
      auVar112._0_16_ = local_8dc0;
      auVar112._24_8_ = uStack_8da8;
      auVar112._32_8_ = uStack_8da0;
      auVar112._40_8_ = uStack_8d98;
      auVar112._48_8_ = uStack_8d90;
      auVar112._56_8_ = uStack_8d88;
      auVar111._8_4_ = 0.116769984;
      auVar111._12_4_ = 0.116769984;
      auVar111._0_4_ = 0.116769984;
      auVar111._4_4_ = 0.116769984;
      auVar111._16_4_ = 0.116769984;
      auVar111._20_4_ = 0.116769984;
      auVar111._24_4_ = 0.116769984;
      auVar111._28_4_ = 0.116769984;
      auVar111._32_4_ = 0.116769984;
      auVar111._36_4_ = 0.116769984;
      auVar111._40_4_ = 0.116769984;
      auVar111._44_4_ = 0.116769984;
      auVar111._48_4_ = 0.116769984;
      auVar111._52_4_ = 0.116769984;
      auVar111._56_4_ = 0.116769984;
      auVar111._60_4_ = 0.116769984;
      auVar275 = vfmadd213ps_avx512f(auVar112,auVar275,auVar111);
      auVar110._16_8_ = uStack_8db0;
      auVar110._0_16_ = local_8dc0;
      auVar110._24_8_ = uStack_8da8;
      auVar110._32_8_ = uStack_8da0;
      auVar110._40_8_ = uStack_8d98;
      auVar110._48_8_ = uStack_8d90;
      auVar110._56_8_ = uStack_8d88;
      auVar109._8_4_ = -0.12420141;
      auVar109._12_4_ = -0.12420141;
      auVar109._0_4_ = -0.12420141;
      auVar109._4_4_ = -0.12420141;
      auVar109._16_4_ = -0.12420141;
      auVar109._20_4_ = -0.12420141;
      auVar109._24_4_ = -0.12420141;
      auVar109._28_4_ = -0.12420141;
      auVar109._32_4_ = -0.12420141;
      auVar109._36_4_ = -0.12420141;
      auVar109._40_4_ = -0.12420141;
      auVar109._44_4_ = -0.12420141;
      auVar109._48_4_ = -0.12420141;
      auVar109._52_4_ = -0.12420141;
      auVar109._56_4_ = -0.12420141;
      auVar109._60_4_ = -0.12420141;
      auVar275 = vfmadd213ps_avx512f(auVar110,auVar275,auVar109);
      auVar108._16_8_ = uStack_8db0;
      auVar108._0_16_ = local_8dc0;
      auVar108._24_8_ = uStack_8da8;
      auVar108._32_8_ = uStack_8da0;
      auVar108._40_8_ = uStack_8d98;
      auVar108._48_8_ = uStack_8d90;
      auVar108._56_8_ = uStack_8d88;
      auVar107._8_4_ = 0.14249323;
      auVar107._12_4_ = 0.14249323;
      auVar107._0_4_ = 0.14249323;
      auVar107._4_4_ = 0.14249323;
      auVar107._16_4_ = 0.14249323;
      auVar107._20_4_ = 0.14249323;
      auVar107._24_4_ = 0.14249323;
      auVar107._28_4_ = 0.14249323;
      auVar107._32_4_ = 0.14249323;
      auVar107._36_4_ = 0.14249323;
      auVar107._40_4_ = 0.14249323;
      auVar107._44_4_ = 0.14249323;
      auVar107._48_4_ = 0.14249323;
      auVar107._52_4_ = 0.14249323;
      auVar107._56_4_ = 0.14249323;
      auVar107._60_4_ = 0.14249323;
      auVar275 = vfmadd213ps_avx512f(auVar108,auVar275,auVar107);
      auVar106._16_8_ = uStack_8db0;
      auVar106._0_16_ = local_8dc0;
      auVar106._24_8_ = uStack_8da8;
      auVar106._32_8_ = uStack_8da0;
      auVar106._40_8_ = uStack_8d98;
      auVar106._48_8_ = uStack_8d90;
      auVar106._56_8_ = uStack_8d88;
      auVar105._8_4_ = -0.16668057;
      auVar105._12_4_ = -0.16668057;
      auVar105._0_4_ = -0.16668057;
      auVar105._4_4_ = -0.16668057;
      auVar105._16_4_ = -0.16668057;
      auVar105._20_4_ = -0.16668057;
      auVar105._24_4_ = -0.16668057;
      auVar105._28_4_ = -0.16668057;
      auVar105._32_4_ = -0.16668057;
      auVar105._36_4_ = -0.16668057;
      auVar105._40_4_ = -0.16668057;
      auVar105._44_4_ = -0.16668057;
      auVar105._48_4_ = -0.16668057;
      auVar105._52_4_ = -0.16668057;
      auVar105._56_4_ = -0.16668057;
      auVar105._60_4_ = -0.16668057;
      auVar275 = vfmadd213ps_avx512f(auVar106,auVar275,auVar105);
      auVar104._16_8_ = uStack_8db0;
      auVar104._0_16_ = local_8dc0;
      auVar104._24_8_ = uStack_8da8;
      auVar104._32_8_ = uStack_8da0;
      auVar104._40_8_ = uStack_8d98;
      auVar104._48_8_ = uStack_8d90;
      auVar104._56_8_ = uStack_8d88;
      auVar103._8_4_ = 0.20000714;
      auVar103._12_4_ = 0.20000714;
      auVar103._0_4_ = 0.20000714;
      auVar103._4_4_ = 0.20000714;
      auVar103._16_4_ = 0.20000714;
      auVar103._20_4_ = 0.20000714;
      auVar103._24_4_ = 0.20000714;
      auVar103._28_4_ = 0.20000714;
      auVar103._32_4_ = 0.20000714;
      auVar103._36_4_ = 0.20000714;
      auVar103._40_4_ = 0.20000714;
      auVar103._44_4_ = 0.20000714;
      auVar103._48_4_ = 0.20000714;
      auVar103._52_4_ = 0.20000714;
      auVar103._56_4_ = 0.20000714;
      auVar103._60_4_ = 0.20000714;
      auVar275 = vfmadd213ps_avx512f(auVar104,auVar275,auVar103);
      auVar102._16_8_ = uStack_8db0;
      auVar102._0_16_ = local_8dc0;
      auVar102._24_8_ = uStack_8da8;
      auVar102._32_8_ = uStack_8da0;
      auVar102._40_8_ = uStack_8d98;
      auVar102._48_8_ = uStack_8d90;
      auVar102._56_8_ = uStack_8d88;
      auVar101._8_4_ = -0.24999994;
      auVar101._12_4_ = -0.24999994;
      auVar101._0_4_ = -0.24999994;
      auVar101._4_4_ = -0.24999994;
      auVar101._16_4_ = -0.24999994;
      auVar101._20_4_ = -0.24999994;
      auVar101._24_4_ = -0.24999994;
      auVar101._28_4_ = -0.24999994;
      auVar101._32_4_ = -0.24999994;
      auVar101._36_4_ = -0.24999994;
      auVar101._40_4_ = -0.24999994;
      auVar101._44_4_ = -0.24999994;
      auVar101._48_4_ = -0.24999994;
      auVar101._52_4_ = -0.24999994;
      auVar101._56_4_ = -0.24999994;
      auVar101._60_4_ = -0.24999994;
      auVar275 = vfmadd213ps_avx512f(auVar102,auVar275,auVar101);
      auVar100._16_8_ = uStack_8db0;
      auVar100._0_16_ = local_8dc0;
      auVar100._24_8_ = uStack_8da8;
      auVar100._32_8_ = uStack_8da0;
      auVar100._40_8_ = uStack_8d98;
      auVar100._48_8_ = uStack_8d90;
      auVar100._56_8_ = uStack_8d88;
      auVar99._8_4_ = 0.3333333;
      auVar99._12_4_ = 0.3333333;
      auVar99._0_4_ = 0.3333333;
      auVar99._4_4_ = 0.3333333;
      auVar99._16_4_ = 0.3333333;
      auVar99._20_4_ = 0.3333333;
      auVar99._24_4_ = 0.3333333;
      auVar99._28_4_ = 0.3333333;
      auVar99._32_4_ = 0.3333333;
      auVar99._36_4_ = 0.3333333;
      auVar99._40_4_ = 0.3333333;
      auVar99._44_4_ = 0.3333333;
      auVar99._48_4_ = 0.3333333;
      auVar99._52_4_ = 0.3333333;
      auVar99._56_4_ = 0.3333333;
      auVar99._60_4_ = 0.3333333;
      auVar275 = vfmadd213ps_avx512f(auVar100,auVar275,auVar99);
      auVar36._16_8_ = uStack_8db0;
      auVar36._0_16_ = local_8dc0;
      auVar36._24_8_ = uStack_8da8;
      auVar36._32_8_ = uStack_8da0;
      auVar36._40_8_ = uStack_8d98;
      auVar36._48_8_ = uStack_8d90;
      auVar36._56_8_ = uStack_8d88;
      auVar275 = vmulps_avx512f(auVar275,auVar36);
      auVar275 = vmulps_avx512f(auVar275,auVar273);
      uStack_8ea8 = auVar16._24_8_;
      uStack_8ea0 = auVar265._32_8_;
      uStack_8e98 = auVar266._40_8_;
      uStack_8e90 = auVar267._48_8_;
      uStack_8e88 = auVar274._56_8_;
      auVar98._16_8_ = uStack_8eb0;
      auVar98._0_16_ = local_8ec0;
      auVar98._24_8_ = uStack_8ea8;
      auVar98._32_8_ = uStack_8ea0;
      auVar98._40_8_ = uStack_8e98;
      auVar98._48_8_ = uStack_8e90;
      auVar98._56_8_ = uStack_8e88;
      auVar97._8_4_ = -0.00021219444;
      auVar97._12_4_ = -0.00021219444;
      auVar97._0_4_ = -0.00021219444;
      auVar97._4_4_ = -0.00021219444;
      auVar97._16_4_ = -0.00021219444;
      auVar97._20_4_ = -0.00021219444;
      auVar97._24_4_ = -0.00021219444;
      auVar97._28_4_ = -0.00021219444;
      auVar97._32_4_ = -0.00021219444;
      auVar97._36_4_ = -0.00021219444;
      auVar97._40_4_ = -0.00021219444;
      auVar97._44_4_ = -0.00021219444;
      auVar97._48_4_ = -0.00021219444;
      auVar97._52_4_ = -0.00021219444;
      auVar97._56_4_ = -0.00021219444;
      auVar97._60_4_ = -0.00021219444;
      auVar274 = vfmadd213ps_avx512f(auVar97,auVar98,auVar275);
      auVar147._8_4_ = 0.5;
      auVar147._12_4_ = 0.5;
      auVar147._0_4_ = 0.5;
      auVar147._4_4_ = 0.5;
      auVar147._16_4_ = 0.5;
      auVar147._20_4_ = 0.5;
      auVar147._24_4_ = 0.5;
      auVar147._28_4_ = 0.5;
      auVar147._32_4_ = 0.5;
      auVar147._36_4_ = 0.5;
      auVar147._40_4_ = 0.5;
      auVar147._44_4_ = 0.5;
      auVar147._48_4_ = 0.5;
      auVar147._52_4_ = 0.5;
      auVar147._56_4_ = 0.5;
      auVar147._60_4_ = 0.5;
      auVar274 = vfnmadd213ps_avx512f(auVar147,auVar273,auVar274);
      auVar33._16_8_ = uStack_8db0;
      auVar33._0_16_ = local_8dc0;
      auVar33._24_8_ = uStack_8da8;
      auVar33._32_8_ = uStack_8da0;
      auVar33._40_8_ = uStack_8d98;
      auVar33._48_8_ = uStack_8d90;
      auVar33._56_8_ = uStack_8d88;
      auVar274 = vaddps_avx512f(auVar33,auVar274);
      auVar96._16_8_ = uStack_8eb0;
      auVar96._0_16_ = local_8ec0;
      auVar96._24_8_ = uStack_8ea8;
      auVar96._32_8_ = uStack_8ea0;
      auVar96._40_8_ = uStack_8e98;
      auVar96._48_8_ = uStack_8e90;
      auVar96._56_8_ = uStack_8e88;
      auVar95._8_4_ = 0.6933594;
      auVar95._12_4_ = 0.6933594;
      auVar95._0_4_ = 0.6933594;
      auVar95._4_4_ = 0.6933594;
      auVar95._16_4_ = 0.6933594;
      auVar95._20_4_ = 0.6933594;
      auVar95._24_4_ = 0.6933594;
      auVar95._28_4_ = 0.6933594;
      auVar95._32_4_ = 0.6933594;
      auVar95._36_4_ = 0.6933594;
      auVar95._40_4_ = 0.6933594;
      auVar95._44_4_ = 0.6933594;
      auVar95._48_4_ = 0.6933594;
      auVar95._52_4_ = 0.6933594;
      auVar95._56_4_ = 0.6933594;
      auVar95._60_4_ = 0.6933594;
      auVar273 = vfmadd213ps_avx512f(auVar95,auVar96,auVar274);
      auVar274 = vpmovm2d_avx512dq(uVar23 & 0xffff);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vpord_avx512f(auVar273,auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmulps_avx512f(auVar276,auVar274);
      auVar29._8_4_ = 88.37626;
      auVar29._12_4_ = 88.37626;
      auVar29._0_4_ = 88.37626;
      auVar29._4_4_ = 88.37626;
      auVar29._16_4_ = 88.37626;
      auVar29._20_4_ = 88.37626;
      auVar29._24_4_ = 88.37626;
      auVar29._28_4_ = 88.37626;
      auVar29._32_4_ = 88.37626;
      auVar29._36_4_ = 88.37626;
      auVar29._40_4_ = 88.37626;
      auVar29._44_4_ = 88.37626;
      auVar29._48_4_ = 88.37626;
      auVar29._52_4_ = 88.37626;
      auVar29._56_4_ = 88.37626;
      auVar29._60_4_ = 88.37626;
      auVar274 = vminps_avx512f(auVar274,auVar29);
      auVar28._8_4_ = -88.37626;
      auVar28._12_4_ = -88.37626;
      auVar28._0_4_ = -88.37626;
      auVar28._4_4_ = -88.37626;
      auVar28._16_4_ = -88.37626;
      auVar28._20_4_ = -88.37626;
      auVar28._24_4_ = -88.37626;
      auVar28._28_4_ = -88.37626;
      auVar28._32_4_ = -88.37626;
      auVar28._36_4_ = -88.37626;
      auVar28._40_4_ = -88.37626;
      auVar28._44_4_ = -88.37626;
      auVar28._48_4_ = -88.37626;
      auVar28._52_4_ = -88.37626;
      auVar28._56_4_ = -88.37626;
      auVar28._60_4_ = -88.37626;
      auVar273 = vmaxps_avx512f(auVar274,auVar28);
      auVar138._8_4_ = 1.442695;
      auVar138._12_4_ = 1.442695;
      auVar138._0_4_ = 1.442695;
      auVar138._4_4_ = 1.442695;
      auVar138._16_4_ = 1.442695;
      auVar138._20_4_ = 1.442695;
      auVar138._24_4_ = 1.442695;
      auVar138._28_4_ = 1.442695;
      auVar138._32_4_ = 1.442695;
      auVar138._36_4_ = 1.442695;
      auVar138._40_4_ = 1.442695;
      auVar138._44_4_ = 1.442695;
      auVar138._48_4_ = 1.442695;
      auVar138._52_4_ = 1.442695;
      auVar138._56_4_ = 1.442695;
      auVar138._60_4_ = 1.442695;
      auVar137._8_4_ = 0.5;
      auVar137._12_4_ = 0.5;
      auVar137._0_4_ = 0.5;
      auVar137._4_4_ = 0.5;
      auVar137._16_4_ = 0.5;
      auVar137._20_4_ = 0.5;
      auVar137._24_4_ = 0.5;
      auVar137._28_4_ = 0.5;
      auVar137._32_4_ = 0.5;
      auVar137._36_4_ = 0.5;
      auVar137._40_4_ = 0.5;
      auVar137._44_4_ = 0.5;
      auVar137._48_4_ = 0.5;
      auVar137._52_4_ = 0.5;
      auVar137._56_4_ = 0.5;
      auVar137._60_4_ = 0.5;
      auVar274 = vfmadd213ps_avx512f(auVar138,auVar273,auVar137);
      auVar275 = vrndscaleps_avx512f(auVar274,1);
      uVar24 = vcmpps_avx512f(auVar274,auVar275,1);
      uVar25 = (ushort)uVar24;
      auVar144._8_4_ = 1.0;
      auVar144._12_4_ = 1.0;
      auVar144._0_4_ = 1.0;
      auVar144._4_4_ = 1.0;
      auVar144._16_4_ = 1.0;
      auVar144._20_4_ = 1.0;
      auVar144._24_4_ = 1.0;
      auVar144._28_4_ = 1.0;
      auVar144._32_4_ = 1.0;
      auVar144._36_4_ = 1.0;
      auVar144._40_4_ = 1.0;
      auVar144._44_4_ = 1.0;
      auVar144._48_4_ = 1.0;
      auVar144._52_4_ = 1.0;
      auVar144._56_4_ = 1.0;
      auVar144._60_4_ = 1.0;
      local_4e80 = auVar275._0_4_;
      iStack_4e7c = auVar275._4_4_;
      iStack_4e78 = auVar275._8_4_;
      iStack_4e74 = auVar275._12_4_;
      iStack_4e70 = auVar275._16_4_;
      iStack_4e6c = auVar275._20_4_;
      iStack_4e68 = auVar275._24_4_;
      iStack_4e64 = auVar275._28_4_;
      iStack_4e60 = auVar275._32_4_;
      iStack_4e5c = auVar275._36_4_;
      iStack_4e58 = auVar275._40_4_;
      iStack_4e54 = auVar275._44_4_;
      iStack_4e50 = auVar275._48_4_;
      iStack_4e4c = auVar275._52_4_;
      iStack_4e48 = auVar275._56_4_;
      iStack_4e44 = auVar275._60_4_;
      auVar274 = vsubps_avx512f(auVar275,auVar144);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar24 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_9c00._4_4_ = (uint)bVar2 * auVar274._4_4_ | (uint)!bVar2 * iStack_4e7c;
      local_9c00._0_4_ = (uint)bVar1 * auVar274._0_4_ | (uint)!bVar1 * local_4e80;
      local_9c00._8_4_ = (uint)bVar3 * auVar274._8_4_ | (uint)!bVar3 * iStack_4e78;
      local_9c00._12_4_ = (uint)bVar4 * auVar274._12_4_ | (uint)!bVar4 * iStack_4e74;
      uStack_9bf0._0_4_ = (uint)bVar5 * auVar274._16_4_ | (uint)!bVar5 * iStack_4e70;
      uStack_9bf0._4_4_ = (uint)bVar6 * auVar274._20_4_ | (uint)!bVar6 * iStack_4e6c;
      uStack_9be8._0_4_ = (uint)bVar7 * auVar274._24_4_ | (uint)!bVar7 * iStack_4e68;
      uStack_9be8._4_4_ = (uint)bVar8 * auVar274._28_4_ | (uint)!bVar8 * iStack_4e64;
      auVar16 = _local_9c00;
      uStack_9be0._0_4_ =
           (uint)(bVar9 & 1) * auVar274._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_4e60;
      uStack_9be0._4_4_ = (uint)bVar10 * auVar274._36_4_ | (uint)!bVar10 * iStack_4e5c;
      auVar265 = _local_9c00;
      uStack_9bd8._0_4_ = (uint)bVar11 * auVar274._40_4_ | (uint)!bVar11 * iStack_4e58;
      uStack_9bd8._4_4_ = (uint)bVar12 * auVar274._44_4_ | (uint)!bVar12 * iStack_4e54;
      auVar266 = _local_9c00;
      uStack_9bd0._0_4_ = (uint)bVar13 * auVar274._48_4_ | (uint)!bVar13 * iStack_4e50;
      uStack_9bd0._4_4_ = (uint)bVar14 * auVar274._52_4_ | (uint)!bVar14 * iStack_4e4c;
      auVar267 = _local_9c00;
      uStack_9bc8._0_4_ = (uint)bVar15 * auVar274._56_4_ | (uint)!bVar15 * iStack_4e48;
      uStack_9bc8._4_4_ =
           (uint)(bVar9 >> 7) * auVar274._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_4e44;
      auVar274 = _local_9c00;
      uStack_9be8 = auVar16._24_8_;
      uStack_9be0 = auVar265._32_8_;
      uStack_9bd8 = auVar266._40_8_;
      uStack_9bd0 = auVar267._48_8_;
      uStack_9bc8 = auVar274._56_8_;
      auVar159._16_8_ = uStack_9bf0;
      auVar159._0_16_ = local_9c00;
      auVar159._24_8_ = uStack_9be8;
      auVar159._32_8_ = uStack_9be0;
      auVar159._40_8_ = uStack_9bd8;
      auVar159._48_8_ = uStack_9bd0;
      auVar159._56_8_ = uStack_9bc8;
      auVar158._8_4_ = 0.6933594;
      auVar158._12_4_ = 0.6933594;
      auVar158._0_4_ = 0.6933594;
      auVar158._4_4_ = 0.6933594;
      auVar158._16_4_ = 0.6933594;
      auVar158._20_4_ = 0.6933594;
      auVar158._24_4_ = 0.6933594;
      auVar158._28_4_ = 0.6933594;
      auVar158._32_4_ = 0.6933594;
      auVar158._36_4_ = 0.6933594;
      auVar158._40_4_ = 0.6933594;
      auVar158._44_4_ = 0.6933594;
      auVar158._48_4_ = 0.6933594;
      auVar158._52_4_ = 0.6933594;
      auVar158._56_4_ = 0.6933594;
      auVar158._60_4_ = 0.6933594;
      auVar274 = vfnmadd213ps_avx512f(auVar158,auVar159,auVar273);
      auVar157._16_8_ = uStack_9bf0;
      auVar157._0_16_ = local_9c00;
      auVar157._24_8_ = uStack_9be8;
      auVar157._32_8_ = uStack_9be0;
      auVar157._40_8_ = uStack_9bd8;
      auVar157._48_8_ = uStack_9bd0;
      auVar157._56_8_ = uStack_9bc8;
      auVar156._8_4_ = -0.00021219444;
      auVar156._12_4_ = -0.00021219444;
      auVar156._0_4_ = -0.00021219444;
      auVar156._4_4_ = -0.00021219444;
      auVar156._16_4_ = -0.00021219444;
      auVar156._20_4_ = -0.00021219444;
      auVar156._24_4_ = -0.00021219444;
      auVar156._28_4_ = -0.00021219444;
      auVar156._32_4_ = -0.00021219444;
      auVar156._36_4_ = -0.00021219444;
      auVar156._40_4_ = -0.00021219444;
      auVar156._44_4_ = -0.00021219444;
      auVar156._48_4_ = -0.00021219444;
      auVar156._52_4_ = -0.00021219444;
      auVar156._56_4_ = -0.00021219444;
      auVar156._60_4_ = -0.00021219444;
      auVar274 = vfnmadd213ps_avx512f(auVar156,auVar157,auVar274);
      auVar273 = vmulps_avx512f(auVar274,auVar274);
      uStack_9cf8._0_4_ = 0.00019875691;
      uStack_9cf8._4_4_ = 0.00019875691;
      local_9d00._0_4_ = 0.00019875691;
      local_9d00._4_4_ = 0.00019875691;
      auVar136._16_4_ = 0.00019875691;
      auVar136._20_4_ = 0.00019875691;
      auVar136._0_16_ = _local_9d00;
      auVar136._24_4_ = 0.00019875691;
      auVar136._28_4_ = 0.00019875691;
      auVar136._32_4_ = 0.00019875691;
      auVar136._36_4_ = 0.00019875691;
      auVar136._40_4_ = 0.00019875691;
      auVar136._44_4_ = 0.00019875691;
      auVar136._48_4_ = 0.00019875691;
      auVar136._52_4_ = 0.00019875691;
      auVar136._56_4_ = 0.00019875691;
      auVar136._60_4_ = 0.00019875691;
      auVar135._8_4_ = 0.0013981999;
      auVar135._12_4_ = 0.0013981999;
      auVar135._0_4_ = 0.0013981999;
      auVar135._4_4_ = 0.0013981999;
      auVar135._16_4_ = 0.0013981999;
      auVar135._20_4_ = 0.0013981999;
      auVar135._24_4_ = 0.0013981999;
      auVar135._28_4_ = 0.0013981999;
      auVar135._32_4_ = 0.0013981999;
      auVar135._36_4_ = 0.0013981999;
      auVar135._40_4_ = 0.0013981999;
      auVar135._44_4_ = 0.0013981999;
      auVar135._48_4_ = 0.0013981999;
      auVar135._52_4_ = 0.0013981999;
      auVar135._56_4_ = 0.0013981999;
      auVar135._60_4_ = 0.0013981999;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar136,auVar135);
      auVar134._8_4_ = 0.008333452;
      auVar134._12_4_ = 0.008333452;
      auVar134._0_4_ = 0.008333452;
      auVar134._4_4_ = 0.008333452;
      auVar134._16_4_ = 0.008333452;
      auVar134._20_4_ = 0.008333452;
      auVar134._24_4_ = 0.008333452;
      auVar134._28_4_ = 0.008333452;
      auVar134._32_4_ = 0.008333452;
      auVar134._36_4_ = 0.008333452;
      auVar134._40_4_ = 0.008333452;
      auVar134._44_4_ = 0.008333452;
      auVar134._48_4_ = 0.008333452;
      auVar134._52_4_ = 0.008333452;
      auVar134._56_4_ = 0.008333452;
      auVar134._60_4_ = 0.008333452;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar134);
      auVar133._8_4_ = 0.041665796;
      auVar133._12_4_ = 0.041665796;
      auVar133._0_4_ = 0.041665796;
      auVar133._4_4_ = 0.041665796;
      auVar133._16_4_ = 0.041665796;
      auVar133._20_4_ = 0.041665796;
      auVar133._24_4_ = 0.041665796;
      auVar133._28_4_ = 0.041665796;
      auVar133._32_4_ = 0.041665796;
      auVar133._36_4_ = 0.041665796;
      auVar133._40_4_ = 0.041665796;
      auVar133._44_4_ = 0.041665796;
      auVar133._48_4_ = 0.041665796;
      auVar133._52_4_ = 0.041665796;
      auVar133._56_4_ = 0.041665796;
      auVar133._60_4_ = 0.041665796;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar133);
      auVar132._8_4_ = 0.16666666;
      auVar132._12_4_ = 0.16666666;
      auVar132._0_4_ = 0.16666666;
      auVar132._4_4_ = 0.16666666;
      auVar132._16_4_ = 0.16666666;
      auVar132._20_4_ = 0.16666666;
      auVar132._24_4_ = 0.16666666;
      auVar132._28_4_ = 0.16666666;
      auVar132._32_4_ = 0.16666666;
      auVar132._36_4_ = 0.16666666;
      auVar132._40_4_ = 0.16666666;
      auVar132._44_4_ = 0.16666666;
      auVar132._48_4_ = 0.16666666;
      auVar132._52_4_ = 0.16666666;
      auVar132._56_4_ = 0.16666666;
      auVar132._60_4_ = 0.16666666;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar132);
      auVar131._8_4_ = 0.5;
      auVar131._12_4_ = 0.5;
      auVar131._0_4_ = 0.5;
      auVar131._4_4_ = 0.5;
      auVar131._16_4_ = 0.5;
      auVar131._20_4_ = 0.5;
      auVar131._24_4_ = 0.5;
      auVar131._28_4_ = 0.5;
      auVar131._32_4_ = 0.5;
      auVar131._36_4_ = 0.5;
      auVar131._40_4_ = 0.5;
      auVar131._44_4_ = 0.5;
      auVar131._48_4_ = 0.5;
      auVar131._52_4_ = 0.5;
      auVar131._56_4_ = 0.5;
      auVar131._60_4_ = 0.5;
      auVar275 = vfmadd213ps_avx512f(auVar274,auVar275,auVar131);
      auVar274 = vfmadd213ps_avx512f(auVar273,auVar275,auVar274);
      auVar27._8_4_ = 1.0;
      auVar27._12_4_ = 1.0;
      auVar27._0_4_ = 1.0;
      auVar27._4_4_ = 1.0;
      auVar27._16_4_ = 1.0;
      auVar27._20_4_ = 1.0;
      auVar27._24_4_ = 1.0;
      auVar27._28_4_ = 1.0;
      auVar27._32_4_ = 1.0;
      auVar27._36_4_ = 1.0;
      auVar27._40_4_ = 1.0;
      auVar27._44_4_ = 1.0;
      auVar27._48_4_ = 1.0;
      auVar27._52_4_ = 1.0;
      auVar27._56_4_ = 1.0;
      auVar27._60_4_ = 1.0;
      auVar275 = vaddps_avx512f(auVar274,auVar27);
      auVar162._16_8_ = uStack_9bf0;
      auVar162._0_16_ = local_9c00;
      auVar162._24_8_ = uStack_9be8;
      auVar162._32_8_ = uStack_9be0;
      auVar162._40_8_ = uStack_9bd8;
      auVar162._48_8_ = uStack_9bd0;
      auVar162._56_8_ = uStack_9bc8;
      auVar274 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar274);
      auVar274 = vcvttps2dq_avx512f(auVar162);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar273 = vmovdqa64_avx512f(auVar273);
      auVar274 = vpaddd_avx512f(auVar274,auVar273);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vpslld_avx512f(auVar274,ZEXT416(0x17));
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmovdqa64_avx512f(auVar274);
      auVar274 = vmulps_avx512f(auVar275,auVar274);
      local_9d00 = auVar274._0_8_;
      uStack_9cf8 = auVar274._8_8_;
      uStack_9cf0 = auVar274._16_8_;
      uStack_9ce8 = auVar274._24_8_;
      uStack_9ce0 = auVar274._32_8_;
      uStack_9cd8 = auVar274._40_8_;
      uStack_9cd0 = auVar274._48_8_;
      uStack_9cc8 = auVar274._56_8_;
      *local_a570 = local_9d00;
      local_a570[1] = uStack_9cf8;
      local_a570[2] = uStack_9cf0;
      local_a570[3] = uStack_9ce8;
      local_a570[4] = uStack_9ce0;
      local_a570[5] = uStack_9cd8;
      local_a570[6] = uStack_9cd0;
      local_a570[7] = uStack_9cc8;
      local_a560 = local_a560 + 1;
      local_a568 = local_a568 + 4;
      local_a570 = local_a570 + 8;
    }
    for (; local_a7e4 + 1 < in_ECX; local_a7e4 = local_a7e4 + 2) {
      fVar277 = *local_a568;
      uStack_3168._4_4_ = local_a568[1];
      auVar16 = vcmpps_avx(*(undefined1 (*) [32])*local_a560,ZEXT1632(ZEXT816(0)),2);
      auVar174._8_4_ = 0x800000;
      auVar174._0_8_ = 0x80000000800000;
      auVar174._12_4_ = 0x800000;
      auVar174._16_4_ = 0x800000;
      auVar174._20_4_ = 0x800000;
      auVar174._24_4_ = 0x800000;
      auVar174._28_4_ = 0x800000;
      auVar278 = vmaxps_avx(*(undefined1 (*) [32])*local_a560,auVar174);
      auVar22 = vpsrld_avx2(auVar278,ZEXT416(0x17));
      auVar181._8_4_ = 0x807fffff;
      auVar181._0_8_ = 0x807fffff807fffff;
      auVar181._12_4_ = 0x807fffff;
      auVar181._16_4_ = 0x807fffff;
      auVar181._20_4_ = 0x807fffff;
      auVar181._24_4_ = 0x807fffff;
      auVar181._28_4_ = 0x807fffff;
      auVar278 = vpand_avx2(auVar278,auVar181);
      auVar229._8_4_ = 0x3f000000;
      auVar229._0_8_ = 0x3f0000003f000000;
      auVar229._12_4_ = 0x3f000000;
      auVar229._16_4_ = 0x3f000000;
      auVar229._20_4_ = 0x3f000000;
      auVar229._24_4_ = 0x3f000000;
      auVar229._28_4_ = 0x3f000000;
      auVar21 = vpor_avx2(auVar278,auVar229);
      auVar230._8_8_ = 0x7f0000007f;
      auVar230._0_8_ = 0x7f0000007f;
      auVar230._16_8_ = 0x7f0000007f;
      auVar230._24_8_ = 0x7f0000007f;
      auVar278 = vpsubd_avx2(auVar22,auVar230);
      auVar278 = vcvtdq2ps_avx(auVar278);
      local_2ba0 = auVar278._0_4_;
      fStack_2b9c = auVar278._4_4_;
      fStack_2b98 = auVar278._8_4_;
      fStack_2b94 = auVar278._12_4_;
      fStack_2b90 = auVar278._16_4_;
      fStack_2b8c = auVar278._20_4_;
      fStack_2b88 = auVar278._24_4_;
      fStack_2b84 = auVar278._28_4_;
      local_2ce0._4_4_ = fStack_2b9c + 1.0;
      local_2ce0._0_4_ = local_2ba0 + 1.0;
      fStack_2cd8 = fStack_2b98 + 1.0;
      fStack_2cd4 = fStack_2b94 + 1.0;
      uStack_2cd0._0_4_ = fStack_2b90 + 1.0;
      uStack_2cd0._4_4_ = fStack_2b8c + 1.0;
      uStack_2cc8._0_4_ = fStack_2b88 + 1.0;
      uStack_2cc8._4_4_ = fStack_2b84 + 1.0;
      auVar175 = _local_2ce0;
      auVar283._8_4_ = 0x3f3504f3;
      auVar283._0_8_ = 0x3f3504f33f3504f3;
      auVar283._12_4_ = 0x3f3504f3;
      auVar283._16_4_ = 0x3f3504f3;
      auVar283._20_4_ = 0x3f3504f3;
      auVar283._24_4_ = 0x3f3504f3;
      auVar283._28_4_ = 0x3f3504f3;
      auVar278 = vcmpps_avx(auVar21,auVar283,1);
      auVar22 = vpand_avx2(auVar21,auVar278);
      auVar173._8_8_ = 0x3f8000003f800000;
      auVar173._0_8_ = 0x3f8000003f800000;
      auVar173._16_8_ = 0x3f8000003f800000;
      auVar173._24_8_ = 0x3f8000003f800000;
      auVar21 = vsubps_avx(auVar21,auVar173);
      uStack_2cc8 = auVar175._24_8_;
      auVar180._8_8_ = 0x3f8000003f800000;
      auVar180._0_8_ = 0x3f8000003f800000;
      auVar180._16_8_ = 0x3f8000003f800000;
      auVar180._24_8_ = 0x3f8000003f800000;
      auVar278 = vpand_avx2(auVar180,auVar278);
      auVar172._16_8_ = uStack_2cd0;
      auVar172._0_16_ = _local_2ce0;
      auVar172._24_8_ = uStack_2cc8;
      auVar278 = vsubps_avx(auVar172,auVar278);
      local_2be0 = auVar21._0_4_;
      fStack_2bdc = auVar21._4_4_;
      fStack_2bd8 = auVar21._8_4_;
      fStack_2bd4 = auVar21._12_4_;
      fStack_2bd0 = auVar21._16_4_;
      fStack_2bcc = auVar21._20_4_;
      fStack_2bc8 = auVar21._24_4_;
      fStack_2bc4 = auVar21._28_4_;
      local_2c00 = auVar22._0_4_;
      fStack_2bfc = auVar22._4_4_;
      fStack_2bf8 = auVar22._8_4_;
      fStack_2bf4 = auVar22._12_4_;
      fStack_2bf0 = auVar22._16_4_;
      fStack_2bec = auVar22._20_4_;
      fStack_2be8 = auVar22._24_4_;
      fStack_2be4 = auVar22._28_4_;
      local_2c60._0_4_ = local_2be0 + local_2c00;
      local_2c60._4_4_ = fStack_2bdc + fStack_2bfc;
      fStack_2c58 = fStack_2bd8 + fStack_2bf8;
      fStack_2c54 = fStack_2bd4 + fStack_2bf4;
      fStack_2c50 = fStack_2bd0 + fStack_2bf0;
      fStack_2c4c = fStack_2bcc + fStack_2bec;
      fStack_2c48 = fStack_2bc8 + fStack_2be8;
      fStack_2c44 = fStack_2bc4 + fStack_2be4;
      fStack_2d58 = 0.070376836;
      local_2d60 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_2d54 = 0.070376836;
      fStack_2d50 = 0.070376836;
      fStack_2d4c = 0.070376836;
      fStack_2d48 = 0.070376836;
      uStack_2d44 = 0x3d9021bb;
      auVar198._8_4_ = -0.1151461;
      auVar198._12_4_ = -0.1151461;
      auVar198._0_4_ = -0.1151461;
      auVar198._4_4_ = -0.1151461;
      auVar198._16_4_ = -0.1151461;
      auVar198._20_4_ = -0.1151461;
      auVar198._24_4_ = -0.1151461;
      auVar198._28_4_ = -0.1151461;
      auVar17 = vfmadd213ps_fma(_local_2c60,_local_2d60,auVar198);
      auVar199._8_4_ = 0.116769984;
      auVar199._12_4_ = 0.116769984;
      auVar199._0_4_ = 0.116769984;
      auVar199._4_4_ = 0.116769984;
      auVar199._16_4_ = 0.116769984;
      auVar199._20_4_ = 0.116769984;
      auVar199._24_4_ = 0.116769984;
      auVar199._28_4_ = 0.116769984;
      auVar17 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar17),auVar199);
      auVar200._8_4_ = -0.12420141;
      auVar200._12_4_ = -0.12420141;
      auVar200._0_4_ = -0.12420141;
      auVar200._4_4_ = -0.12420141;
      auVar200._16_4_ = -0.12420141;
      auVar200._20_4_ = -0.12420141;
      auVar200._24_4_ = -0.12420141;
      auVar200._28_4_ = -0.12420141;
      auVar17 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar17),auVar200);
      auVar201._8_4_ = 0.14249323;
      auVar201._12_4_ = 0.14249323;
      auVar201._0_4_ = 0.14249323;
      auVar201._4_4_ = 0.14249323;
      auVar201._16_4_ = 0.14249323;
      auVar201._20_4_ = 0.14249323;
      auVar201._24_4_ = 0.14249323;
      auVar201._28_4_ = 0.14249323;
      auVar17 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar17),auVar201);
      auVar202._8_4_ = -0.16668057;
      auVar202._12_4_ = -0.16668057;
      auVar202._0_4_ = -0.16668057;
      auVar202._4_4_ = -0.16668057;
      auVar202._16_4_ = -0.16668057;
      auVar202._20_4_ = -0.16668057;
      auVar202._24_4_ = -0.16668057;
      auVar202._28_4_ = -0.16668057;
      auVar17 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar17),auVar202);
      auVar203._8_4_ = 0.20000714;
      auVar203._12_4_ = 0.20000714;
      auVar203._0_4_ = 0.20000714;
      auVar203._4_4_ = 0.20000714;
      auVar203._16_4_ = 0.20000714;
      auVar203._20_4_ = 0.20000714;
      auVar203._24_4_ = 0.20000714;
      auVar203._28_4_ = 0.20000714;
      auVar17 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar17),auVar203);
      auVar204._8_4_ = -0.24999994;
      auVar204._12_4_ = -0.24999994;
      auVar204._0_4_ = -0.24999994;
      auVar204._4_4_ = -0.24999994;
      auVar204._16_4_ = -0.24999994;
      auVar204._20_4_ = -0.24999994;
      auVar204._24_4_ = -0.24999994;
      auVar204._28_4_ = -0.24999994;
      auVar17 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar17),auVar204);
      auVar205._8_4_ = 0.3333333;
      auVar205._12_4_ = 0.3333333;
      auVar205._0_4_ = 0.3333333;
      auVar205._4_4_ = 0.3333333;
      auVar205._16_4_ = 0.3333333;
      auVar205._20_4_ = 0.3333333;
      auVar205._24_4_ = 0.3333333;
      auVar205._28_4_ = 0.3333333;
      auVar17 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar17),auVar205);
      local_2aa0 = auVar17._0_4_;
      fStack_2a9c = auVar17._4_4_;
      fStack_2a98 = auVar17._8_4_;
      fStack_2a94 = auVar17._12_4_;
      local_2d60._4_4_ =
           fStack_2a9c * (float)local_2c60._4_4_ * (float)local_2c60._4_4_ * (float)local_2c60._4_4_
      ;
      local_2d60._0_4_ =
           local_2aa0 * (float)local_2c60._0_4_ * (float)local_2c60._0_4_ * (float)local_2c60._0_4_;
      fStack_2d58 = fStack_2a98 * fStack_2c58 * fStack_2c58 * fStack_2c58;
      fStack_2d54 = fStack_2a94 * fStack_2c54 * fStack_2c54 * fStack_2c54;
      fStack_2d50 = fStack_2c50 * 0.0 * fStack_2c50 * fStack_2c50;
      fStack_2d4c = fStack_2c4c * 0.0 * fStack_2c4c * fStack_2c4c;
      fStack_2d48 = fStack_2c48 * 0.0 * fStack_2c48 * fStack_2c48;
      uStack_2d44 = 0;
      auVar206._8_4_ = -0.00021219444;
      auVar206._12_4_ = -0.00021219444;
      auVar206._0_4_ = -0.00021219444;
      auVar206._4_4_ = -0.00021219444;
      auVar206._16_4_ = -0.00021219444;
      auVar206._20_4_ = -0.00021219444;
      auVar206._24_4_ = -0.00021219444;
      auVar206._28_4_ = -0.00021219444;
      auVar17 = vfmadd213ps_fma(auVar206,auVar278,_local_2d60);
      auVar262._4_4_ = (float)local_2c60._4_4_ * (float)local_2c60._4_4_;
      auVar262._0_4_ = (float)local_2c60._0_4_ * (float)local_2c60._0_4_;
      auVar262._8_4_ = fStack_2c58 * fStack_2c58;
      auVar262._12_4_ = fStack_2c54 * fStack_2c54;
      auVar262._16_4_ = fStack_2c50 * fStack_2c50;
      auVar262._20_4_ = fStack_2c4c * fStack_2c4c;
      auVar262._24_4_ = fStack_2c48 * fStack_2c48;
      auVar262._28_4_ = fStack_2c44;
      auVar222._8_4_ = 0.5;
      auVar222._12_4_ = 0.5;
      auVar222._0_4_ = 0.5;
      auVar222._4_4_ = 0.5;
      auVar222._16_4_ = 0.5;
      auVar222._20_4_ = 0.5;
      auVar222._24_4_ = 0.5;
      auVar222._28_4_ = 0.5;
      auVar17 = vfnmadd213ps_fma(auVar222,auVar262,ZEXT1632(auVar17));
      local_2c40 = auVar17._0_4_;
      fStack_2c3c = auVar17._4_4_;
      fStack_2c38 = auVar17._8_4_;
      fStack_2c34 = auVar17._12_4_;
      local_2c60._4_4_ = (float)local_2c60._4_4_ + fStack_2c3c;
      local_2c60._0_4_ = (float)local_2c60._0_4_ + local_2c40;
      fStack_2c58 = fStack_2c58 + fStack_2c38;
      fStack_2c54 = fStack_2c54 + fStack_2c34;
      fStack_2c50 = fStack_2c50 + 0.0;
      fStack_2c4c = fStack_2c4c + 0.0;
      fStack_2c48 = fStack_2c48 + 0.0;
      fStack_2c44 = fStack_2c44 + 0.0;
      auVar207._8_4_ = 0.6933594;
      auVar207._12_4_ = 0.6933594;
      auVar207._0_4_ = 0.6933594;
      auVar207._4_4_ = 0.6933594;
      auVar207._16_4_ = 0.6933594;
      auVar207._20_4_ = 0.6933594;
      auVar207._24_4_ = 0.6933594;
      auVar207._28_4_ = 0.6933594;
      auVar17 = vfmadd213ps_fma(auVar207,auVar278,_local_2c60);
      auVar16 = vpor_avx2(ZEXT1632(auVar17),auVar16);
      local_32a0 = auVar16._0_4_;
      fStack_329c = auVar16._4_4_;
      fStack_3298 = auVar16._8_4_;
      fStack_3294 = auVar16._12_4_;
      fStack_3290 = auVar16._16_4_;
      fStack_328c = auVar16._20_4_;
      fStack_3288 = auVar16._24_4_;
      local_3180._4_4_ = fVar277 * fStack_329c;
      local_3180._0_4_ = fVar277 * local_32a0;
      fStack_3178 = fVar277 * fStack_3298;
      fStack_3174 = fVar277 * fStack_3294;
      uStack_3170._0_4_ = uStack_3168._4_4_ * fStack_3290;
      uStack_3170._4_4_ = uStack_3168._4_4_ * fStack_328c;
      uStack_3168._0_4_ = uStack_3168._4_4_ * fStack_3288;
      auVar16 = _local_3180;
      uStack_3168 = auVar16._24_8_;
      auVar171._16_8_ = uStack_3170;
      auVar171._0_16_ = _local_3180;
      auVar171._24_8_ = uStack_3168;
      auVar170._8_4_ = 0x42b0c0a5;
      auVar170._0_8_ = 0x42b0c0a542b0c0a5;
      auVar170._12_4_ = 0x42b0c0a5;
      auVar170._16_4_ = 0x42b0c0a5;
      auVar170._20_4_ = 0x42b0c0a5;
      auVar170._24_4_ = 0x42b0c0a5;
      auVar170._28_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar171,auVar170);
      auVar169._8_4_ = 0xc2b0c0a5;
      auVar169._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar169._12_4_ = 0xc2b0c0a5;
      auVar169._16_4_ = 0xc2b0c0a5;
      auVar169._20_4_ = 0xc2b0c0a5;
      auVar169._24_4_ = 0xc2b0c0a5;
      auVar169._28_4_ = 0xc2b0c0a5;
      auVar278 = vmaxps_avx(auVar16,auVar169);
      auVar185._8_4_ = 1.442695;
      auVar185._12_4_ = 1.442695;
      auVar185._0_4_ = 1.442695;
      auVar185._4_4_ = 1.442695;
      auVar185._16_4_ = 1.442695;
      auVar185._20_4_ = 1.442695;
      auVar185._24_4_ = 1.442695;
      auVar185._28_4_ = 1.442695;
      auVar184._8_4_ = 0.5;
      auVar184._12_4_ = 0.5;
      auVar184._0_4_ = 0.5;
      auVar184._4_4_ = 0.5;
      auVar184._16_4_ = 0.5;
      auVar184._20_4_ = 0.5;
      auVar184._24_4_ = 0.5;
      auVar184._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar185,auVar278,auVar184);
      auVar21 = vroundps_avx(ZEXT1632(auVar17),1);
      auVar16 = vcmpps_avx(ZEXT1632(auVar17),auVar21,1);
      auVar183._8_8_ = 0x3f8000003f800000;
      auVar183._0_8_ = 0x3f8000003f800000;
      auVar183._16_8_ = 0x3f8000003f800000;
      auVar183._24_8_ = 0x3f8000003f800000;
      auVar16 = vpand_avx2(auVar16,auVar183);
      auVar16 = vsubps_avx(auVar21,auVar16);
      auVar218._8_4_ = 0.6933594;
      auVar218._12_4_ = 0.6933594;
      auVar218._0_4_ = 0.6933594;
      auVar218._4_4_ = 0.6933594;
      auVar218._16_4_ = 0.6933594;
      auVar218._20_4_ = 0.6933594;
      auVar218._24_4_ = 0.6933594;
      auVar218._28_4_ = 0.6933594;
      auVar17 = vfnmadd213ps_fma(auVar218,auVar16,auVar278);
      auVar219._8_4_ = -0.00021219444;
      auVar219._12_4_ = -0.00021219444;
      auVar219._0_4_ = -0.00021219444;
      auVar219._4_4_ = -0.00021219444;
      auVar219._16_4_ = -0.00021219444;
      auVar219._20_4_ = -0.00021219444;
      auVar219._24_4_ = -0.00021219444;
      auVar219._28_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar219,auVar16,ZEXT1632(auVar17));
      auVar278 = ZEXT1632(auVar17);
      local_3080 = auVar17._0_4_;
      fStack_307c = auVar17._4_4_;
      fStack_3078 = auVar17._8_4_;
      fStack_3074 = auVar17._12_4_;
      _local_31a0 = ZEXT1632(CONCAT412(fStack_3074 * fStack_3074,
                                       CONCAT48(fStack_3078 * fStack_3078,
                                                CONCAT44(fStack_307c * fStack_307c,
                                                         local_3080 * local_3080))));
      uStack_3238._0_4_ = 0x39506967;
      local_3240 = (undefined1  [8])0x3950696739506967;
      uStack_3238._4_4_ = 0x39506967;
      uStack_3230._0_4_ = 0x39506967;
      uStack_3230._4_4_ = 0x39506967;
      uStack_3228._0_4_ = 0x39506967;
      uStack_3228._4_4_ = 0x39506967;
      auVar186._8_4_ = 0.0013981999;
      auVar186._12_4_ = 0.0013981999;
      auVar186._0_4_ = 0.0013981999;
      auVar186._4_4_ = 0.0013981999;
      auVar186._16_4_ = 0.0013981999;
      auVar186._20_4_ = 0.0013981999;
      auVar186._24_4_ = 0.0013981999;
      auVar186._28_4_ = 0.0013981999;
      auVar17 = vfmadd213ps_fma(auVar278,_local_3240,auVar186);
      auVar187._8_4_ = 0.008333452;
      auVar187._12_4_ = 0.008333452;
      auVar187._0_4_ = 0.008333452;
      auVar187._4_4_ = 0.008333452;
      auVar187._16_4_ = 0.008333452;
      auVar187._20_4_ = 0.008333452;
      auVar187._24_4_ = 0.008333452;
      auVar187._28_4_ = 0.008333452;
      auVar17 = vfmadd213ps_fma(auVar278,ZEXT1632(auVar17),auVar187);
      auVar188._8_4_ = 0.041665796;
      auVar188._12_4_ = 0.041665796;
      auVar188._0_4_ = 0.041665796;
      auVar188._4_4_ = 0.041665796;
      auVar188._16_4_ = 0.041665796;
      auVar188._20_4_ = 0.041665796;
      auVar188._24_4_ = 0.041665796;
      auVar188._28_4_ = 0.041665796;
      auVar17 = vfmadd213ps_fma(auVar278,ZEXT1632(auVar17),auVar188);
      auVar189._8_4_ = 0.16666666;
      auVar189._12_4_ = 0.16666666;
      auVar189._0_4_ = 0.16666666;
      auVar189._4_4_ = 0.16666666;
      auVar189._16_4_ = 0.16666666;
      auVar189._20_4_ = 0.16666666;
      auVar189._24_4_ = 0.16666666;
      auVar189._28_4_ = 0.16666666;
      auVar17 = vfmadd213ps_fma(auVar278,ZEXT1632(auVar17),auVar189);
      auVar190._8_4_ = 0.5;
      auVar190._12_4_ = 0.5;
      auVar190._0_4_ = 0.5;
      auVar190._4_4_ = 0.5;
      auVar190._16_4_ = 0.5;
      auVar190._20_4_ = 0.5;
      auVar190._24_4_ = 0.5;
      auVar190._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar278,ZEXT1632(auVar17),auVar190);
      auVar17 = vfmadd213ps_fma(_local_31a0,ZEXT1632(auVar17),auVar278);
      local_3140 = auVar17._0_4_;
      fStack_313c = auVar17._4_4_;
      fStack_3138 = auVar17._8_4_;
      fStack_3134 = auVar17._12_4_;
      local_2020 = auVar16._0_4_;
      fStack_201c = auVar16._4_4_;
      fStack_2018 = auVar16._8_4_;
      fStack_2014 = auVar16._12_4_;
      fStack_2010 = auVar16._16_4_;
      fStack_200c = auVar16._20_4_;
      fStack_2008 = auVar16._24_4_;
      fStack_2004 = auVar16._28_4_;
      local_31e0._4_4_ = (int)fStack_201c;
      local_31e0._0_4_ = (int)local_2020;
      local_31e0._8_4_ = (int)fStack_2018;
      local_31e0._12_4_ = (int)fStack_2014;
      uStack_31d0._0_4_ = (int)fStack_2010;
      uStack_31d0._4_4_ = (int)fStack_200c;
      uStack_31c8._0_4_ = (int)fStack_2008;
      uStack_31c8._4_4_ = (int)fStack_2004;
      auVar16 = _local_31e0;
      uStack_31c8 = auVar16._24_8_;
      auVar225._16_8_ = uStack_31d0;
      auVar225._0_16_ = local_31e0;
      auVar225._24_8_ = uStack_31c8;
      auVar224._8_8_ = 0x7f0000007f;
      auVar224._0_8_ = 0x7f0000007f;
      auVar224._16_8_ = 0x7f0000007f;
      auVar224._24_8_ = 0x7f0000007f;
      auVar16 = vpaddd_avx2(auVar225,auVar224);
      auVar16 = vpslld_avx2(auVar16,ZEXT416(0x17));
      local_30e0 = auVar16._0_4_;
      fStack_30dc = auVar16._4_4_;
      fStack_30d8 = auVar16._8_4_;
      fStack_30d4 = auVar16._12_4_;
      fStack_30d0 = auVar16._16_4_;
      fStack_30cc = auVar16._20_4_;
      fStack_30c8 = auVar16._24_4_;
      local_3240._4_4_ = (fStack_313c + 1.0) * fStack_30dc;
      local_3240._0_4_ = (local_3140 + 1.0) * local_30e0;
      uStack_3238._0_4_ = (fStack_3138 + 1.0) * fStack_30d8;
      uStack_3238._4_4_ = (fStack_3134 + 1.0) * fStack_30d4;
      uStack_3230._0_4_ = fStack_30d0 * 1.0;
      uStack_3230._4_4_ = fStack_30cc * 1.0;
      auVar271 = _local_3240;
      uStack_3228._0_4_ = fStack_30c8 * 1.0;
      uStack_3228._4_4_ = 0x3f800000;
      auVar16 = _local_3240;
      uStack_3230 = auVar271._16_8_;
      uStack_3228 = auVar16._24_8_;
      *local_a570 = local_3240;
      local_a570[1] = uStack_3238;
      local_a570[2] = uStack_3230;
      local_a570[3] = uStack_3228;
      local_a560 = (undefined1 (*) [64])(*local_a560 + 0x20);
      local_a568 = local_a568 + 2;
      local_a570 = local_a570 + 4;
    }
    for (; local_a7e4 < in_ECX; local_a7e4 = local_a7e4 + 1) {
      fVar277 = *local_a568;
      auVar17 = vcmpps_avx(*(undefined1 (*) [16])*local_a560,ZEXT816(0),2);
      auVar20._8_4_ = 0x800000;
      auVar20._0_8_ = 0x80000000800000;
      auVar20._12_4_ = 0x800000;
      auVar18 = vmaxps_avx(*(undefined1 (*) [16])*local_a560,auVar20);
      auVar19 = vpsrld_avx(auVar18,ZEXT416(0x17));
      auVar237._8_4_ = 0x807fffff;
      auVar237._0_8_ = 0x807fffff807fffff;
      auVar237._12_4_ = 0x807fffff;
      auVar18 = vpand_avx(auVar18,auVar237);
      auVar259._8_4_ = 0x3f000000;
      auVar259._0_8_ = 0x3f0000003f000000;
      auVar259._12_4_ = 0x3f000000;
      auVar20 = vpor_avx(auVar18,auVar259);
      auVar260._8_8_ = 0x7f0000007f;
      auVar260._0_8_ = 0x7f0000007f;
      auVar18 = vpsubd_avx(auVar19,auVar260);
      auVar18 = vcvtdq2ps_avx(auVar18);
      local_8a0 = auVar18._0_4_;
      fStack_89c = auVar18._4_4_;
      fStack_898 = auVar18._8_4_;
      fStack_894 = auVar18._12_4_;
      local_940 = CONCAT44(fStack_89c + 1.0,local_8a0 + 1.0);
      uStack_938._0_4_ = fStack_898 + 1.0;
      uStack_938._4_4_ = fStack_894 + 1.0;
      auVar261._8_4_ = 0x3f3504f3;
      auVar261._0_8_ = 0x3f3504f33f3504f3;
      auVar261._12_4_ = 0x3f3504f3;
      auVar18 = vcmpps_avx(auVar20,auVar261,1);
      auVar19 = vpand_avx(auVar20,auVar18);
      auVar233._8_8_ = 0x3f8000003f800000;
      auVar233._0_8_ = 0x3f8000003f800000;
      auVar20 = vsubps_avx(auVar20,auVar233);
      auVar236._8_8_ = 0x3f8000003f800000;
      auVar236._0_8_ = 0x3f8000003f800000;
      auVar18 = vpand_avx(auVar236,auVar18);
      auVar232._8_8_ = uStack_938;
      auVar232._0_8_ = local_940;
      auVar18 = vsubps_avx(auVar232,auVar18);
      local_8c0 = auVar20._0_4_;
      fStack_8bc = auVar20._4_4_;
      fStack_8b8 = auVar20._8_4_;
      fStack_8b4 = auVar20._12_4_;
      local_8d0 = auVar19._0_4_;
      fStack_8cc = auVar19._4_4_;
      fStack_8c8 = auVar19._8_4_;
      fStack_8c4 = auVar19._12_4_;
      local_900._0_4_ = local_8c0 + local_8d0;
      local_900._4_4_ = fStack_8bc + fStack_8cc;
      fStack_8f8 = fStack_8b8 + fStack_8c8;
      fStack_8f4 = fStack_8b4 + fStack_8c4;
      fStack_978 = 0.070376836;
      local_980 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_974 = 0.070376836;
      auVar249._8_4_ = -0.1151461;
      auVar249._12_4_ = -0.1151461;
      auVar249._0_4_ = -0.1151461;
      auVar249._4_4_ = -0.1151461;
      auVar19 = vfmadd213ps_fma(_local_900,_local_980,auVar249);
      auVar250._8_4_ = 0.116769984;
      auVar250._12_4_ = 0.116769984;
      auVar250._0_4_ = 0.116769984;
      auVar250._4_4_ = 0.116769984;
      auVar19 = vfmadd213ps_fma(_local_900,auVar19,auVar250);
      auVar251._8_4_ = -0.12420141;
      auVar251._12_4_ = -0.12420141;
      auVar251._0_4_ = -0.12420141;
      auVar251._4_4_ = -0.12420141;
      auVar19 = vfmadd213ps_fma(_local_900,auVar19,auVar251);
      auVar252._8_4_ = 0.14249323;
      auVar252._12_4_ = 0.14249323;
      auVar252._0_4_ = 0.14249323;
      auVar252._4_4_ = 0.14249323;
      auVar19 = vfmadd213ps_fma(_local_900,auVar19,auVar252);
      auVar253._8_4_ = -0.16668057;
      auVar253._12_4_ = -0.16668057;
      auVar253._0_4_ = -0.16668057;
      auVar253._4_4_ = -0.16668057;
      auVar19 = vfmadd213ps_fma(_local_900,auVar19,auVar253);
      auVar254._8_4_ = 0.20000714;
      auVar254._12_4_ = 0.20000714;
      auVar254._0_4_ = 0.20000714;
      auVar254._4_4_ = 0.20000714;
      auVar19 = vfmadd213ps_fma(_local_900,auVar19,auVar254);
      auVar255._8_4_ = -0.24999994;
      auVar255._12_4_ = -0.24999994;
      auVar255._0_4_ = -0.24999994;
      auVar255._4_4_ = -0.24999994;
      auVar19 = vfmadd213ps_fma(_local_900,auVar19,auVar255);
      auVar256._8_4_ = 0.3333333;
      auVar256._12_4_ = 0.3333333;
      auVar256._0_4_ = 0.3333333;
      auVar256._4_4_ = 0.3333333;
      auVar19 = vfmadd213ps_fma(_local_900,auVar19,auVar256);
      local_820 = auVar19._0_4_;
      fStack_81c = auVar19._4_4_;
      fStack_818 = auVar19._8_4_;
      fStack_814 = auVar19._12_4_;
      local_980._4_4_ =
           fStack_81c * (float)local_900._4_4_ * (float)local_900._4_4_ * (float)local_900._4_4_;
      local_980._0_4_ =
           local_820 * (float)local_900._0_4_ * (float)local_900._0_4_ * (float)local_900._0_4_;
      fStack_978 = fStack_818 * fStack_8f8 * fStack_8f8 * fStack_8f8;
      fStack_974 = fStack_814 * fStack_8f4 * fStack_8f4 * fStack_8f4;
      auVar257._8_4_ = -0.00021219444;
      auVar257._12_4_ = -0.00021219444;
      auVar257._0_4_ = -0.00021219444;
      auVar257._4_4_ = -0.00021219444;
      auVar19 = vfmadd213ps_fma(auVar257,auVar18,_local_980);
      auVar264._4_4_ = (float)local_900._4_4_ * (float)local_900._4_4_;
      auVar264._0_4_ = (float)local_900._0_4_ * (float)local_900._0_4_;
      auVar264._8_4_ = fStack_8f8 * fStack_8f8;
      auVar264._12_4_ = fStack_8f4 * fStack_8f4;
      auVar243._8_4_ = 0.5;
      auVar243._12_4_ = 0.5;
      auVar243._0_4_ = 0.5;
      auVar243._4_4_ = 0.5;
      auVar19 = vfnmadd213ps_fma(auVar243,auVar264,auVar19);
      local_8f0 = auVar19._0_4_;
      fStack_8ec = auVar19._4_4_;
      fStack_8e8 = auVar19._8_4_;
      fStack_8e4 = auVar19._12_4_;
      local_900._4_4_ = (float)local_900._4_4_ + fStack_8ec;
      local_900._0_4_ = (float)local_900._0_4_ + local_8f0;
      fStack_8f8 = fStack_8f8 + fStack_8e8;
      fStack_8f4 = fStack_8f4 + fStack_8e4;
      auVar258._8_4_ = 0.6933594;
      auVar258._12_4_ = 0.6933594;
      auVar258._0_4_ = 0.6933594;
      auVar258._4_4_ = 0.6933594;
      auVar18 = vfmadd213ps_fma(auVar258,auVar18,_local_900);
      auVar17 = vpor_avx(auVar18,auVar17);
      local_b20 = auVar17._0_4_;
      fStack_b1c = auVar17._4_4_;
      fStack_b18 = auVar17._8_4_;
      fStack_b14 = auVar17._12_4_;
      local_a90 = CONCAT44(fVar277 * fStack_b1c,fVar277 * local_b20);
      uStack_a88._0_4_ = fVar277 * fStack_b18;
      uStack_a88._4_4_ = fVar277 * fStack_b14;
      auVar19._8_8_ = uStack_a88;
      auVar19._0_8_ = local_a90;
      auVar17._8_4_ = 0x42b0c0a5;
      auVar17._0_8_ = 0x42b0c0a542b0c0a5;
      auVar17._12_4_ = 0x42b0c0a5;
      auVar17 = vminps_avx(auVar19,auVar17);
      auVar18._8_4_ = 0xc2b0c0a5;
      auVar18._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar18._12_4_ = 0xc2b0c0a5;
      auVar19 = vmaxps_avx(auVar17,auVar18);
      local_9d0 = auVar19._0_4_;
      fStack_9cc = auVar19._4_4_;
      fStack_9c8 = auVar19._8_4_;
      fStack_9c4 = auVar19._12_4_;
      fVar277 = local_9d0 * 1.442695 + 0.5;
      fVar279 = fStack_9cc * 1.442695 + 0.5;
      fVar280 = fStack_9c8 * 1.442695 + 0.5;
      fVar281 = fStack_9c4 * 1.442695 + 0.5;
      local_ab0 = CONCAT44(fVar279,fVar277);
      uStack_aa8._0_4_ = fVar280;
      uStack_aa8._4_4_ = fVar281;
      local_ac0 = CONCAT44((int)fVar279,(int)fVar277);
      uStack_ab8._0_4_ = (int)fVar280;
      uStack_ab8._4_4_ = (int)fVar281;
      auVar234._8_8_ = uStack_ab8;
      auVar234._0_8_ = local_ac0;
      auVar18 = vcvtdq2ps_avx(auVar234);
      auVar235._8_8_ = uStack_aa8;
      auVar235._0_8_ = local_ab0;
      auVar17 = vcmpps_avx(auVar235,auVar18,1);
      auVar238._8_8_ = 0x3f8000003f800000;
      auVar238._0_8_ = 0x3f8000003f800000;
      auVar17 = vpand_avx(auVar17,auVar238);
      auVar17 = vsubps_avx(auVar18,auVar17);
      auVar241._8_4_ = 0.6933594;
      auVar241._12_4_ = 0.6933594;
      auVar241._0_4_ = 0.6933594;
      auVar241._4_4_ = 0.6933594;
      auVar18 = vfnmadd213ps_fma(auVar241,auVar17,auVar19);
      auVar242._8_4_ = -0.00021219444;
      auVar242._12_4_ = -0.00021219444;
      auVar242._0_4_ = -0.00021219444;
      auVar242._4_4_ = -0.00021219444;
      auVar19 = vfnmadd213ps_fma(auVar242,auVar17,auVar18);
      local_9f0 = auVar19._0_4_;
      fStack_9ec = auVar19._4_4_;
      fStack_9e8 = auVar19._8_4_;
      fStack_9e4 = auVar19._12_4_;
      local_aa0._4_4_ = fStack_9ec * fStack_9ec;
      local_aa0._0_4_ = local_9f0 * local_9f0;
      fStack_a98 = fStack_9e8 * fStack_9e8;
      fStack_a94 = fStack_9e4 * fStack_9e4;
      uStack_ae8._0_4_ = 0x39506967;
      local_af0 = (undefined1  [8])0x3950696739506967;
      uStack_ae8._4_4_ = 0x39506967;
      auVar244._8_4_ = 0.0013981999;
      auVar244._12_4_ = 0.0013981999;
      auVar244._0_4_ = 0.0013981999;
      auVar244._4_4_ = 0.0013981999;
      auVar18 = vfmadd213ps_fma(auVar19,_local_af0,auVar244);
      auVar245._8_4_ = 0.008333452;
      auVar245._12_4_ = 0.008333452;
      auVar245._0_4_ = 0.008333452;
      auVar245._4_4_ = 0.008333452;
      auVar18 = vfmadd213ps_fma(auVar19,auVar18,auVar245);
      auVar246._8_4_ = 0.041665796;
      auVar246._12_4_ = 0.041665796;
      auVar246._0_4_ = 0.041665796;
      auVar246._4_4_ = 0.041665796;
      auVar18 = vfmadd213ps_fma(auVar19,auVar18,auVar246);
      auVar247._8_4_ = 0.16666666;
      auVar247._12_4_ = 0.16666666;
      auVar247._0_4_ = 0.16666666;
      auVar247._4_4_ = 0.16666666;
      auVar18 = vfmadd213ps_fma(auVar19,auVar18,auVar247);
      auVar248._8_4_ = 0.5;
      auVar248._12_4_ = 0.5;
      auVar248._0_4_ = 0.5;
      auVar248._4_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar19,auVar18,auVar248);
      auVar18 = vfmadd213ps_fma(_local_aa0,auVar18,auVar19);
      local_a70 = auVar18._0_4_;
      fStack_a6c = auVar18._4_4_;
      fStack_a68 = auVar18._8_4_;
      fStack_a64 = auVar18._12_4_;
      local_7b0 = auVar17._0_4_;
      fStack_7ac = auVar17._4_4_;
      fStack_7a8 = auVar17._8_4_;
      fStack_7a4 = auVar17._12_4_;
      local_ac0 = CONCAT44((int)fStack_7ac,(int)local_7b0);
      uStack_ab8._0_4_ = (int)fStack_7a8;
      uStack_ab8._4_4_ = (int)fStack_7a4;
      auVar240._8_8_ = uStack_ab8;
      auVar240._0_8_ = local_ac0;
      auVar239._8_8_ = 0x7f0000007f;
      auVar239._0_8_ = 0x7f0000007f;
      auVar17 = vpaddd_avx(auVar240,auVar239);
      auVar17 = vpslld_avx(auVar17,ZEXT416(0x17));
      local_a20 = auVar17._0_4_;
      fStack_a1c = auVar17._4_4_;
      fStack_a18 = auVar17._8_4_;
      fStack_a14 = auVar17._12_4_;
      local_af0._4_4_ = (fStack_a6c + 1.0) * fStack_a1c;
      local_af0._0_4_ = (local_a70 + 1.0) * local_a20;
      uStack_ae8._0_4_ = (fStack_a68 + 1.0) * fStack_a18;
      uStack_ae8._4_4_ = (fStack_a64 + 1.0) * fStack_a14;
      *local_a570 = local_af0;
      local_a570[1] = uStack_ae8;
      local_a560 = (undefined1 (*) [64])(*local_a560 + 0x10);
      local_a568 = local_a568 + 1;
      local_a570 = local_a570 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}